

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx::CurveNiIntersectorK<4,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined4 uVar1;
  undefined8 uVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  long lVar7;
  undefined1 auVar8 [32];
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  bool bVar61;
  undefined1 auVar62 [12];
  bool bVar63;
  bool bVar64;
  bool bVar65;
  bool bVar66;
  bool bVar67;
  bool bVar68;
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  uint uVar79;
  ulong uVar80;
  ulong uVar81;
  long lVar82;
  undefined1 auVar83 [8];
  uint uVar84;
  ulong uVar85;
  bool bVar86;
  float fVar87;
  float fVar115;
  float fVar118;
  vint4 bi_2;
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar88;
  float fVar89;
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar124;
  float fVar126;
  float fVar128;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  float fVar116;
  float fVar117;
  float fVar119;
  float fVar120;
  float fVar121;
  float fVar122;
  float fVar123;
  float fVar125;
  float fVar127;
  float fVar129;
  float fVar130;
  float fVar131;
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  float fVar132;
  float fVar164;
  float fVar165;
  vint4 bi_1;
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  float fVar167;
  float fVar169;
  float fVar170;
  float fVar171;
  undefined1 auVar148 [32];
  float fVar166;
  float fVar168;
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar140 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  vint4 ai;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar190;
  float fVar209;
  float fVar210;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [28];
  float fVar212;
  float fVar215;
  float fVar216;
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  float fVar211;
  float fVar213;
  float fVar214;
  undefined1 auVar208 [64];
  float fVar217;
  float fVar234;
  float fVar235;
  vint4 bi;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  float fVar236;
  float fVar238;
  float fVar240;
  float fVar242;
  float fVar244;
  undefined1 auVar228 [28];
  float fVar237;
  float fVar243;
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  float fVar239;
  float fVar241;
  undefined1 auVar233 [64];
  float fVar245;
  float fVar246;
  float fVar263;
  float fVar265;
  vint4 ai_2;
  undefined1 auVar247 [16];
  float fVar267;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  float fVar264;
  float fVar266;
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar271;
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar272;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  float fVar273;
  float fVar274;
  float fVar275;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar285;
  float fVar288;
  undefined1 auVar276 [16];
  float fVar286;
  float fVar289;
  float fVar292;
  undefined1 auVar279 [32];
  float fVar287;
  float fVar290;
  float fVar293;
  float fVar295;
  float fVar297;
  float fVar299;
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  float fVar291;
  float fVar294;
  float fVar296;
  float fVar298;
  undefined1 auVar284 [64];
  float fVar300;
  float fVar311;
  float fVar312;
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [32];
  float fVar314;
  undefined1 auVar306 [32];
  float fVar313;
  float fVar315;
  float fVar317;
  float fVar319;
  float fVar321;
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  float fVar316;
  float fVar318;
  float fVar320;
  undefined1 auVar310 [64];
  float fVar322;
  float fVar326;
  float fVar327;
  vint4 ai_1;
  undefined1 auVar323 [16];
  float fVar328;
  undefined1 auVar324 [16];
  float fVar329;
  float fVar330;
  float fVar331;
  undefined1 auVar325 [32];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [28];
  undefined1 auVar336 [32];
  float fVar339;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  float fVar340;
  float fVar344;
  float fVar345;
  undefined1 auVar341 [16];
  float fVar347;
  float fVar348;
  float fVar349;
  undefined1 auVar342 [32];
  float fVar346;
  float fVar350;
  undefined1 auVar343 [32];
  undefined1 auVar351 [16];
  float fVar355;
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  float fVar356;
  float fVar359;
  float fVar360;
  undefined1 auVar357 [16];
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  undefined1 auVar358 [32];
  float fVar366;
  float fVar373;
  float fVar376;
  undefined1 auVar369 [16];
  float fVar367;
  float fVar374;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar383;
  float fVar384;
  float fVar385;
  float fVar386;
  undefined1 auVar370 [32];
  float fVar368;
  float fVar375;
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  float fVar391;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  float fVar397;
  float fVar398;
  undefined1 auVar392 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vboolx_conflict valid;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  float local_bc0;
  undefined8 local_b20;
  undefined8 uStack_b18;
  ulong local_b10;
  float local_b08;
  float local_b04;
  undefined1 local_b00 [32];
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined1 auStack_ad0 [16];
  undefined1 local_ac0 [32];
  undefined1 local_a90 [8];
  float fStack_a88;
  float fStack_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 local_a70 [8];
  float fStack_a68;
  float fStack_a64;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  RTCFilterFunctionNArguments local_a50;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined8 *local_9c8;
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [16];
  undefined1 local_930 [8];
  float fStack_928;
  float fStack_924;
  undefined1 local_920 [32];
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [16];
  Primitive *local_8b0;
  ulong local_8a8;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [32];
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  float fStack_824;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  float fStack_804;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  RTCHitN local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  uint local_690;
  uint uStack_68c;
  uint uStack_688;
  uint uStack_684;
  uint uStack_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  float local_520 [4];
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  float local_500 [4];
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4d0 [16];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  undefined1 local_320 [8];
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  undefined1 local_300 [8];
  float fStack_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined1 local_2e0 [8];
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  undefined1 local_1a0 [8];
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  undefined1 auVar354 [64];
  
  PVar3 = prim[1];
  uVar80 = (ulong)(byte)PVar3;
  auVar134 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar134 = vinsertps_avx(auVar134,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar197 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar197 = vinsertps_avx(auVar197,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar245 = *(float *)(prim + uVar80 * 0x19 + 0x12);
  auVar134 = vsubps_avx(auVar134,*(undefined1 (*) [16])(prim + uVar80 * 0x19 + 6));
  auVar172._0_4_ = fVar245 * auVar134._0_4_;
  auVar172._4_4_ = fVar245 * auVar134._4_4_;
  auVar172._8_4_ = fVar245 * auVar134._8_4_;
  auVar172._12_4_ = fVar245 * auVar134._12_4_;
  auVar301._0_4_ = fVar245 * auVar197._0_4_;
  auVar301._4_4_ = fVar245 * auVar197._4_4_;
  auVar301._8_4_ = fVar245 * auVar197._8_4_;
  auVar301._12_4_ = fVar245 * auVar197._12_4_;
  auVar134 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 4 + 6)));
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar197 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 5 + 6)));
  auVar197 = vcvtdq2ps_avx(auVar197);
  auVar304 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 6 + 6)));
  auVar304 = vcvtdq2ps_avx(auVar304);
  auVar95 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar80 * 0xb + 6)));
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar176 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar176 = vcvtdq2ps_avx(auVar176);
  auVar194 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar80 + 6)));
  auVar194 = vcvtdq2ps_avx(auVar194);
  uVar85 = (ulong)(uint)((int)(uVar80 * 9) * 2);
  auVar91 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 + 6)));
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 + uVar80 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  uVar85 = (ulong)(uint)((int)(uVar80 * 5) << 2);
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar85 + 6)));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar90 = vshufps_avx(auVar301,auVar301,0);
  auVar133 = vshufps_avx(auVar301,auVar301,0x55);
  auVar173 = vshufps_avx(auVar301,auVar301,0xaa);
  fVar245 = auVar173._0_4_;
  fVar190 = auVar173._4_4_;
  fVar263 = auVar173._8_4_;
  fVar209 = auVar173._12_4_;
  fVar273 = auVar133._0_4_;
  fVar285 = auVar133._4_4_;
  fVar288 = auVar133._8_4_;
  fVar291 = auVar133._12_4_;
  fVar265 = auVar90._0_4_;
  fVar210 = auVar90._4_4_;
  fVar267 = auVar90._8_4_;
  fVar211 = auVar90._12_4_;
  auVar357._0_4_ = fVar265 * auVar134._0_4_ + fVar273 * auVar197._0_4_ + fVar245 * auVar304._0_4_;
  auVar357._4_4_ = fVar210 * auVar134._4_4_ + fVar285 * auVar197._4_4_ + fVar190 * auVar304._4_4_;
  auVar357._8_4_ = fVar267 * auVar134._8_4_ + fVar288 * auVar197._8_4_ + fVar263 * auVar304._8_4_;
  auVar357._12_4_ =
       fVar211 * auVar134._12_4_ + fVar291 * auVar197._12_4_ + fVar209 * auVar304._12_4_;
  auVar369._0_4_ = fVar265 * auVar95._0_4_ + fVar273 * auVar176._0_4_ + auVar194._0_4_ * fVar245;
  auVar369._4_4_ = fVar210 * auVar95._4_4_ + fVar285 * auVar176._4_4_ + auVar194._4_4_ * fVar190;
  auVar369._8_4_ = fVar267 * auVar95._8_4_ + fVar288 * auVar176._8_4_ + auVar194._8_4_ * fVar263;
  auVar369._12_4_ = fVar211 * auVar95._12_4_ + fVar291 * auVar176._12_4_ + auVar194._12_4_ * fVar209
  ;
  auVar302._0_4_ = fVar265 * auVar91._0_4_ + fVar273 * auVar92._0_4_ + auVar144._0_4_ * fVar245;
  auVar302._4_4_ = fVar210 * auVar91._4_4_ + fVar285 * auVar92._4_4_ + auVar144._4_4_ * fVar190;
  auVar302._8_4_ = fVar267 * auVar91._8_4_ + fVar288 * auVar92._8_4_ + auVar144._8_4_ * fVar263;
  auVar302._12_4_ = fVar211 * auVar91._12_4_ + fVar291 * auVar92._12_4_ + auVar144._12_4_ * fVar209;
  auVar90 = vshufps_avx(auVar172,auVar172,0);
  auVar133 = vshufps_avx(auVar172,auVar172,0x55);
  auVar173 = vshufps_avx(auVar172,auVar172,0xaa);
  fVar245 = auVar173._0_4_;
  fVar190 = auVar173._4_4_;
  fVar263 = auVar173._8_4_;
  fVar209 = auVar173._12_4_;
  fVar273 = auVar133._0_4_;
  fVar285 = auVar133._4_4_;
  fVar288 = auVar133._8_4_;
  fVar291 = auVar133._12_4_;
  fVar265 = auVar90._0_4_;
  fVar210 = auVar90._4_4_;
  fVar267 = auVar90._8_4_;
  fVar211 = auVar90._12_4_;
  auVar218._0_4_ = fVar265 * auVar134._0_4_ + fVar273 * auVar197._0_4_ + fVar245 * auVar304._0_4_;
  auVar218._4_4_ = fVar210 * auVar134._4_4_ + fVar285 * auVar197._4_4_ + fVar190 * auVar304._4_4_;
  auVar218._8_4_ = fVar267 * auVar134._8_4_ + fVar288 * auVar197._8_4_ + fVar263 * auVar304._8_4_;
  auVar218._12_4_ =
       fVar211 * auVar134._12_4_ + fVar291 * auVar197._12_4_ + fVar209 * auVar304._12_4_;
  auVar133._0_4_ = fVar265 * auVar95._0_4_ + auVar194._0_4_ * fVar245 + fVar273 * auVar176._0_4_;
  auVar133._4_4_ = fVar210 * auVar95._4_4_ + auVar194._4_4_ * fVar190 + fVar285 * auVar176._4_4_;
  auVar133._8_4_ = fVar267 * auVar95._8_4_ + auVar194._8_4_ * fVar263 + fVar288 * auVar176._8_4_;
  auVar133._12_4_ = fVar211 * auVar95._12_4_ + auVar194._12_4_ * fVar209 + fVar291 * auVar176._12_4_
  ;
  auVar90._0_4_ = fVar265 * auVar91._0_4_ + fVar273 * auVar92._0_4_ + auVar144._0_4_ * fVar245;
  auVar90._4_4_ = fVar210 * auVar91._4_4_ + fVar285 * auVar92._4_4_ + auVar144._4_4_ * fVar190;
  auVar90._8_4_ = fVar267 * auVar91._8_4_ + fVar288 * auVar92._8_4_ + auVar144._8_4_ * fVar263;
  auVar90._12_4_ = fVar211 * auVar91._12_4_ + fVar291 * auVar92._12_4_ + auVar144._12_4_ * fVar209;
  auVar276._8_4_ = 0x7fffffff;
  auVar276._0_8_ = 0x7fffffff7fffffff;
  auVar276._12_4_ = 0x7fffffff;
  auVar134 = vandps_avx(auVar357,auVar276);
  auVar191._8_4_ = 0x219392ef;
  auVar191._0_8_ = 0x219392ef219392ef;
  auVar191._12_4_ = 0x219392ef;
  auVar134 = vcmpps_avx(auVar134,auVar191,1);
  auVar197 = vblendvps_avx(auVar357,auVar191,auVar134);
  auVar134 = vandps_avx(auVar369,auVar276);
  auVar134 = vcmpps_avx(auVar134,auVar191,1);
  auVar304 = vblendvps_avx(auVar369,auVar191,auVar134);
  auVar134 = vandps_avx(auVar302,auVar276);
  auVar134 = vcmpps_avx(auVar134,auVar191,1);
  auVar134 = vblendvps_avx(auVar302,auVar191,auVar134);
  auVar95 = vrcpps_avx(auVar197);
  fVar273 = auVar95._0_4_;
  auVar173._0_4_ = fVar273 * auVar197._0_4_;
  fVar285 = auVar95._4_4_;
  auVar173._4_4_ = fVar285 * auVar197._4_4_;
  fVar288 = auVar95._8_4_;
  auVar173._8_4_ = fVar288 * auVar197._8_4_;
  fVar291 = auVar95._12_4_;
  auVar173._12_4_ = fVar291 * auVar197._12_4_;
  auVar303._8_4_ = 0x3f800000;
  auVar303._0_8_ = &DAT_3f8000003f800000;
  auVar303._12_4_ = 0x3f800000;
  auVar197 = vsubps_avx(auVar303,auVar173);
  fVar273 = fVar273 + fVar273 * auVar197._0_4_;
  fVar285 = fVar285 + fVar285 * auVar197._4_4_;
  fVar288 = fVar288 + fVar288 * auVar197._8_4_;
  fVar291 = fVar291 + fVar291 * auVar197._12_4_;
  auVar197 = vrcpps_avx(auVar304);
  fVar245 = auVar197._0_4_;
  auVar247._0_4_ = fVar245 * auVar304._0_4_;
  fVar263 = auVar197._4_4_;
  auVar247._4_4_ = fVar263 * auVar304._4_4_;
  fVar265 = auVar197._8_4_;
  auVar247._8_4_ = fVar265 * auVar304._8_4_;
  fVar267 = auVar197._12_4_;
  auVar247._12_4_ = fVar267 * auVar304._12_4_;
  auVar197 = vsubps_avx(auVar303,auVar247);
  fVar245 = fVar245 + fVar245 * auVar197._0_4_;
  fVar263 = fVar263 + fVar263 * auVar197._4_4_;
  fVar265 = fVar265 + fVar265 * auVar197._8_4_;
  fVar267 = fVar267 + fVar267 * auVar197._12_4_;
  auVar197 = vrcpps_avx(auVar134);
  fVar190 = auVar197._0_4_;
  auVar192._0_4_ = fVar190 * auVar134._0_4_;
  fVar209 = auVar197._4_4_;
  auVar192._4_4_ = fVar209 * auVar134._4_4_;
  fVar210 = auVar197._8_4_;
  auVar192._8_4_ = fVar210 * auVar134._8_4_;
  fVar211 = auVar197._12_4_;
  auVar192._12_4_ = fVar211 * auVar134._12_4_;
  auVar134 = vsubps_avx(auVar303,auVar192);
  fVar190 = fVar190 + fVar190 * auVar134._0_4_;
  fVar209 = fVar209 + fVar209 * auVar134._4_4_;
  fVar210 = fVar210 + fVar210 * auVar134._8_4_;
  fVar211 = fVar211 + fVar211 * auVar134._12_4_;
  auVar134._8_8_ = 0;
  auVar134._0_8_ = *(ulong *)(prim + uVar80 * 7 + 6);
  auVar134 = vpmovsxwd_avx(auVar134);
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar134 = vsubps_avx(auVar134,auVar218);
  auVar174._0_4_ = fVar273 * auVar134._0_4_;
  auVar174._4_4_ = fVar285 * auVar134._4_4_;
  auVar174._8_4_ = fVar288 * auVar134._8_4_;
  auVar174._12_4_ = fVar291 * auVar134._12_4_;
  auVar197._8_8_ = 0;
  auVar197._0_8_ = *(ulong *)(prim + uVar80 * 9 + 6);
  auVar134 = vpmovsxwd_avx(auVar197);
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar134 = vsubps_avx(auVar134,auVar218);
  auVar219._0_4_ = fVar273 * auVar134._0_4_;
  auVar219._4_4_ = fVar285 * auVar134._4_4_;
  auVar219._8_4_ = fVar288 * auVar134._8_4_;
  auVar219._12_4_ = fVar291 * auVar134._12_4_;
  auVar304._8_8_ = 0;
  auVar304._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar197 = vpmovsxwd_avx(auVar304);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar80 * -2 + 6);
  auVar134 = vpmovsxwd_avx(auVar95);
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar134 = vsubps_avx(auVar134,auVar133);
  auVar323._0_4_ = auVar134._0_4_ * fVar245;
  auVar323._4_4_ = auVar134._4_4_ * fVar263;
  auVar323._8_4_ = auVar134._8_4_ * fVar265;
  auVar323._12_4_ = auVar134._12_4_ * fVar267;
  auVar134 = vcvtdq2ps_avx(auVar197);
  auVar134 = vsubps_avx(auVar134,auVar133);
  auVar144._0_4_ = fVar245 * auVar134._0_4_;
  auVar144._4_4_ = fVar263 * auVar134._4_4_;
  auVar144._8_4_ = fVar265 * auVar134._8_4_;
  auVar144._12_4_ = fVar267 * auVar134._12_4_;
  auVar176._8_8_ = 0;
  auVar176._0_8_ = *(ulong *)(prim + uVar85 + uVar80 + 6);
  auVar134 = vpmovsxwd_avx(auVar176);
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar134 = vsubps_avx(auVar134,auVar90);
  auVar248._0_4_ = auVar134._0_4_ * fVar190;
  auVar248._4_4_ = auVar134._4_4_ * fVar209;
  auVar248._8_4_ = auVar134._8_4_ * fVar210;
  auVar248._12_4_ = auVar134._12_4_ * fVar211;
  auVar194._8_8_ = 0;
  auVar194._0_8_ = *(ulong *)(prim + uVar80 * 0x17 + 6);
  auVar134 = vpmovsxwd_avx(auVar194);
  auVar134 = vcvtdq2ps_avx(auVar134);
  auVar134 = vsubps_avx(auVar134,auVar90);
  auVar91._0_4_ = auVar134._0_4_ * fVar190;
  auVar91._4_4_ = auVar134._4_4_ * fVar209;
  auVar91._8_4_ = auVar134._8_4_ * fVar210;
  auVar91._12_4_ = auVar134._12_4_ * fVar211;
  auVar134 = vpminsd_avx(auVar174,auVar219);
  auVar197 = vpminsd_avx(auVar323,auVar144);
  auVar134 = vmaxps_avx(auVar134,auVar197);
  auVar197 = vpminsd_avx(auVar248,auVar91);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar332._4_4_ = uVar1;
  auVar332._0_4_ = uVar1;
  auVar332._8_4_ = uVar1;
  auVar332._12_4_ = uVar1;
  auVar197 = vmaxps_avx(auVar197,auVar332);
  auVar134 = vmaxps_avx(auVar134,auVar197);
  local_4d0._0_4_ = auVar134._0_4_ * 0.99999964;
  local_4d0._4_4_ = auVar134._4_4_ * 0.99999964;
  local_4d0._8_4_ = auVar134._8_4_ * 0.99999964;
  local_4d0._12_4_ = auVar134._12_4_ * 0.99999964;
  auVar134 = vpmaxsd_avx(auVar174,auVar219);
  auVar197 = vpmaxsd_avx(auVar323,auVar144);
  auVar134 = vminps_avx(auVar134,auVar197);
  auVar197 = vpmaxsd_avx(auVar248,auVar91);
  uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar175._4_4_ = uVar1;
  auVar175._0_4_ = uVar1;
  auVar175._8_4_ = uVar1;
  auVar175._12_4_ = uVar1;
  auVar197 = vminps_avx(auVar197,auVar175);
  auVar134 = vminps_avx(auVar134,auVar197);
  auVar92._0_4_ = auVar134._0_4_ * 1.0000004;
  auVar92._4_4_ = auVar134._4_4_ * 1.0000004;
  auVar92._8_4_ = auVar134._8_4_ * 1.0000004;
  auVar92._12_4_ = auVar134._12_4_ * 1.0000004;
  auVar134 = vpshufd_avx(ZEXT116((byte)PVar3),0);
  auVar197 = vpcmpgtd_avx(auVar134,_DAT_01ff0cf0);
  auVar134 = vcmpps_avx(local_4d0,auVar92,2);
  auVar134 = vandps_avx(auVar134,auVar197);
  uVar79 = vmovmskps_avx(auVar134);
  if (uVar79 == 0) {
    return;
  }
  uVar79 = uVar79 & 0xff;
  auVar104._16_16_ = mm_lookupmask_ps._240_16_;
  auVar104._0_16_ = mm_lookupmask_ps._240_16_;
  local_4a0 = vblendps_avx(auVar104,ZEXT832(0) << 0x20,0x80);
  local_9c8 = (undefined8 *)(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_8b0 = prim;
LAB_00f78d69:
  local_8a8 = (ulong)uVar79;
  lVar82 = 0;
  if (local_8a8 != 0) {
    for (; (uVar79 >> lVar82 & 1) == 0; lVar82 = lVar82 + 1) {
    }
  }
  local_8a8 = local_8a8 - 1 & local_8a8;
  uVar79 = *(uint *)(local_8b0 + 2);
  uVar4 = *(uint *)(local_8b0 + lVar82 * 4 + 6);
  local_b10 = (ulong)uVar4;
  pGVar5 = (context->scene->geometries).items[uVar79].ptr;
  uVar85 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_b10);
  p_Var6 = pGVar5[1].intersectionFilterN;
  lVar82 = *(long *)&pGVar5[1].time_range.upper;
  auVar134 = *(undefined1 (*) [16])(lVar82 + (long)p_Var6 * uVar85);
  auVar197 = *(undefined1 (*) [16])(lVar82 + (uVar85 + 1) * (long)p_Var6);
  auVar304 = *(undefined1 (*) [16])(lVar82 + (uVar85 + 2) * (long)p_Var6);
  lVar7 = 0;
  if (local_8a8 != 0) {
    for (; (local_8a8 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
    }
  }
  auVar95 = *(undefined1 (*) [16])(lVar82 + (uVar85 + 3) * (long)p_Var6);
  if (((local_8a8 != 0) && (uVar85 = local_8a8 - 1 & local_8a8, uVar85 != 0)) &&
     (lVar82 = 0, uVar85 != 0)) {
    for (; (uVar85 >> lVar82 & 1) == 0; lVar82 = lVar82 + 1) {
    }
  }
  auVar176 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar194 = vinsertps_avx(auVar176,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  fVar245 = *(float *)(ray + k * 4 + 0x40);
  auVar333._4_4_ = fVar245;
  auVar333._0_4_ = fVar245;
  auVar333._8_4_ = fVar245;
  auVar333._12_4_ = fVar245;
  fStack_7b0 = fVar245;
  _local_7c0 = auVar333;
  fStack_7ac = fVar245;
  fStack_7a8 = fVar245;
  fStack_7a4 = fVar245;
  fVar190 = *(float *)(ray + k * 4 + 0x50);
  auVar341._4_4_ = fVar190;
  auVar341._0_4_ = fVar190;
  auVar341._8_4_ = fVar190;
  auVar341._12_4_ = fVar190;
  fStack_7d0 = fVar190;
  _local_7e0 = auVar341;
  fStack_7cc = fVar190;
  fStack_7c8 = fVar190;
  fStack_7c4 = fVar190;
  auVar176 = vunpcklps_avx(auVar333,auVar341);
  fVar263 = *(float *)(ray + k * 4 + 0x60);
  auVar351._4_4_ = fVar263;
  auVar351._0_4_ = fVar263;
  auVar351._8_4_ = fVar263;
  auVar351._12_4_ = fVar263;
  fStack_7f0 = fVar263;
  _local_800 = auVar351;
  fStack_7ec = fVar263;
  fStack_7e8 = fVar263;
  fStack_7e4 = fVar263;
  auVar354 = ZEXT3264(_local_800);
  _local_930 = vinsertps_avx(auVar176,auVar351,0x28);
  auVar93._0_4_ = (auVar134._0_4_ + auVar197._0_4_ + auVar304._0_4_ + auVar95._0_4_) * 0.25;
  auVar93._4_4_ = (auVar134._4_4_ + auVar197._4_4_ + auVar304._4_4_ + auVar95._4_4_) * 0.25;
  auVar93._8_4_ = (auVar134._8_4_ + auVar197._8_4_ + auVar304._8_4_ + auVar95._8_4_) * 0.25;
  auVar93._12_4_ = (auVar134._12_4_ + auVar197._12_4_ + auVar304._12_4_ + auVar95._12_4_) * 0.25;
  auVar176 = vsubps_avx(auVar93,auVar194);
  auVar176 = vdpps_avx(auVar176,_local_930,0x7f);
  local_940 = vdpps_avx(_local_930,_local_930,0x7f);
  auVar91 = vrcpss_avx(local_940,local_940);
  fVar209 = auVar176._0_4_ * auVar91._0_4_ * (2.0 - local_940._0_4_ * auVar91._0_4_);
  auVar91 = vshufps_avx(ZEXT416((uint)fVar209),ZEXT416((uint)fVar209),0);
  auVar249._0_4_ = auVar194._0_4_ + local_930._0_4_ * auVar91._0_4_;
  auVar249._4_4_ = auVar194._4_4_ + local_930._4_4_ * auVar91._4_4_;
  auVar249._8_4_ = auVar194._8_4_ + local_930._8_4_ * auVar91._8_4_;
  auVar249._12_4_ = auVar194._12_4_ + local_930._12_4_ * auVar91._12_4_;
  auVar176 = vblendps_avx(auVar249,_DAT_01feba10,8);
  _local_a60 = vsubps_avx(auVar134,auVar176);
  _local_a70 = vsubps_avx(auVar304,auVar176);
  auVar208 = ZEXT1664(_local_a70);
  _local_a80 = vsubps_avx(auVar197,auVar176);
  _local_a90 = vsubps_avx(auVar95,auVar176);
  auVar134 = vshufps_avx(_local_a60,_local_a60,0);
  register0x00001250 = auVar134;
  _local_1a0 = auVar134;
  auVar134 = vshufps_avx(_local_a60,_local_a60,0x55);
  register0x00001250 = auVar134;
  _local_1c0 = auVar134;
  auVar134 = vshufps_avx(_local_a60,_local_a60,0xaa);
  register0x00001250 = auVar134;
  _local_1e0 = auVar134;
  auVar134 = vshufps_avx(_local_a60,_local_a60,0xff);
  register0x00001290 = auVar134;
  _local_200 = auVar134;
  auVar134 = vshufps_avx(_local_a80,_local_a80,0);
  register0x00001290 = auVar134;
  _local_220 = auVar134;
  auVar134 = vshufps_avx(_local_a80,_local_a80,0x55);
  register0x00001290 = auVar134;
  _local_240 = auVar134;
  auVar134 = vshufps_avx(_local_a80,_local_a80,0xaa);
  register0x00001290 = auVar134;
  _local_260 = auVar134;
  auVar134 = vshufps_avx(_local_a80,_local_a80,0xff);
  register0x00001290 = auVar134;
  _local_280 = auVar134;
  auVar134 = vshufps_avx(_local_a70,_local_a70,0);
  register0x00001290 = auVar134;
  _local_2a0 = auVar134;
  auVar134 = vshufps_avx(_local_a70,_local_a70,0x55);
  register0x00001290 = auVar134;
  _local_2c0 = auVar134;
  auVar134 = vshufps_avx(_local_a70,_local_a70,0xaa);
  register0x00001290 = auVar134;
  _local_2e0 = auVar134;
  auVar134 = vshufps_avx(_local_a70,_local_a70,0xff);
  register0x00001290 = auVar134;
  _local_300 = auVar134;
  auVar134 = vshufps_avx(_local_a90,_local_a90,0);
  register0x00001290 = auVar134;
  _local_320 = auVar134;
  auVar134 = vshufps_avx(_local_a90,_local_a90,0x55);
  register0x00001290 = auVar134;
  _local_340 = auVar134;
  auVar134 = vshufps_avx(_local_a90,_local_a90,0xaa);
  register0x00001290 = auVar134;
  _local_360 = auVar134;
  auVar134 = vshufps_avx(_local_a90,_local_a90,0xff);
  register0x00001290 = auVar134;
  _local_380 = auVar134;
  auVar134 = ZEXT416((uint)(fVar245 * fVar245 + fVar190 * fVar190 + fVar263 * fVar263));
  auVar134 = vshufps_avx(auVar134,auVar134,0);
  local_3a0._16_16_ = auVar134;
  local_3a0._0_16_ = auVar134;
  fVar245 = *(float *)(ray + k * 4 + 0x30);
  local_8c0 = ZEXT416((uint)fVar209);
  auVar134 = vshufps_avx(ZEXT416((uint)(fVar245 - fVar209)),ZEXT416((uint)(fVar245 - fVar209)),0);
  local_3c0._16_16_ = auVar134;
  local_3c0._0_16_ = auVar134;
  local_710 = vshufps_avx(ZEXT416(uVar79),ZEXT416(uVar79),0);
  local_720 = vshufps_avx(ZEXT416(uVar4),ZEXT416(uVar4),0);
  register0x00001390 = auVar91;
  _local_9a0 = auVar91;
  auVar284 = ZEXT3264(_local_9a0);
  uVar85 = 1;
  uVar80 = 0;
  auVar105._8_4_ = 0x7fffffff;
  auVar105._0_8_ = 0x7fffffff7fffffff;
  auVar105._12_4_ = 0x7fffffff;
  auVar105._16_4_ = 0x7fffffff;
  auVar105._20_4_ = 0x7fffffff;
  auVar105._24_4_ = 0x7fffffff;
  auVar105._28_4_ = 0x7fffffff;
  local_4c0 = vandps_avx(local_3a0,auVar105);
  auVar134 = vsqrtss_avx(local_940,local_940);
  local_b04 = auVar134._0_4_;
  auVar134 = vsqrtss_avx(local_940,local_940);
  local_b08 = auVar134._0_4_;
  auVar310 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  do {
    auVar304 = auVar310._0_16_;
    auVar134 = vmovshdup_avx(auVar304);
    fVar190 = auVar134._0_4_ - auVar310._0_4_;
    auVar134 = vshufps_avx(auVar304,auVar304,0);
    local_980._16_16_ = auVar134;
    local_980._0_16_ = auVar134;
    auVar197 = vshufps_avx(ZEXT416((uint)fVar190),ZEXT416((uint)fVar190),0);
    local_920._16_16_ = auVar197;
    local_920._0_16_ = auVar197;
    fVar132 = auVar197._0_4_;
    fVar164 = auVar197._4_4_;
    fVar165 = auVar197._8_4_;
    fVar167 = auVar197._12_4_;
    fVar87 = auVar134._0_4_;
    auVar148._0_4_ = fVar87 + fVar132 * 0.0;
    fVar115 = auVar134._4_4_;
    auVar148._4_4_ = fVar115 + fVar164 * 0.14285715;
    fVar118 = auVar134._8_4_;
    auVar148._8_4_ = fVar118 + fVar165 * 0.2857143;
    fVar121 = auVar134._12_4_;
    auVar148._12_4_ = fVar121 + fVar167 * 0.42857146;
    auVar148._16_4_ = fVar87 + fVar132 * 0.5714286;
    auVar148._20_4_ = fVar115 + fVar164 * 0.71428573;
    auVar148._24_4_ = fVar118 + fVar165 * 0.8571429;
    auVar148._28_4_ = fVar121 + fVar167;
    auVar104 = vsubps_avx(auVar233._0_32_,auVar148);
    fVar263 = auVar104._0_4_;
    fVar209 = auVar104._4_4_;
    fVar265 = auVar104._8_4_;
    fVar210 = auVar104._12_4_;
    fVar267 = auVar104._16_4_;
    fVar211 = auVar104._20_4_;
    fVar273 = auVar104._24_4_;
    fVar216 = auVar208._28_4_;
    fVar274 = (float)local_2a0._0_4_ * auVar148._0_4_ + (float)local_220._0_4_ * fVar263;
    fVar286 = (float)local_2a0._4_4_ * auVar148._4_4_ + (float)local_220._4_4_ * fVar209;
    fVar289 = fStack_298 * auVar148._8_4_ + fStack_218 * fVar265;
    fVar292 = fStack_294 * auVar148._12_4_ + fStack_214 * fVar210;
    fVar294 = fStack_290 * auVar148._16_4_ + fStack_210 * fVar267;
    fVar296 = fStack_28c * auVar148._20_4_ + fStack_20c * fVar211;
    fVar298 = fStack_288 * auVar148._24_4_ + fStack_208 * fVar273;
    fVar285 = (float)local_2c0._0_4_ * auVar148._0_4_ + (float)local_240._0_4_ * fVar263;
    fVar288 = (float)local_2c0._4_4_ * auVar148._4_4_ + (float)local_240._4_4_ * fVar209;
    fVar291 = fStack_2b8 * auVar148._8_4_ + fStack_238 * fVar265;
    fVar212 = fStack_2b4 * auVar148._12_4_ + fStack_234 * fVar210;
    fVar213 = fStack_2b0 * auVar148._16_4_ + fStack_230 * fVar267;
    fVar214 = fStack_2ac * auVar148._20_4_ + fStack_22c * fVar211;
    fVar215 = fStack_2a8 * auVar148._24_4_ + fStack_228 * fVar273;
    fVar217 = (float)local_2e0._0_4_ * auVar148._0_4_ + (float)local_260._0_4_ * fVar263;
    fVar234 = (float)local_2e0._4_4_ * auVar148._4_4_ + (float)local_260._4_4_ * fVar209;
    fVar235 = fStack_2d8 * auVar148._8_4_ + fStack_258 * fVar265;
    fVar237 = fStack_2d4 * auVar148._12_4_ + fStack_254 * fVar210;
    fVar239 = fStack_2d0 * auVar148._16_4_ + fStack_250 * fVar267;
    fVar241 = fStack_2cc * auVar148._20_4_ + fStack_24c * fVar211;
    fVar243 = fStack_2c8 * auVar148._24_4_ + fStack_248 * fVar273;
    fVar246 = (float)local_300._0_4_ * auVar148._0_4_ + (float)local_280._0_4_ * fVar263;
    fVar264 = (float)local_300._4_4_ * auVar148._4_4_ + (float)local_280._4_4_ * fVar209;
    fVar266 = fStack_2f8 * auVar148._8_4_ + fStack_278 * fVar265;
    fVar268 = fStack_2f4 * auVar148._12_4_ + fStack_274 * fVar210;
    fVar269 = fStack_2f0 * auVar148._16_4_ + fStack_270 * fVar267;
    fVar270 = fStack_2ec * auVar148._20_4_ + fStack_26c * fVar211;
    fVar271 = fStack_2e8 * auVar148._24_4_ + fStack_268 * fVar273;
    fVar355 = auVar354._28_4_;
    fVar386 = fVar355 + fStack_224;
    fVar365 = fStack_204 + fVar355;
    auVar336._0_4_ =
         ((float)local_220._0_4_ * auVar148._0_4_ + fVar263 * (float)local_1a0._0_4_) * fVar263 +
         auVar148._0_4_ * fVar274;
    auVar336._4_4_ =
         ((float)local_220._4_4_ * auVar148._4_4_ + fVar209 * (float)local_1a0._4_4_) * fVar209 +
         auVar148._4_4_ * fVar286;
    auVar336._8_4_ =
         (fStack_218 * auVar148._8_4_ + fVar265 * fStack_198) * fVar265 + auVar148._8_4_ * fVar289;
    auVar336._12_4_ =
         (fStack_214 * auVar148._12_4_ + fVar210 * fStack_194) * fVar210 + auVar148._12_4_ * fVar292
    ;
    auVar336._16_4_ =
         (fStack_210 * auVar148._16_4_ + fVar267 * fStack_190) * fVar267 + auVar148._16_4_ * fVar294
    ;
    auVar336._20_4_ =
         (fStack_20c * auVar148._20_4_ + fVar211 * fStack_18c) * fVar211 + auVar148._20_4_ * fVar296
    ;
    auVar336._24_4_ =
         (fStack_208 * auVar148._24_4_ + fVar273 * fStack_188) * fVar273 + auVar148._24_4_ * fVar298
    ;
    auVar336._28_4_ = fStack_2e4 + fVar355;
    auVar342._0_4_ =
         fVar263 * ((float)local_240._0_4_ * auVar148._0_4_ + fVar263 * (float)local_1c0._0_4_) +
         auVar148._0_4_ * fVar285;
    auVar342._4_4_ =
         fVar209 * ((float)local_240._4_4_ * auVar148._4_4_ + fVar209 * (float)local_1c0._4_4_) +
         auVar148._4_4_ * fVar288;
    auVar342._8_4_ =
         fVar265 * (fStack_238 * auVar148._8_4_ + fVar265 * fStack_1b8) + auVar148._8_4_ * fVar291;
    auVar342._12_4_ =
         fVar210 * (fStack_234 * auVar148._12_4_ + fVar210 * fStack_1b4) + auVar148._12_4_ * fVar212
    ;
    auVar342._16_4_ =
         fVar267 * (fStack_230 * auVar148._16_4_ + fVar267 * fStack_1b0) + auVar148._16_4_ * fVar213
    ;
    auVar342._20_4_ =
         fVar211 * (fStack_22c * auVar148._20_4_ + fVar211 * fStack_1ac) + auVar148._20_4_ * fVar214
    ;
    auVar342._24_4_ =
         fVar273 * (fStack_228 * auVar148._24_4_ + fVar273 * fStack_1a8) + auVar148._24_4_ * fVar215
    ;
    auVar342._28_4_ = fVar216 + auVar310._28_4_ + fVar355;
    auVar352._0_4_ =
         fVar263 * ((float)local_260._0_4_ * auVar148._0_4_ + fVar263 * (float)local_1e0._0_4_) +
         auVar148._0_4_ * fVar217;
    auVar352._4_4_ =
         fVar209 * ((float)local_260._4_4_ * auVar148._4_4_ + fVar209 * (float)local_1e0._4_4_) +
         auVar148._4_4_ * fVar234;
    auVar352._8_4_ =
         fVar265 * (fStack_258 * auVar148._8_4_ + fVar265 * fStack_1d8) + auVar148._8_4_ * fVar235;
    auVar352._12_4_ =
         fVar210 * (fStack_254 * auVar148._12_4_ + fVar210 * fStack_1d4) + auVar148._12_4_ * fVar237
    ;
    auVar352._16_4_ =
         fVar267 * (fStack_250 * auVar148._16_4_ + fVar267 * fStack_1d0) + auVar148._16_4_ * fVar239
    ;
    auVar352._20_4_ =
         fVar211 * (fStack_24c * auVar148._20_4_ + fVar211 * fStack_1cc) + auVar148._20_4_ * fVar241
    ;
    auVar352._24_4_ =
         fVar273 * (fStack_248 * auVar148._24_4_ + fVar273 * fStack_1c8) + auVar148._24_4_ * fVar243
    ;
    auVar352._28_4_ = fStack_2c4 + fVar355;
    auVar305._0_4_ =
         auVar148._0_4_ * fVar246 +
         fVar263 * ((float)local_280._0_4_ * auVar148._0_4_ + fVar263 * (float)local_200._0_4_);
    auVar305._4_4_ =
         auVar148._4_4_ * fVar264 +
         fVar209 * ((float)local_280._4_4_ * auVar148._4_4_ + fVar209 * (float)local_200._4_4_);
    auVar305._8_4_ =
         auVar148._8_4_ * fVar266 + fVar265 * (fStack_278 * auVar148._8_4_ + fVar265 * fStack_1f8);
    auVar305._12_4_ =
         auVar148._12_4_ * fVar268 + fVar210 * (fStack_274 * auVar148._12_4_ + fVar210 * fStack_1f4)
    ;
    auVar305._16_4_ =
         auVar148._16_4_ * fVar269 + fVar267 * (fStack_270 * auVar148._16_4_ + fVar267 * fStack_1f0)
    ;
    auVar305._20_4_ =
         auVar148._20_4_ * fVar270 + fVar211 * (fStack_26c * auVar148._20_4_ + fVar211 * fStack_1ec)
    ;
    auVar305._24_4_ =
         auVar148._24_4_ * fVar271 + fVar273 * (fStack_268 * auVar148._24_4_ + fVar273 * fStack_1e8)
    ;
    auVar305._28_4_ = fStack_2c4 + fStack_2a4;
    auVar387._0_4_ =
         (auVar148._0_4_ * (float)local_320._0_4_ + (float)local_2a0._0_4_ * fVar263) *
         auVar148._0_4_ + fVar263 * fVar274;
    auVar387._4_4_ =
         (auVar148._4_4_ * (float)local_320._4_4_ + (float)local_2a0._4_4_ * fVar209) *
         auVar148._4_4_ + fVar209 * fVar286;
    auVar387._8_4_ =
         (auVar148._8_4_ * fStack_318 + fStack_298 * fVar265) * auVar148._8_4_ + fVar265 * fVar289;
    auVar387._12_4_ =
         (auVar148._12_4_ * fStack_314 + fStack_294 * fVar210) * auVar148._12_4_ + fVar210 * fVar292
    ;
    auVar387._16_4_ =
         (auVar148._16_4_ * fStack_310 + fStack_290 * fVar267) * auVar148._16_4_ + fVar267 * fVar294
    ;
    auVar387._20_4_ =
         (auVar148._20_4_ * fStack_30c + fStack_28c * fVar211) * auVar148._20_4_ + fVar211 * fVar296
    ;
    auVar387._24_4_ =
         (auVar148._24_4_ * fStack_308 + fStack_288 * fVar273) * auVar148._24_4_ + fVar273 * fVar298
    ;
    auVar387._28_4_ = fStack_2c4 + fVar216 + auVar284._28_4_;
    auVar202._0_4_ =
         (auVar148._0_4_ * (float)local_340._0_4_ + (float)local_2c0._0_4_ * fVar263) *
         auVar148._0_4_ + fVar263 * fVar285;
    auVar202._4_4_ =
         (auVar148._4_4_ * (float)local_340._4_4_ + (float)local_2c0._4_4_ * fVar209) *
         auVar148._4_4_ + fVar209 * fVar288;
    auVar202._8_4_ =
         (auVar148._8_4_ * fStack_338 + fStack_2b8 * fVar265) * auVar148._8_4_ + fVar265 * fVar291;
    auVar202._12_4_ =
         (auVar148._12_4_ * fStack_334 + fStack_2b4 * fVar210) * auVar148._12_4_ + fVar210 * fVar212
    ;
    auVar202._16_4_ =
         (auVar148._16_4_ * fStack_330 + fStack_2b0 * fVar267) * auVar148._16_4_ + fVar267 * fVar213
    ;
    auVar202._20_4_ =
         (auVar148._20_4_ * fStack_32c + fStack_2ac * fVar211) * auVar148._20_4_ + fVar211 * fVar214
    ;
    auVar202._24_4_ =
         (auVar148._24_4_ * fStack_328 + fStack_2a8 * fVar273) * auVar148._24_4_ + fVar273 * fVar215
    ;
    auVar202._28_4_ = fStack_2c4 + auVar233._28_4_ + fVar216;
    auVar229._0_4_ =
         auVar148._0_4_ *
         (auVar148._0_4_ * (float)local_360._0_4_ + (float)local_2e0._0_4_ * fVar263) +
         fVar263 * fVar217;
    auVar229._4_4_ =
         auVar148._4_4_ *
         (auVar148._4_4_ * (float)local_360._4_4_ + (float)local_2e0._4_4_ * fVar209) +
         fVar209 * fVar234;
    auVar229._8_4_ =
         auVar148._8_4_ * (auVar148._8_4_ * fStack_358 + fStack_2d8 * fVar265) + fVar265 * fVar235;
    auVar229._12_4_ =
         auVar148._12_4_ * (auVar148._12_4_ * fStack_354 + fStack_2d4 * fVar210) + fVar210 * fVar237
    ;
    auVar229._16_4_ =
         auVar148._16_4_ * (auVar148._16_4_ * fStack_350 + fStack_2d0 * fVar267) + fVar267 * fVar239
    ;
    auVar229._20_4_ =
         auVar148._20_4_ * (auVar148._20_4_ * fStack_34c + fStack_2cc * fVar211) + fVar211 * fVar241
    ;
    auVar229._24_4_ =
         auVar148._24_4_ * (auVar148._24_4_ * fStack_348 + fStack_2c8 * fVar273) + fVar273 * fVar243
    ;
    auVar229._28_4_ = fVar365 + auVar233._28_4_ + 1.0;
    auVar255._0_4_ =
         (auVar148._0_4_ * (float)local_380._0_4_ + (float)local_300._0_4_ * fVar263) *
         auVar148._0_4_ + fVar263 * fVar246;
    auVar255._4_4_ =
         (auVar148._4_4_ * (float)local_380._4_4_ + (float)local_300._4_4_ * fVar209) *
         auVar148._4_4_ + fVar209 * fVar264;
    auVar255._8_4_ =
         (auVar148._8_4_ * fStack_378 + fStack_2f8 * fVar265) * auVar148._8_4_ + fVar265 * fVar266;
    auVar255._12_4_ =
         (auVar148._12_4_ * fStack_374 + fStack_2f4 * fVar210) * auVar148._12_4_ + fVar210 * fVar268
    ;
    auVar255._16_4_ =
         (auVar148._16_4_ * fStack_370 + fStack_2f0 * fVar267) * auVar148._16_4_ + fVar267 * fVar269
    ;
    auVar255._20_4_ =
         (auVar148._20_4_ * fStack_36c + fStack_2ec * fVar211) * auVar148._20_4_ + fVar211 * fVar270
    ;
    auVar255._24_4_ =
         (auVar148._24_4_ * fStack_368 + fStack_2e8 * fVar273) * auVar148._24_4_ + fVar273 * fVar271
    ;
    auVar255._28_4_ = fVar386 + fVar355 + 1.0;
    fVar88 = auVar336._0_4_ * fVar263 + auVar387._0_4_ * auVar148._0_4_;
    fVar116 = auVar336._4_4_ * fVar209 + auVar387._4_4_ * auVar148._4_4_;
    fVar119 = auVar336._8_4_ * fVar265 + auVar387._8_4_ * auVar148._8_4_;
    fVar122 = auVar336._12_4_ * fVar210 + auVar387._12_4_ * auVar148._12_4_;
    fVar124 = auVar336._16_4_ * fVar267 + auVar387._16_4_ * auVar148._16_4_;
    fVar126 = auVar336._20_4_ * fVar211 + auVar387._20_4_ * auVar148._20_4_;
    fVar128 = auVar336._24_4_ * fVar273 + auVar387._24_4_ * auVar148._24_4_;
    fVar130 = fVar386 + fStack_2c4;
    fVar89 = auVar342._0_4_ * fVar263 + auVar148._0_4_ * auVar202._0_4_;
    fVar117 = auVar342._4_4_ * fVar209 + auVar148._4_4_ * auVar202._4_4_;
    fVar120 = auVar342._8_4_ * fVar265 + auVar148._8_4_ * auVar202._8_4_;
    fVar123 = auVar342._12_4_ * fVar210 + auVar148._12_4_ * auVar202._12_4_;
    fVar125 = auVar342._16_4_ * fVar267 + auVar148._16_4_ * auVar202._16_4_;
    fVar127 = auVar342._20_4_ * fVar211 + auVar148._20_4_ * auVar202._20_4_;
    fVar129 = auVar342._24_4_ * fVar273 + auVar148._24_4_ * auVar202._24_4_;
    fVar131 = fStack_2c4 + fVar365;
    local_540._0_4_ = auVar352._0_4_ * fVar263 + auVar148._0_4_ * auVar229._0_4_;
    local_540._4_4_ = auVar352._4_4_ * fVar209 + auVar148._4_4_ * auVar229._4_4_;
    local_540._8_4_ = auVar352._8_4_ * fVar265 + auVar148._8_4_ * auVar229._8_4_;
    local_540._12_4_ = auVar352._12_4_ * fVar210 + auVar148._12_4_ * auVar229._12_4_;
    local_540._16_4_ = auVar352._16_4_ * fVar267 + auVar148._16_4_ * auVar229._16_4_;
    local_540._20_4_ = auVar352._20_4_ * fVar211 + auVar148._20_4_ * auVar229._20_4_;
    local_540._24_4_ = auVar352._24_4_ * fVar273 + auVar148._24_4_ * auVar229._24_4_;
    local_540._28_4_ = fVar365 + fStack_2c4;
    local_740._0_4_ = fVar263 * auVar305._0_4_ + auVar148._0_4_ * auVar255._0_4_;
    local_740._4_4_ = fVar209 * auVar305._4_4_ + auVar148._4_4_ * auVar255._4_4_;
    local_740._8_4_ = fVar265 * auVar305._8_4_ + auVar148._8_4_ * auVar255._8_4_;
    local_740._12_4_ = fVar210 * auVar305._12_4_ + auVar148._12_4_ * auVar255._12_4_;
    local_740._16_4_ = fVar267 * auVar305._16_4_ + auVar148._16_4_ * auVar255._16_4_;
    local_740._20_4_ = fVar211 * auVar305._20_4_ + auVar148._20_4_ * auVar255._20_4_;
    local_740._24_4_ = fVar273 * auVar305._24_4_ + auVar148._24_4_ * auVar255._24_4_;
    local_740._28_4_ = auVar104._28_4_ + auVar148._28_4_;
    auVar15 = vsubps_avx(auVar387,auVar336);
    auVar104 = vsubps_avx(auVar202,auVar342);
    auVar105 = vsubps_avx(auVar229,auVar352);
    auVar148 = vsubps_avx(auVar255,auVar305);
    auVar134 = vshufps_avx(ZEXT416((uint)(fVar190 * 0.04761905)),
                           ZEXT416((uint)(fVar190 * 0.04761905)),0);
    fVar239 = auVar134._0_4_;
    fVar300 = fVar239 * auVar15._0_4_ * 3.0;
    fVar241 = auVar134._4_4_;
    fVar311 = fVar241 * auVar15._4_4_ * 3.0;
    local_ae0._4_4_ = fVar311;
    local_ae0._0_4_ = fVar300;
    fVar269 = auVar134._8_4_;
    fVar312 = fVar269 * auVar15._8_4_ * 3.0;
    fStack_ad8 = fVar312;
    fVar215 = auVar134._12_4_;
    fVar314 = fVar215 * auVar15._12_4_ * 3.0;
    fStack_ad4 = fVar314;
    fVar316 = fVar239 * auVar15._16_4_ * 3.0;
    unique0x100071ac = fVar316;
    fVar318 = fVar241 * auVar15._20_4_ * 3.0;
    unique0x100071b0 = fVar318;
    fVar320 = fVar269 * auVar15._24_4_ * 3.0;
    unique0x100071b4 = fVar320;
    unique0x100071b8 = auVar305._28_4_;
    fVar356 = fVar239 * auVar104._0_4_ * 3.0;
    fVar359 = fVar241 * auVar104._4_4_ * 3.0;
    local_b00._4_4_ = fVar359;
    local_b00._0_4_ = fVar356;
    fVar360 = fVar269 * auVar104._8_4_ * 3.0;
    local_b00._8_4_ = fVar360;
    fVar361 = fVar215 * auVar104._12_4_ * 3.0;
    local_b00._12_4_ = fVar361;
    fVar362 = fVar239 * auVar104._16_4_ * 3.0;
    local_b00._16_4_ = fVar362;
    fVar363 = fVar241 * auVar104._20_4_ * 3.0;
    local_b00._20_4_ = fVar363;
    fVar364 = fVar269 * auVar104._24_4_ * 3.0;
    local_b00._24_4_ = fVar364;
    local_b00._28_4_ = fVar365;
    fVar366 = fVar239 * auVar105._0_4_ * 3.0;
    fVar373 = fVar241 * auVar105._4_4_ * 3.0;
    auVar20._4_4_ = fVar373;
    auVar20._0_4_ = fVar366;
    fVar376 = fVar269 * auVar105._8_4_ * 3.0;
    auVar20._8_4_ = fVar376;
    fVar378 = fVar215 * auVar105._12_4_ * 3.0;
    auVar20._12_4_ = fVar378;
    fVar380 = fVar239 * auVar105._16_4_ * 3.0;
    auVar20._16_4_ = fVar380;
    fVar382 = fVar241 * auVar105._20_4_ * 3.0;
    auVar20._20_4_ = fVar382;
    fVar384 = fVar269 * auVar105._24_4_ * 3.0;
    auVar20._24_4_ = fVar384;
    auVar20._28_4_ = fVar386;
    fVar211 = fVar239 * auVar148._0_4_ * 3.0;
    fVar273 = fVar241 * auVar148._4_4_ * 3.0;
    auVar14._4_4_ = fVar273;
    auVar14._0_4_ = fVar211;
    fVar214 = fVar269 * auVar148._8_4_ * 3.0;
    auVar14._8_4_ = fVar214;
    fVar215 = fVar215 * auVar148._12_4_ * 3.0;
    auVar14._12_4_ = fVar215;
    fVar239 = fVar239 * auVar148._16_4_ * 3.0;
    auVar14._16_4_ = fVar239;
    fVar241 = fVar241 * auVar148._20_4_ * 3.0;
    auVar14._20_4_ = fVar241;
    fVar269 = fVar269 * auVar148._24_4_ * 3.0;
    auVar14._24_4_ = fVar269;
    auVar14._28_4_ = auVar15._28_4_;
    auVar71._4_4_ = fVar117;
    auVar71._0_4_ = fVar89;
    auVar71._8_4_ = fVar120;
    auVar71._12_4_ = fVar123;
    auVar71._16_4_ = fVar125;
    auVar71._20_4_ = fVar127;
    auVar71._24_4_ = fVar129;
    auVar71._28_4_ = fVar131;
    auVar104 = vperm2f128_avx(auVar71,auVar71,1);
    auVar104 = vshufps_avx(auVar104,auVar71,0x30);
    auVar148 = vshufps_avx(auVar71,auVar104,0x29);
    auVar104 = vperm2f128_avx(local_540,local_540,1);
    auVar104 = vshufps_avx(auVar104,local_540,0x30);
    local_a20 = vshufps_avx(local_540,auVar104,0x29);
    auVar105 = vsubps_avx(local_740,auVar14);
    auVar104 = vperm2f128_avx(auVar105,auVar105,1);
    auVar104 = vshufps_avx(auVar104,auVar105,0x30);
    local_760 = vshufps_avx(auVar105,auVar104,0x29);
    local_580 = vsubps_avx(auVar148,auVar71);
    local_560 = vsubps_avx(local_a20,local_540);
    fVar263 = local_580._0_4_;
    fVar285 = local_580._4_4_;
    auVar372._4_4_ = fVar373 * fVar285;
    auVar372._0_4_ = fVar366 * fVar263;
    fVar216 = local_580._8_4_;
    auVar372._8_4_ = fVar376 * fVar216;
    fVar243 = local_580._12_4_;
    auVar372._12_4_ = fVar378 * fVar243;
    fVar271 = local_580._16_4_;
    auVar372._16_4_ = fVar380 * fVar271;
    fVar298 = local_580._20_4_;
    auVar372._20_4_ = fVar382 * fVar298;
    fVar9 = local_580._24_4_;
    auVar372._24_4_ = fVar384 * fVar9;
    auVar372._28_4_ = auVar105._28_4_;
    fVar209 = local_560._0_4_;
    fVar288 = local_560._4_4_;
    auVar16._4_4_ = fVar359 * fVar288;
    auVar16._0_4_ = fVar356 * fVar209;
    fVar217 = local_560._8_4_;
    auVar16._8_4_ = fVar360 * fVar217;
    fVar246 = local_560._12_4_;
    auVar16._12_4_ = fVar361 * fVar246;
    fVar274 = local_560._16_4_;
    auVar16._16_4_ = fVar362 * fVar274;
    fVar355 = local_560._20_4_;
    auVar16._20_4_ = fVar363 * fVar355;
    fVar10 = local_560._24_4_;
    auVar16._24_4_ = fVar364 * fVar10;
    auVar16._28_4_ = auVar104._28_4_;
    auVar372 = vsubps_avx(auVar16,auVar372);
    auVar69._4_4_ = fVar116;
    auVar69._0_4_ = fVar88;
    auVar69._8_4_ = fVar119;
    auVar69._12_4_ = fVar122;
    auVar69._16_4_ = fVar124;
    auVar69._20_4_ = fVar126;
    auVar69._24_4_ = fVar128;
    auVar69._28_4_ = fVar130;
    auVar104 = vperm2f128_avx(auVar69,auVar69,1);
    auVar104 = vshufps_avx(auVar104,auVar69,0x30);
    auVar14 = vshufps_avx(auVar69,auVar104,0x29);
    local_5a0 = vsubps_avx(auVar14,auVar69);
    auVar17._4_4_ = fVar288 * fVar311;
    auVar17._0_4_ = fVar209 * fVar300;
    auVar17._8_4_ = fVar217 * fVar312;
    auVar17._12_4_ = fVar246 * fVar314;
    auVar17._16_4_ = fVar274 * fVar316;
    auVar17._20_4_ = fVar355 * fVar318;
    auVar17._24_4_ = fVar10 * fVar320;
    auVar17._28_4_ = auVar104._28_4_;
    fVar265 = local_5a0._0_4_;
    fVar291 = local_5a0._4_4_;
    auVar18._4_4_ = fVar373 * fVar291;
    auVar18._0_4_ = fVar366 * fVar265;
    fVar234 = local_5a0._8_4_;
    auVar18._8_4_ = fVar376 * fVar234;
    fVar264 = local_5a0._12_4_;
    auVar18._12_4_ = fVar378 * fVar264;
    fVar286 = local_5a0._16_4_;
    auVar18._16_4_ = fVar380 * fVar286;
    fVar386 = local_5a0._20_4_;
    auVar18._20_4_ = fVar382 * fVar386;
    fVar11 = local_5a0._24_4_;
    auVar18._24_4_ = fVar384 * fVar11;
    auVar18._28_4_ = fVar130;
    auVar16 = vsubps_avx(auVar18,auVar17);
    auVar19._4_4_ = fVar359 * fVar291;
    auVar19._0_4_ = fVar356 * fVar265;
    auVar19._8_4_ = fVar360 * fVar234;
    auVar19._12_4_ = fVar361 * fVar264;
    auVar19._16_4_ = fVar362 * fVar286;
    auVar19._20_4_ = fVar363 * fVar386;
    auVar19._24_4_ = fVar364 * fVar11;
    auVar19._28_4_ = fVar130;
    auVar338._4_4_ = fVar285 * fVar311;
    auVar338._0_4_ = fVar263 * fVar300;
    auVar338._8_4_ = fVar216 * fVar312;
    auVar338._12_4_ = fVar243 * fVar314;
    auVar338._16_4_ = fVar271 * fVar316;
    auVar338._20_4_ = fVar298 * fVar318;
    auVar338._24_4_ = fVar9 * fVar320;
    auVar338._28_4_ = auVar342._28_4_;
    auVar17 = vsubps_avx(auVar338,auVar19);
    fVar190 = auVar17._28_4_;
    fVar270 = auVar16._28_4_ + fVar190;
    auVar203._0_4_ = fVar265 * fVar265 + fVar263 * fVar263 + fVar209 * fVar209;
    auVar203._4_4_ = fVar291 * fVar291 + fVar285 * fVar285 + fVar288 * fVar288;
    auVar203._8_4_ = fVar234 * fVar234 + fVar216 * fVar216 + fVar217 * fVar217;
    auVar203._12_4_ = fVar264 * fVar264 + fVar243 * fVar243 + fVar246 * fVar246;
    auVar203._16_4_ = fVar286 * fVar286 + fVar271 * fVar271 + fVar274 * fVar274;
    auVar203._20_4_ = fVar386 * fVar386 + fVar298 * fVar298 + fVar355 * fVar355;
    auVar203._24_4_ = fVar11 * fVar11 + fVar9 * fVar9 + fVar10 * fVar10;
    auVar203._28_4_ = fVar190 + fVar190 + fVar270;
    auVar104 = vrcpps_avx(auVar203);
    fVar294 = auVar104._0_4_;
    fVar296 = auVar104._4_4_;
    auVar21._4_4_ = fVar296 * auVar203._4_4_;
    auVar21._0_4_ = fVar294 * auVar203._0_4_;
    fVar236 = auVar104._8_4_;
    auVar21._8_4_ = fVar236 * auVar203._8_4_;
    fVar238 = auVar104._12_4_;
    auVar21._12_4_ = fVar238 * auVar203._12_4_;
    fVar240 = auVar104._16_4_;
    auVar21._16_4_ = fVar240 * auVar203._16_4_;
    fVar242 = auVar104._20_4_;
    auVar21._20_4_ = fVar242 * auVar203._20_4_;
    fVar244 = auVar104._24_4_;
    auVar21._24_4_ = fVar244 * auVar203._24_4_;
    auVar21._28_4_ = auVar342._28_4_;
    auVar106._8_4_ = 0x3f800000;
    auVar106._0_8_ = &DAT_3f8000003f800000;
    auVar106._12_4_ = 0x3f800000;
    auVar106._16_4_ = 0x3f800000;
    auVar106._20_4_ = 0x3f800000;
    auVar106._24_4_ = 0x3f800000;
    auVar106._28_4_ = 0x3f800000;
    auVar18 = vsubps_avx(auVar106,auVar21);
    fVar294 = auVar18._0_4_ * fVar294 + fVar294;
    fVar296 = auVar18._4_4_ * fVar296 + fVar296;
    fVar236 = auVar18._8_4_ * fVar236 + fVar236;
    fVar238 = auVar18._12_4_ * fVar238 + fVar238;
    fVar240 = auVar18._16_4_ * fVar240 + fVar240;
    fVar242 = auVar18._20_4_ * fVar242 + fVar242;
    fVar244 = auVar18._24_4_ * fVar244 + fVar244;
    auVar105 = vperm2f128_avx(local_b00,local_b00,1);
    auVar105 = vshufps_avx(auVar105,local_b00,0x30);
    local_960 = vshufps_avx(local_b00,auVar105,0x29);
    auVar105 = vperm2f128_avx(auVar20,auVar20,1);
    auVar105 = vshufps_avx(auVar105,auVar20,0x30);
    local_900 = vshufps_avx(auVar20,auVar105,0x29);
    fVar367 = local_900._0_4_;
    fVar374 = local_900._4_4_;
    auVar22._4_4_ = fVar374 * fVar285;
    auVar22._0_4_ = fVar367 * fVar263;
    fVar377 = local_900._8_4_;
    auVar22._8_4_ = fVar377 * fVar216;
    fVar379 = local_900._12_4_;
    auVar22._12_4_ = fVar379 * fVar243;
    fVar381 = local_900._16_4_;
    auVar22._16_4_ = fVar381 * fVar271;
    fVar383 = local_900._20_4_;
    auVar22._20_4_ = fVar383 * fVar298;
    fVar385 = local_900._24_4_;
    auVar22._24_4_ = fVar385 * fVar9;
    auVar22._28_4_ = auVar105._28_4_;
    fVar210 = local_960._0_4_;
    fVar212 = local_960._4_4_;
    auVar23._4_4_ = fVar288 * fVar212;
    auVar23._0_4_ = fVar209 * fVar210;
    fVar235 = local_960._8_4_;
    auVar23._8_4_ = fVar217 * fVar235;
    fVar266 = local_960._12_4_;
    auVar23._12_4_ = fVar246 * fVar266;
    fVar289 = local_960._16_4_;
    auVar23._16_4_ = fVar274 * fVar289;
    fVar272 = local_960._20_4_;
    auVar23._20_4_ = fVar355 * fVar272;
    fVar12 = local_960._24_4_;
    auVar23._24_4_ = fVar10 * fVar12;
    auVar23._28_4_ = fVar365;
    auVar19 = vsubps_avx(auVar23,auVar22);
    auVar105 = vperm2f128_avx(_local_ae0,_local_ae0,1);
    auVar105 = vshufps_avx(auVar105,_local_ae0,0x30);
    local_a00 = vshufps_avx(_local_ae0,auVar105,0x29);
    fVar267 = local_a00._0_4_;
    fVar213 = local_a00._4_4_;
    auVar24._4_4_ = fVar288 * fVar213;
    auVar24._0_4_ = fVar209 * fVar267;
    fVar237 = local_a00._8_4_;
    auVar24._8_4_ = fVar217 * fVar237;
    fVar268 = local_a00._12_4_;
    auVar24._12_4_ = fVar246 * fVar268;
    fVar292 = local_a00._16_4_;
    auVar24._16_4_ = fVar274 * fVar292;
    fVar365 = local_a00._20_4_;
    auVar24._20_4_ = fVar355 * fVar365;
    fVar13 = local_a00._24_4_;
    auVar24._24_4_ = fVar10 * fVar13;
    auVar24._28_4_ = auVar105._28_4_;
    auVar25._4_4_ = fVar374 * fVar291;
    auVar25._0_4_ = fVar367 * fVar265;
    auVar25._8_4_ = fVar377 * fVar234;
    auVar25._12_4_ = fVar379 * fVar264;
    auVar25._16_4_ = fVar381 * fVar286;
    auVar25._20_4_ = fVar383 * fVar386;
    uVar4 = local_900._28_4_;
    auVar25._24_4_ = fVar385 * fVar11;
    auVar25._28_4_ = uVar4;
    auVar338 = vsubps_avx(auVar25,auVar24);
    auVar26._4_4_ = fVar291 * fVar212;
    auVar26._0_4_ = fVar265 * fVar210;
    auVar26._8_4_ = fVar234 * fVar235;
    auVar26._12_4_ = fVar264 * fVar266;
    auVar26._16_4_ = fVar286 * fVar289;
    auVar26._20_4_ = fVar386 * fVar272;
    auVar26._24_4_ = fVar11 * fVar12;
    auVar26._28_4_ = uVar4;
    auVar27._4_4_ = fVar285 * fVar213;
    auVar27._0_4_ = fVar263 * fVar267;
    auVar27._8_4_ = fVar216 * fVar237;
    auVar27._12_4_ = fVar243 * fVar268;
    auVar27._16_4_ = fVar271 * fVar292;
    auVar27._20_4_ = fVar298 * fVar365;
    auVar27._24_4_ = fVar9 * fVar13;
    auVar27._28_4_ = auVar387._28_4_;
    auVar105 = vsubps_avx(auVar27,auVar26);
    fVar190 = auVar105._28_4_;
    auVar28._4_4_ =
         (auVar372._4_4_ * auVar372._4_4_ +
         auVar16._4_4_ * auVar16._4_4_ + auVar17._4_4_ * auVar17._4_4_) * fVar296;
    auVar28._0_4_ =
         (auVar372._0_4_ * auVar372._0_4_ +
         auVar16._0_4_ * auVar16._0_4_ + auVar17._0_4_ * auVar17._0_4_) * fVar294;
    auVar28._8_4_ =
         (auVar372._8_4_ * auVar372._8_4_ +
         auVar16._8_4_ * auVar16._8_4_ + auVar17._8_4_ * auVar17._8_4_) * fVar236;
    auVar28._12_4_ =
         (auVar372._12_4_ * auVar372._12_4_ +
         auVar16._12_4_ * auVar16._12_4_ + auVar17._12_4_ * auVar17._12_4_) * fVar238;
    auVar28._16_4_ =
         (auVar372._16_4_ * auVar372._16_4_ +
         auVar16._16_4_ * auVar16._16_4_ + auVar17._16_4_ * auVar17._16_4_) * fVar240;
    auVar28._20_4_ =
         (auVar372._20_4_ * auVar372._20_4_ +
         auVar16._20_4_ * auVar16._20_4_ + auVar17._20_4_ * auVar17._20_4_) * fVar242;
    auVar28._24_4_ =
         (auVar372._24_4_ * auVar372._24_4_ +
         auVar16._24_4_ * auVar16._24_4_ + auVar17._24_4_ * auVar17._24_4_) * fVar244;
    auVar28._28_4_ = auVar372._28_4_ + fVar270;
    auVar29._4_4_ =
         (auVar19._4_4_ * auVar19._4_4_ +
         auVar338._4_4_ * auVar338._4_4_ + auVar105._4_4_ * auVar105._4_4_) * fVar296;
    auVar29._0_4_ =
         (auVar19._0_4_ * auVar19._0_4_ +
         auVar338._0_4_ * auVar338._0_4_ + auVar105._0_4_ * auVar105._0_4_) * fVar294;
    auVar29._8_4_ =
         (auVar19._8_4_ * auVar19._8_4_ +
         auVar338._8_4_ * auVar338._8_4_ + auVar105._8_4_ * auVar105._8_4_) * fVar236;
    auVar29._12_4_ =
         (auVar19._12_4_ * auVar19._12_4_ +
         auVar338._12_4_ * auVar338._12_4_ + auVar105._12_4_ * auVar105._12_4_) * fVar238;
    auVar29._16_4_ =
         (auVar19._16_4_ * auVar19._16_4_ +
         auVar338._16_4_ * auVar338._16_4_ + auVar105._16_4_ * auVar105._16_4_) * fVar240;
    auVar29._20_4_ =
         (auVar19._20_4_ * auVar19._20_4_ +
         auVar338._20_4_ * auVar338._20_4_ + auVar105._20_4_ * auVar105._20_4_) * fVar242;
    auVar29._24_4_ =
         (auVar19._24_4_ * auVar19._24_4_ +
         auVar338._24_4_ * auVar338._24_4_ + auVar105._24_4_ * auVar105._24_4_) * fVar244;
    auVar29._28_4_ = auVar18._28_4_ + auVar104._28_4_;
    auVar104 = vmaxps_avx(auVar28,auVar29);
    auVar105 = vperm2f128_avx(local_740,local_740,1);
    auVar105 = vshufps_avx(auVar105,local_740,0x30);
    local_780 = vshufps_avx(local_740,auVar105,0x29);
    local_7a0._0_4_ = (float)local_740._0_4_ + fVar211;
    local_7a0._4_4_ = local_740._4_4_ + fVar273;
    local_7a0._8_4_ = local_740._8_4_ + fVar214;
    local_7a0._12_4_ = local_740._12_4_ + fVar215;
    local_7a0._16_4_ = local_740._16_4_ + fVar239;
    local_7a0._20_4_ = local_740._20_4_ + fVar241;
    local_7a0._24_4_ = local_740._24_4_ + fVar269;
    local_7a0._28_4_ = local_740._28_4_ + auVar15._28_4_;
    auVar105 = vmaxps_avx(local_740,local_7a0);
    auVar15 = vmaxps_avx(local_760,local_780);
    auVar105 = vmaxps_avx(auVar105,auVar15);
    auVar15 = vrsqrtps_avx(auVar203);
    fVar211 = auVar15._0_4_;
    fVar273 = auVar15._4_4_;
    fVar214 = auVar15._8_4_;
    fVar215 = auVar15._12_4_;
    fVar239 = auVar15._16_4_;
    fVar241 = auVar15._20_4_;
    fVar269 = auVar15._24_4_;
    local_3e0 = fVar211 * 1.5 + fVar211 * fVar211 * fVar211 * auVar203._0_4_ * -0.5;
    fStack_3dc = fVar273 * 1.5 + fVar273 * fVar273 * fVar273 * auVar203._4_4_ * -0.5;
    fStack_3d8 = fVar214 * 1.5 + fVar214 * fVar214 * fVar214 * auVar203._8_4_ * -0.5;
    fStack_3d4 = fVar215 * 1.5 + fVar215 * fVar215 * fVar215 * auVar203._12_4_ * -0.5;
    fStack_3d0 = fVar239 * 1.5 + fVar239 * fVar239 * fVar239 * auVar203._16_4_ * -0.5;
    fStack_3cc = fVar241 * 1.5 + fVar241 * fVar241 * fVar241 * auVar203._20_4_ * -0.5;
    fStack_3c8 = fVar269 * 1.5 + fVar269 * fVar269 * fVar269 * auVar203._24_4_ * -0.5;
    fStack_3c4 = auVar15._28_4_ + auVar203._28_4_;
    auVar72._4_4_ = fVar117;
    auVar72._0_4_ = fVar89;
    auVar72._8_4_ = fVar120;
    auVar72._12_4_ = fVar123;
    auVar72._16_4_ = fVar125;
    auVar72._20_4_ = fVar127;
    auVar72._24_4_ = fVar129;
    auVar72._28_4_ = fVar131;
    local_9c0 = vsubps_avx(ZEXT832(0) << 0x20,auVar72);
    auVar372 = vsubps_avx(ZEXT832(0) << 0x20,local_540);
    fVar391 = auVar372._0_4_;
    fVar393 = auVar372._4_4_;
    fVar394 = auVar372._8_4_;
    fVar395 = auVar372._12_4_;
    fVar396 = auVar372._16_4_;
    fVar397 = auVar372._20_4_;
    fVar398 = auVar372._24_4_;
    fVar211 = local_9c0._0_4_;
    fVar214 = local_9c0._4_4_;
    fVar239 = local_9c0._8_4_;
    fVar269 = local_9c0._12_4_;
    fVar294 = local_9c0._16_4_;
    fVar236 = local_9c0._20_4_;
    fVar240 = local_9c0._24_4_;
    auVar70._4_4_ = fVar116;
    auVar70._0_4_ = fVar88;
    auVar70._8_4_ = fVar119;
    auVar70._12_4_ = fVar122;
    auVar70._16_4_ = fVar124;
    auVar70._20_4_ = fVar126;
    auVar70._24_4_ = fVar128;
    auVar70._28_4_ = fVar130;
    auVar372 = vsubps_avx(ZEXT832(0) << 0x20,auVar70);
    fVar273 = auVar372._0_4_;
    fVar215 = auVar372._4_4_;
    fVar241 = auVar372._8_4_;
    fVar270 = auVar372._12_4_;
    fVar296 = auVar372._16_4_;
    fVar238 = auVar372._20_4_;
    fVar242 = auVar372._24_4_;
    auVar358._0_4_ =
         (float)local_7c0._0_4_ * fVar273 +
         (float)local_7e0._0_4_ * fVar211 + fVar391 * (float)local_800._0_4_;
    auVar358._4_4_ =
         (float)local_7c0._4_4_ * fVar215 +
         (float)local_7e0._4_4_ * fVar214 + fVar393 * (float)local_800._4_4_;
    auVar358._8_4_ = fStack_7b8 * fVar241 + fStack_7d8 * fVar239 + fVar394 * fStack_7f8;
    auVar358._12_4_ = fStack_7b4 * fVar270 + fStack_7d4 * fVar269 + fVar395 * fStack_7f4;
    auVar358._16_4_ = fStack_7b0 * fVar296 + fStack_7d0 * fVar294 + fVar396 * fStack_7f0;
    auVar358._20_4_ = fStack_7ac * fVar238 + fStack_7cc * fVar236 + fVar397 * fStack_7ec;
    auVar358._24_4_ = fStack_7a8 * fVar242 + fStack_7c8 * fVar240 + fVar398 * fStack_7e8;
    auVar358._28_4_ = fVar190 + auVar338._28_4_ + fVar190 + auVar15._28_4_;
    auVar370._0_4_ = fVar273 * fVar273 + fVar211 * fVar211 + fVar391 * fVar391;
    auVar370._4_4_ = fVar215 * fVar215 + fVar214 * fVar214 + fVar393 * fVar393;
    auVar370._8_4_ = fVar241 * fVar241 + fVar239 * fVar239 + fVar394 * fVar394;
    auVar370._12_4_ = fVar270 * fVar270 + fVar269 * fVar269 + fVar395 * fVar395;
    auVar370._16_4_ = fVar296 * fVar296 + fVar294 * fVar294 + fVar396 * fVar396;
    auVar370._20_4_ = fVar238 * fVar238 + fVar236 * fVar236 + fVar397 * fVar397;
    auVar370._24_4_ = fVar242 * fVar242 + fVar240 * fVar240 + fVar398 * fVar398;
    auVar370._28_4_ = auVar387._28_4_ + auVar387._28_4_ + fVar190;
    fVar322 = (float)local_7c0._0_4_ * fVar265 * local_3e0 +
              fVar263 * local_3e0 * (float)local_7e0._0_4_ +
              fVar209 * local_3e0 * (float)local_800._0_4_;
    fVar326 = (float)local_7c0._4_4_ * fVar291 * fStack_3dc +
              fVar285 * fStack_3dc * (float)local_7e0._4_4_ +
              fVar288 * fStack_3dc * (float)local_800._4_4_;
    fVar327 = fStack_7b8 * fVar234 * fStack_3d8 +
              fVar216 * fStack_3d8 * fStack_7d8 + fVar217 * fStack_3d8 * fStack_7f8;
    fVar328 = fStack_7b4 * fVar264 * fStack_3d4 +
              fVar243 * fStack_3d4 * fStack_7d4 + fVar246 * fStack_3d4 * fStack_7f4;
    fVar329 = fStack_7b0 * fVar286 * fStack_3d0 +
              fVar271 * fStack_3d0 * fStack_7d0 + fVar274 * fStack_3d0 * fStack_7f0;
    fVar330 = fStack_7ac * fVar386 * fStack_3cc +
              fVar298 * fStack_3cc * fStack_7cc + fVar355 * fStack_3cc * fStack_7ec;
    fVar331 = fStack_7a8 * fVar11 * fStack_3c8 +
              fVar9 * fStack_3c8 * fStack_7c8 + fVar10 * fStack_3c8 * fStack_7e8;
    fVar190 = fStack_7a4 + fStack_7c4 + fStack_7e4;
    fVar340 = fVar273 * fVar265 * local_3e0 +
              fVar263 * local_3e0 * fVar211 + fVar391 * fVar209 * local_3e0;
    fVar344 = fVar215 * fVar291 * fStack_3dc +
              fVar285 * fStack_3dc * fVar214 + fVar393 * fVar288 * fStack_3dc;
    fVar345 = fVar241 * fVar234 * fStack_3d8 +
              fVar216 * fStack_3d8 * fVar239 + fVar394 * fVar217 * fStack_3d8;
    fVar346 = fVar270 * fVar264 * fStack_3d4 +
              fVar243 * fStack_3d4 * fVar269 + fVar395 * fVar246 * fStack_3d4;
    fVar347 = fVar296 * fVar286 * fStack_3d0 +
              fVar271 * fStack_3d0 * fVar294 + fVar396 * fVar274 * fStack_3d0;
    fVar348 = fVar238 * fVar386 * fStack_3cc +
              fVar298 * fStack_3cc * fVar236 + fVar397 * fVar355 * fStack_3cc;
    fVar349 = fVar242 * fVar11 * fStack_3c8 +
              fVar9 * fStack_3c8 * fVar240 + fVar398 * fVar10 * fStack_3c8;
    fVar350 = fStack_7c4 + fVar190;
    auVar15._4_4_ = fVar326 * fVar344;
    auVar15._0_4_ = fVar322 * fVar340;
    auVar15._8_4_ = fVar327 * fVar345;
    auVar15._12_4_ = fVar328 * fVar346;
    auVar15._16_4_ = fVar329 * fVar347;
    auVar15._20_4_ = fVar330 * fVar348;
    auVar15._24_4_ = fVar331 * fVar349;
    auVar15._28_4_ = fVar190;
    auVar16 = vsubps_avx(auVar358,auVar15);
    auVar30._4_4_ = fVar344 * fVar344;
    auVar30._0_4_ = fVar340 * fVar340;
    auVar30._8_4_ = fVar345 * fVar345;
    auVar30._12_4_ = fVar346 * fVar346;
    auVar30._16_4_ = fVar347 * fVar347;
    auVar30._20_4_ = fVar348 * fVar348;
    auVar30._24_4_ = fVar349 * fVar349;
    auVar30._28_4_ = fStack_7c4;
    local_620 = vsubps_avx(auVar370,auVar30);
    auVar15 = vsqrtps_avx(auVar104);
    fVar190 = (auVar15._0_4_ + auVar105._0_4_) * 1.0000002;
    fVar244 = (auVar15._4_4_ + auVar105._4_4_) * 1.0000002;
    fVar166 = (auVar15._8_4_ + auVar105._8_4_) * 1.0000002;
    fVar168 = (auVar15._12_4_ + auVar105._12_4_) * 1.0000002;
    fVar169 = (auVar15._16_4_ + auVar105._16_4_) * 1.0000002;
    fVar170 = (auVar15._20_4_ + auVar105._20_4_) * 1.0000002;
    fVar171 = (auVar15._24_4_ + auVar105._24_4_) * 1.0000002;
    auVar31._4_4_ = fVar244 * fVar244;
    auVar31._0_4_ = fVar190 * fVar190;
    auVar31._8_4_ = fVar166 * fVar166;
    auVar31._12_4_ = fVar168 * fVar168;
    auVar31._16_4_ = fVar169 * fVar169;
    auVar31._20_4_ = fVar170 * fVar170;
    auVar31._24_4_ = fVar171 * fVar171;
    auVar31._28_4_ = auVar15._28_4_ + auVar105._28_4_;
    fVar368 = auVar16._0_4_ + auVar16._0_4_;
    fVar375 = auVar16._4_4_ + auVar16._4_4_;
    local_5c0._0_8_ = CONCAT44(fVar375,fVar368);
    local_5c0._8_4_ = auVar16._8_4_ + auVar16._8_4_;
    local_5c0._12_4_ = auVar16._12_4_ + auVar16._12_4_;
    local_5c0._16_4_ = auVar16._16_4_ + auVar16._16_4_;
    local_5c0._20_4_ = auVar16._20_4_ + auVar16._20_4_;
    local_5c0._24_4_ = auVar16._24_4_ + auVar16._24_4_;
    fVar190 = auVar16._28_4_;
    local_5c0._28_4_ = fVar190 + fVar190;
    auVar105 = vsubps_avx(local_620,auVar31);
    local_400._4_4_ = fVar326 * fVar326;
    local_400._0_4_ = fVar322 * fVar322;
    local_400._8_4_ = fVar327 * fVar327;
    local_400._12_4_ = fVar328 * fVar328;
    local_400._16_4_ = fVar329 * fVar329;
    local_400._20_4_ = fVar330 * fVar330;
    local_400._24_4_ = fVar331 * fVar331;
    local_400._28_4_ = local_5a0._28_4_;
    auVar354 = ZEXT3264(local_400);
    local_660 = vsubps_avx(local_3a0,local_400);
    auVar32._4_4_ = fVar375 * fVar375;
    auVar32._0_4_ = fVar368 * fVar368;
    auVar32._8_4_ = local_5c0._8_4_ * local_5c0._8_4_;
    auVar32._12_4_ = local_5c0._12_4_ * local_5c0._12_4_;
    auVar32._16_4_ = local_5c0._16_4_ * local_5c0._16_4_;
    auVar32._20_4_ = local_5c0._20_4_ * local_5c0._20_4_;
    auVar32._24_4_ = local_5c0._24_4_ * local_5c0._24_4_;
    auVar32._28_4_ = fVar190;
    fVar244 = local_660._0_4_;
    fVar166 = local_660._4_4_;
    fVar168 = local_660._8_4_;
    fVar169 = local_660._12_4_;
    fVar170 = local_660._16_4_;
    fVar171 = local_660._20_4_;
    fVar339 = local_660._24_4_;
    auVar33._4_4_ = fVar166 * 4.0 * auVar105._4_4_;
    auVar33._0_4_ = fVar244 * 4.0 * auVar105._0_4_;
    auVar33._8_4_ = fVar168 * 4.0 * auVar105._8_4_;
    auVar33._12_4_ = fVar169 * 4.0 * auVar105._12_4_;
    auVar33._16_4_ = fVar170 * 4.0 * auVar105._16_4_;
    auVar33._20_4_ = fVar171 * 4.0 * auVar105._20_4_;
    auVar33._24_4_ = fVar339 * 4.0 * auVar105._24_4_;
    auVar33._28_4_ = 0x40800000;
    auVar16 = vsubps_avx(auVar32,auVar33);
    auVar104 = vcmpps_avx(auVar16,ZEXT832(0) << 0x20,5);
    fVar190 = local_660._28_4_;
    if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar104 >> 0x7f,0) == '\0') &&
          (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar104 >> 0xbf,0) == '\0') &&
        (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar104[0x1f])
    {
      auVar204._8_4_ = 0x7f800000;
      auVar204._0_8_ = 0x7f8000007f800000;
      auVar204._12_4_ = 0x7f800000;
      auVar204._16_4_ = 0x7f800000;
      auVar204._20_4_ = 0x7f800000;
      auVar204._24_4_ = 0x7f800000;
      auVar204._28_4_ = 0x7f800000;
      auVar388._8_4_ = 0xff800000;
      auVar388._0_8_ = 0xff800000ff800000;
      auVar388._12_4_ = 0xff800000;
      auVar388._16_4_ = 0xff800000;
      auVar388._20_4_ = 0xff800000;
      auVar388._24_4_ = 0xff800000;
      auVar388._28_4_ = 0xff800000;
    }
    else {
      auVar19 = vsqrtps_avx(auVar16);
      auVar279._0_4_ = fVar244 + fVar244;
      auVar279._4_4_ = fVar166 + fVar166;
      auVar279._8_4_ = fVar168 + fVar168;
      auVar279._12_4_ = fVar169 + fVar169;
      auVar279._16_4_ = fVar170 + fVar170;
      auVar279._20_4_ = fVar171 + fVar171;
      auVar279._24_4_ = fVar339 + fVar339;
      auVar279._28_4_ = fVar190 + fVar190;
      auVar18 = vrcpps_avx(auVar279);
      auVar17 = vcmpps_avx(auVar16,ZEXT832(0) << 0x20,5);
      fVar275 = auVar18._0_4_;
      fVar287 = auVar18._4_4_;
      auVar34._4_4_ = auVar279._4_4_ * fVar287;
      auVar34._0_4_ = auVar279._0_4_ * fVar275;
      fVar290 = auVar18._8_4_;
      auVar34._8_4_ = auVar279._8_4_ * fVar290;
      fVar293 = auVar18._12_4_;
      auVar34._12_4_ = auVar279._12_4_ * fVar293;
      fVar295 = auVar18._16_4_;
      auVar34._16_4_ = auVar279._16_4_ * fVar295;
      fVar297 = auVar18._20_4_;
      auVar34._20_4_ = auVar279._20_4_ * fVar297;
      fVar299 = auVar18._24_4_;
      auVar34._24_4_ = auVar279._24_4_ * fVar299;
      auVar34._28_4_ = auVar279._28_4_;
      auVar205._8_4_ = 0x3f800000;
      auVar205._0_8_ = &DAT_3f8000003f800000;
      auVar205._12_4_ = 0x3f800000;
      auVar205._16_4_ = 0x3f800000;
      auVar205._20_4_ = 0x3f800000;
      auVar205._24_4_ = 0x3f800000;
      auVar205._28_4_ = 0x3f800000;
      auVar16 = vsubps_avx(auVar205,auVar34);
      fVar275 = fVar275 + fVar275 * auVar16._0_4_;
      fVar287 = fVar287 + fVar287 * auVar16._4_4_;
      fVar290 = fVar290 + fVar290 * auVar16._8_4_;
      fVar293 = fVar293 + fVar293 * auVar16._12_4_;
      fVar295 = fVar295 + fVar295 * auVar16._16_4_;
      fVar297 = fVar297 + fVar297 * auVar16._20_4_;
      fVar299 = fVar299 + fVar299 * auVar16._24_4_;
      auVar306._0_8_ = CONCAT44(fVar375,fVar368) ^ 0x8000000080000000;
      auVar306._8_4_ = -local_5c0._8_4_;
      auVar306._12_4_ = -local_5c0._12_4_;
      auVar306._16_4_ = -local_5c0._16_4_;
      auVar306._20_4_ = -local_5c0._20_4_;
      auVar306._24_4_ = -local_5c0._24_4_;
      auVar306._28_4_ = -local_5c0._28_4_;
      auVar338 = vsubps_avx(auVar306,auVar19);
      fVar368 = auVar338._0_4_ * fVar275;
      fVar375 = auVar338._4_4_ * fVar287;
      auVar35._4_4_ = fVar375;
      auVar35._0_4_ = fVar368;
      fVar313 = auVar338._8_4_ * fVar290;
      auVar35._8_4_ = fVar313;
      fVar315 = auVar338._12_4_ * fVar293;
      auVar35._12_4_ = fVar315;
      fVar317 = auVar338._16_4_ * fVar295;
      auVar35._16_4_ = fVar317;
      fVar319 = auVar338._20_4_ * fVar297;
      auVar35._20_4_ = fVar319;
      fVar321 = auVar338._24_4_ * fVar299;
      auVar35._24_4_ = fVar321;
      auVar35._28_4_ = auVar338._28_4_;
      auVar19 = vsubps_avx(auVar19,local_5c0);
      fVar275 = auVar19._0_4_ * fVar275;
      fVar287 = auVar19._4_4_ * fVar287;
      auVar36._4_4_ = fVar287;
      auVar36._0_4_ = fVar275;
      fVar290 = auVar19._8_4_ * fVar290;
      auVar36._8_4_ = fVar290;
      fVar293 = auVar19._12_4_ * fVar293;
      auVar36._12_4_ = fVar293;
      fVar295 = auVar19._16_4_ * fVar295;
      auVar36._16_4_ = fVar295;
      fVar297 = auVar19._20_4_ * fVar297;
      auVar36._20_4_ = fVar297;
      fVar299 = auVar19._24_4_ * fVar299;
      auVar36._24_4_ = fVar299;
      auVar36._28_4_ = auVar19._28_4_;
      fStack_4e4 = fVar350 + auVar18._28_4_ + auVar16._28_4_;
      local_500[0] = local_3e0 * (fVar340 + fVar322 * fVar368);
      local_500[1] = fStack_3dc * (fVar344 + fVar326 * fVar375);
      local_500[2] = fStack_3d8 * (fVar345 + fVar327 * fVar313);
      local_500[3] = fStack_3d4 * (fVar346 + fVar328 * fVar315);
      fStack_4f0 = fStack_3d0 * (fVar347 + fVar329 * fVar317);
      fStack_4ec = fStack_3cc * (fVar348 + fVar330 * fVar319);
      fStack_4e8 = fStack_3c8 * (fVar349 + fVar331 * fVar321);
      local_520[0] = local_3e0 * (fVar340 + fVar322 * fVar275);
      local_520[1] = fStack_3dc * (fVar344 + fVar326 * fVar287);
      local_520[2] = fStack_3d8 * (fVar345 + fVar327 * fVar290);
      local_520[3] = fStack_3d4 * (fVar346 + fVar328 * fVar293);
      fStack_510 = fStack_3d0 * (fVar347 + fVar329 * fVar295);
      fStack_50c = fStack_3cc * (fVar348 + fVar330 * fVar297);
      fStack_508 = fStack_3c8 * (fVar349 + fVar331 * fVar299);
      fStack_504 = fVar350 + fStack_4e4;
      auVar280._8_4_ = 0x7f800000;
      auVar280._0_8_ = 0x7f8000007f800000;
      auVar280._12_4_ = 0x7f800000;
      auVar280._16_4_ = 0x7f800000;
      auVar280._20_4_ = 0x7f800000;
      auVar280._24_4_ = 0x7f800000;
      auVar280._28_4_ = 0x7f800000;
      auVar204 = vblendvps_avx(auVar280,auVar35,auVar17);
      auVar307._8_4_ = 0x7fffffff;
      auVar307._0_8_ = 0x7fffffff7fffffff;
      auVar307._12_4_ = 0x7fffffff;
      auVar307._16_4_ = 0x7fffffff;
      auVar307._20_4_ = 0x7fffffff;
      auVar307._24_4_ = 0x7fffffff;
      auVar307._28_4_ = 0x7fffffff;
      auVar16 = vandps_avx(local_400,auVar307);
      auVar16 = vmaxps_avx(local_4c0,auVar16);
      auVar37._4_4_ = auVar16._4_4_ * 1.9073486e-06;
      auVar37._0_4_ = auVar16._0_4_ * 1.9073486e-06;
      auVar37._8_4_ = auVar16._8_4_ * 1.9073486e-06;
      auVar37._12_4_ = auVar16._12_4_ * 1.9073486e-06;
      auVar37._16_4_ = auVar16._16_4_ * 1.9073486e-06;
      auVar37._20_4_ = auVar16._20_4_ * 1.9073486e-06;
      auVar37._24_4_ = auVar16._24_4_ * 1.9073486e-06;
      auVar37._28_4_ = auVar16._28_4_;
      auVar16 = vandps_avx(local_660,auVar307);
      auVar16 = vcmpps_avx(auVar16,auVar37,1);
      auVar281._8_4_ = 0xff800000;
      auVar281._0_8_ = 0xff800000ff800000;
      auVar281._12_4_ = 0xff800000;
      auVar281._16_4_ = 0xff800000;
      auVar281._20_4_ = 0xff800000;
      auVar281._24_4_ = 0xff800000;
      auVar281._28_4_ = 0xff800000;
      auVar388 = vblendvps_avx(auVar281,auVar36,auVar17);
      auVar18 = auVar17 & auVar16;
      if ((((((((auVar18 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar18 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar18 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar18 >> 0x7f,0) != '\0') ||
            (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar18 >> 0xbf,0) != '\0') ||
          (auVar18 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar18[0x1f] < '\0') {
        auVar104 = vandps_avx(auVar16,auVar17);
        auVar134 = vpackssdw_avx(auVar104._0_16_,auVar104._16_16_);
        auVar16 = vcmpps_avx(auVar105,ZEXT832(0) << 0x20,2);
        auVar325._8_4_ = 0xff800000;
        auVar325._0_8_ = 0xff800000ff800000;
        auVar325._12_4_ = 0xff800000;
        auVar325._16_4_ = 0xff800000;
        auVar325._20_4_ = 0xff800000;
        auVar325._24_4_ = 0xff800000;
        auVar325._28_4_ = 0xff800000;
        auVar371._8_4_ = 0x7f800000;
        auVar371._0_8_ = 0x7f8000007f800000;
        auVar371._12_4_ = 0x7f800000;
        auVar371._16_4_ = 0x7f800000;
        auVar371._20_4_ = 0x7f800000;
        auVar371._24_4_ = 0x7f800000;
        auVar371._28_4_ = 0x7f800000;
        auVar105 = vblendvps_avx(auVar371,auVar325,auVar16);
        auVar197 = vpmovsxwd_avx(auVar134);
        auVar134 = vpunpckhwd_avx(auVar134,auVar134);
        auVar262._16_16_ = auVar134;
        auVar262._0_16_ = auVar197;
        auVar204 = vblendvps_avx(auVar204,auVar105,auVar262);
        auVar105 = vblendvps_avx(auVar325,auVar371,auVar16);
        auVar388 = vblendvps_avx(auVar388,auVar105,auVar262);
        auVar105 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar188._0_4_ = auVar104._0_4_ ^ auVar105._0_4_;
        auVar188._4_4_ = auVar104._4_4_ ^ auVar105._4_4_;
        auVar188._8_4_ = auVar104._8_4_ ^ auVar105._8_4_;
        auVar188._12_4_ = auVar104._12_4_ ^ auVar105._12_4_;
        auVar188._16_4_ = auVar104._16_4_ ^ auVar105._16_4_;
        auVar188._20_4_ = auVar104._20_4_ ^ auVar105._20_4_;
        auVar188._24_4_ = auVar104._24_4_ ^ auVar105._24_4_;
        auVar188._28_4_ = auVar104._28_4_ ^ auVar105._28_4_;
        auVar104 = vorps_avx(auVar16,auVar188);
        auVar104 = vandps_avx(auVar17,auVar104);
      }
    }
    auVar105 = local_4a0 & auVar104;
    auVar284 = ZEXT3264(_local_9a0);
    if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar105 >> 0x7f,0) == '\0') &&
          (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar105 >> 0xbf,0) == '\0') &&
        (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar105[0x1f])
    {
      auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                    CONCAT424(0x3f800000,
                                              CONCAT420(0x3f800000,
                                                        CONCAT416(0x3f800000,
                                                                  CONCAT412(0x3f800000,
                                                                            CONCAT48(0x3f800000,
                                                                                     &
                                                  DAT_3f8000003f800000)))))));
    }
    else {
      auVar134 = vshufps_avx(ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_8c0._0_4_)
                                    ),ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) -
                                                    (float)local_8c0._0_4_)),0);
      auVar149._16_16_ = auVar134;
      auVar149._0_16_ = auVar134;
      local_640 = vminps_avx(auVar149,auVar388);
      auVar107._0_4_ =
           (float)local_7c0._0_4_ * fVar300 +
           (float)local_7e0._0_4_ * fVar356 + fVar366 * (float)local_800._0_4_;
      auVar107._4_4_ =
           (float)local_7c0._4_4_ * fVar311 +
           (float)local_7e0._4_4_ * fVar359 + fVar373 * (float)local_800._4_4_;
      auVar107._8_4_ = fStack_7b8 * fVar312 + fStack_7d8 * fVar360 + fVar376 * fStack_7f8;
      auVar107._12_4_ = fStack_7b4 * fVar314 + fStack_7d4 * fVar361 + fVar378 * fStack_7f4;
      auVar107._16_4_ = fStack_7b0 * fVar316 + fStack_7d0 * fVar362 + fVar380 * fStack_7f0;
      auVar107._20_4_ = fStack_7ac * fVar318 + fStack_7cc * fVar363 + fVar382 * fStack_7ec;
      auVar107._24_4_ = fStack_7a8 * fVar320 + fStack_7c8 * fVar364 + fVar384 * fStack_7e8;
      auVar107._28_4_ = auVar305._28_4_ + auVar372._28_4_ + 1.0;
      auVar105 = vrcpps_avx(auVar107);
      fVar368 = auVar105._0_4_;
      fVar375 = auVar105._4_4_;
      auVar38._4_4_ = auVar107._4_4_ * fVar375;
      auVar38._0_4_ = auVar107._0_4_ * fVar368;
      fVar275 = auVar105._8_4_;
      auVar38._8_4_ = auVar107._8_4_ * fVar275;
      fVar287 = auVar105._12_4_;
      auVar38._12_4_ = auVar107._12_4_ * fVar287;
      fVar290 = auVar105._16_4_;
      auVar38._16_4_ = auVar107._16_4_ * fVar290;
      fVar293 = auVar105._20_4_;
      auVar38._20_4_ = auVar107._20_4_ * fVar293;
      fVar295 = auVar105._24_4_;
      auVar38._24_4_ = auVar107._24_4_ * fVar295;
      auVar38._28_4_ = 0x3f800000;
      auVar232._8_4_ = 0x3f800000;
      auVar232._0_8_ = &DAT_3f8000003f800000;
      auVar232._12_4_ = 0x3f800000;
      auVar232._16_4_ = 0x3f800000;
      auVar232._20_4_ = 0x3f800000;
      auVar232._24_4_ = 0x3f800000;
      auVar232._28_4_ = 0x3f800000;
      auVar17 = vsubps_avx(auVar232,auVar38);
      auVar337._8_4_ = 0x7fffffff;
      auVar337._0_8_ = 0x7fffffff7fffffff;
      auVar337._12_4_ = 0x7fffffff;
      auVar337._16_4_ = 0x7fffffff;
      auVar337._20_4_ = 0x7fffffff;
      auVar337._24_4_ = 0x7fffffff;
      auVar337._28_4_ = 0x7fffffff;
      auVar105 = vandps_avx(auVar337,auVar107);
      auVar389._8_4_ = 0x219392ef;
      auVar389._0_8_ = 0x219392ef219392ef;
      auVar389._12_4_ = 0x219392ef;
      auVar389._16_4_ = 0x219392ef;
      auVar389._20_4_ = 0x219392ef;
      auVar389._24_4_ = 0x219392ef;
      auVar389._28_4_ = 0x219392ef;
      auVar16 = vcmpps_avx(auVar105,auVar389,1);
      auVar39._4_4_ =
           (fVar375 + fVar375 * auVar17._4_4_) *
           -(fVar215 * fVar311 + fVar359 * fVar214 + fVar393 * fVar373);
      auVar39._0_4_ =
           (fVar368 + fVar368 * auVar17._0_4_) *
           -(fVar273 * fVar300 + fVar356 * fVar211 + fVar391 * fVar366);
      auVar39._8_4_ =
           (fVar275 + fVar275 * auVar17._8_4_) *
           -(fVar241 * fVar312 + fVar360 * fVar239 + fVar394 * fVar376);
      auVar39._12_4_ =
           (fVar287 + fVar287 * auVar17._12_4_) *
           -(fVar270 * fVar314 + fVar361 * fVar269 + fVar395 * fVar378);
      auVar39._16_4_ =
           (fVar290 + fVar290 * auVar17._16_4_) *
           -(fVar296 * fVar316 + fVar362 * fVar294 + fVar396 * fVar380);
      auVar39._20_4_ =
           (fVar293 + fVar293 * auVar17._20_4_) *
           -(fVar238 * fVar318 + fVar363 * fVar236 + fVar397 * fVar382);
      auVar39._24_4_ =
           (fVar295 + fVar295 * auVar17._24_4_) *
           -(fVar242 * fVar320 + fVar364 * fVar240 + fVar398 * fVar384);
      auVar39._28_4_ = -(auVar372._28_4_ + auVar204._28_4_ + 1.0);
      auVar62 = ZEXT812(0);
      auVar335 = ZEXT1228(auVar62) << 0x20;
      auVar105 = vcmpps_avx(auVar107,ZEXT1232(auVar62) << 0x20,1);
      auVar105 = vorps_avx(auVar16,auVar105);
      auVar343._8_4_ = 0xff800000;
      auVar343._0_8_ = 0xff800000ff800000;
      auVar343._12_4_ = 0xff800000;
      auVar343._16_4_ = 0xff800000;
      auVar343._20_4_ = 0xff800000;
      auVar343._24_4_ = 0xff800000;
      auVar343._28_4_ = 0xff800000;
      auVar105 = vblendvps_avx(auVar39,auVar343,auVar105);
      auVar372 = vcmpps_avx(auVar107,ZEXT1232(auVar62) << 0x20,6);
      auVar372 = vorps_avx(auVar16,auVar372);
      auVar353._8_4_ = 0x7f800000;
      auVar353._0_8_ = 0x7f8000007f800000;
      auVar353._12_4_ = 0x7f800000;
      auVar353._16_4_ = 0x7f800000;
      auVar353._20_4_ = 0x7f800000;
      auVar353._24_4_ = 0x7f800000;
      auVar353._28_4_ = 0x7f800000;
      auVar354 = ZEXT3264(auVar353);
      auVar372 = vblendvps_avx(auVar39,auVar353,auVar372);
      auVar16 = vmaxps_avx(local_3c0,auVar204);
      auVar16 = vmaxps_avx(auVar16,auVar105);
      auVar372 = vminps_avx(local_640,auVar372);
      auVar338 = ZEXT1232(auVar62) << 0x20;
      auVar105 = vsubps_avx(auVar338,auVar148);
      auVar148 = vsubps_avx(auVar338,local_a20);
      auVar40._4_4_ = auVar148._4_4_ * -fVar374;
      auVar40._0_4_ = auVar148._0_4_ * -fVar367;
      auVar40._8_4_ = auVar148._8_4_ * -fVar377;
      auVar40._12_4_ = auVar148._12_4_ * -fVar379;
      auVar40._16_4_ = auVar148._16_4_ * -fVar381;
      auVar40._20_4_ = auVar148._20_4_ * -fVar383;
      auVar40._24_4_ = auVar148._24_4_ * -fVar385;
      auVar40._28_4_ = auVar148._28_4_;
      auVar41._4_4_ = fVar212 * auVar105._4_4_;
      auVar41._0_4_ = fVar210 * auVar105._0_4_;
      auVar41._8_4_ = fVar235 * auVar105._8_4_;
      auVar41._12_4_ = fVar266 * auVar105._12_4_;
      auVar41._16_4_ = fVar289 * auVar105._16_4_;
      auVar41._20_4_ = fVar272 * auVar105._20_4_;
      auVar41._24_4_ = fVar12 * auVar105._24_4_;
      auVar41._28_4_ = auVar105._28_4_;
      auVar105 = vsubps_avx(auVar40,auVar41);
      auVar148 = vsubps_avx(auVar338,auVar14);
      auVar42._4_4_ = fVar213 * auVar148._4_4_;
      auVar42._0_4_ = fVar267 * auVar148._0_4_;
      auVar42._8_4_ = fVar237 * auVar148._8_4_;
      auVar42._12_4_ = fVar268 * auVar148._12_4_;
      auVar42._16_4_ = fVar292 * auVar148._16_4_;
      auVar42._20_4_ = fVar365 * auVar148._20_4_;
      uVar1 = auVar148._28_4_;
      auVar42._24_4_ = fVar13 * auVar148._24_4_;
      auVar42._28_4_ = uVar1;
      auVar17 = vsubps_avx(auVar105,auVar42);
      auVar43._4_4_ = (float)local_800._4_4_ * -fVar374;
      auVar43._0_4_ = (float)local_800._0_4_ * -fVar367;
      auVar43._8_4_ = fStack_7f8 * -fVar377;
      auVar43._12_4_ = fStack_7f4 * -fVar379;
      auVar43._16_4_ = fStack_7f0 * -fVar381;
      auVar43._20_4_ = fStack_7ec * -fVar383;
      auVar43._24_4_ = fStack_7e8 * -fVar385;
      auVar43._28_4_ = uVar4 ^ 0x80000000;
      auVar44._4_4_ = (float)local_7e0._4_4_ * fVar212;
      auVar44._0_4_ = (float)local_7e0._0_4_ * fVar210;
      auVar44._8_4_ = fStack_7d8 * fVar235;
      auVar44._12_4_ = fStack_7d4 * fVar266;
      auVar44._16_4_ = fStack_7d0 * fVar289;
      auVar44._20_4_ = fStack_7cc * fVar272;
      auVar44._24_4_ = fStack_7c8 * fVar12;
      auVar44._28_4_ = uVar1;
      auVar105 = vsubps_avx(auVar43,auVar44);
      auVar45._4_4_ = fVar213 * (float)local_7c0._4_4_;
      auVar45._0_4_ = fVar267 * (float)local_7c0._0_4_;
      auVar45._8_4_ = fVar237 * fStack_7b8;
      auVar45._12_4_ = fVar268 * fStack_7b4;
      auVar45._16_4_ = fVar292 * fStack_7b0;
      auVar45._20_4_ = fVar365 * fStack_7ac;
      auVar45._24_4_ = fVar13 * fStack_7a8;
      auVar45._28_4_ = uVar1;
      auVar18 = vsubps_avx(auVar105,auVar45);
      auVar105 = vrcpps_avx(auVar18);
      fVar210 = auVar105._0_4_;
      fVar267 = auVar105._4_4_;
      auVar46._4_4_ = auVar18._4_4_ * fVar267;
      auVar46._0_4_ = auVar18._0_4_ * fVar210;
      fVar211 = auVar105._8_4_;
      auVar46._8_4_ = auVar18._8_4_ * fVar211;
      fVar273 = auVar105._12_4_;
      auVar46._12_4_ = auVar18._12_4_ * fVar273;
      fVar212 = auVar105._16_4_;
      auVar46._16_4_ = auVar18._16_4_ * fVar212;
      fVar213 = auVar105._20_4_;
      auVar46._20_4_ = auVar18._20_4_ * fVar213;
      fVar214 = auVar105._24_4_;
      auVar46._24_4_ = auVar18._24_4_ * fVar214;
      auVar46._28_4_ = fStack_7a4;
      auVar19 = vsubps_avx(auVar232,auVar46);
      auVar108._8_4_ = 0x7fffffff;
      auVar108._0_8_ = 0x7fffffff7fffffff;
      auVar108._12_4_ = 0x7fffffff;
      auVar108._16_4_ = 0x7fffffff;
      auVar108._20_4_ = 0x7fffffff;
      auVar108._24_4_ = 0x7fffffff;
      auVar108._28_4_ = 0x7fffffff;
      auVar105 = vandps_avx(auVar18,auVar108);
      auVar148 = vcmpps_avx(auVar105,auVar389,1);
      auVar47._4_4_ = (fVar267 + fVar267 * auVar19._4_4_) * -auVar17._4_4_;
      auVar47._0_4_ = (fVar210 + fVar210 * auVar19._0_4_) * -auVar17._0_4_;
      auVar47._8_4_ = (fVar211 + fVar211 * auVar19._8_4_) * -auVar17._8_4_;
      auVar47._12_4_ = (fVar273 + fVar273 * auVar19._12_4_) * -auVar17._12_4_;
      auVar47._16_4_ = (fVar212 + fVar212 * auVar19._16_4_) * -auVar17._16_4_;
      auVar47._20_4_ = (fVar213 + fVar213 * auVar19._20_4_) * -auVar17._20_4_;
      auVar47._24_4_ = (fVar214 + fVar214 * auVar19._24_4_) * -auVar17._24_4_;
      auVar47._28_4_ = auVar17._28_4_ ^ 0x80000000;
      auVar105 = vcmpps_avx(auVar18,auVar338,1);
      auVar105 = vorps_avx(auVar148,auVar105);
      auVar109._8_4_ = 0xff800000;
      auVar109._0_8_ = 0xff800000ff800000;
      auVar109._12_4_ = 0xff800000;
      auVar109._16_4_ = 0xff800000;
      auVar109._20_4_ = 0xff800000;
      auVar109._24_4_ = 0xff800000;
      auVar109._28_4_ = 0xff800000;
      auVar105 = vblendvps_avx(auVar47,auVar109,auVar105);
      local_640 = vmaxps_avx(auVar16,auVar105);
      auVar105 = vcmpps_avx(auVar18,ZEXT1232(auVar62) << 0x20,6);
      auVar105 = vorps_avx(auVar148,auVar105);
      auVar105 = vblendvps_avx(auVar47,auVar353,auVar105);
      auVar104 = vandps_avx(auVar104,local_4a0);
      local_420 = vminps_avx(auVar372,auVar105);
      auVar105 = vcmpps_avx(local_640,local_420,2);
      auVar148 = auVar104 & auVar105;
      if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar148 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar148 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar148 >> 0x7f,0) == '\0') &&
            (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar148 >> 0xbf,0) == '\0') &&
          (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar148[0x1f]) {
        auVar284 = ZEXT3264(_local_9a0);
LAB_00f79aa5:
        auVar233 = ZEXT3264(auVar232);
      }
      else {
        auVar148 = vminps_avx(local_740,local_7a0);
        auVar372 = vminps_avx(local_760,local_780);
        auVar148 = vminps_avx(auVar148,auVar372);
        auVar15 = vsubps_avx(auVar148,auVar15);
        auVar104 = vandps_avx(auVar105,auVar104);
        auVar78._4_4_ = local_500[1];
        auVar78._0_4_ = local_500[0];
        auVar78._8_4_ = local_500[2];
        auVar78._12_4_ = local_500[3];
        auVar78._16_4_ = fStack_4f0;
        auVar78._20_4_ = fStack_4ec;
        auVar78._24_4_ = fStack_4e8;
        auVar78._28_4_ = fStack_4e4;
        auVar105 = vminps_avx(auVar78,auVar232);
        auVar105 = vmaxps_avx(auVar105,ZEXT832(0) << 0x20);
        local_500[0] = fVar87 + fVar132 * (auVar105._0_4_ + 0.0) * 0.125;
        local_500[1] = fVar115 + fVar164 * (auVar105._4_4_ + 1.0) * 0.125;
        local_500[2] = fVar118 + fVar165 * (auVar105._8_4_ + 2.0) * 0.125;
        local_500[3] = fVar121 + fVar167 * (auVar105._12_4_ + 3.0) * 0.125;
        fStack_4f0 = fVar87 + fVar132 * (auVar105._16_4_ + 4.0) * 0.125;
        fStack_4ec = fVar115 + fVar164 * (auVar105._20_4_ + 5.0) * 0.125;
        fStack_4e8 = fVar118 + fVar165 * (auVar105._24_4_ + 6.0) * 0.125;
        fStack_4e4 = fVar121 + auVar105._28_4_ + 7.0;
        auVar77._4_4_ = local_520[1];
        auVar77._0_4_ = local_520[0];
        auVar77._8_4_ = local_520[2];
        auVar77._12_4_ = local_520[3];
        auVar77._16_4_ = fStack_510;
        auVar77._20_4_ = fStack_50c;
        auVar77._24_4_ = fStack_508;
        auVar77._28_4_ = fStack_504;
        auVar105 = vminps_avx(auVar77,auVar232);
        auVar105 = vmaxps_avx(auVar105,ZEXT832(0) << 0x20);
        local_520[0] = fVar87 + fVar132 * (auVar105._0_4_ + 0.0) * 0.125;
        local_520[1] = fVar115 + fVar164 * (auVar105._4_4_ + 1.0) * 0.125;
        local_520[2] = fVar118 + fVar165 * (auVar105._8_4_ + 2.0) * 0.125;
        local_520[3] = fVar121 + fVar167 * (auVar105._12_4_ + 3.0) * 0.125;
        fStack_510 = fVar87 + fVar132 * (auVar105._16_4_ + 4.0) * 0.125;
        fStack_50c = fVar115 + fVar164 * (auVar105._20_4_ + 5.0) * 0.125;
        fStack_508 = fVar118 + fVar165 * (auVar105._24_4_ + 6.0) * 0.125;
        fStack_504 = fVar121 + auVar105._28_4_ + 7.0;
        auVar48._4_4_ = auVar15._4_4_ * 0.99999976;
        auVar48._0_4_ = auVar15._0_4_ * 0.99999976;
        auVar48._8_4_ = auVar15._8_4_ * 0.99999976;
        auVar48._12_4_ = auVar15._12_4_ * 0.99999976;
        auVar48._16_4_ = auVar15._16_4_ * 0.99999976;
        auVar48._20_4_ = auVar15._20_4_ * 0.99999976;
        auVar48._24_4_ = auVar15._24_4_ * 0.99999976;
        auVar48._28_4_ = 0x3f7ffffc;
        auVar105 = vmaxps_avx(ZEXT1232(auVar62) << 0x20,auVar48);
        auVar49._4_4_ = auVar105._4_4_ * auVar105._4_4_;
        auVar49._0_4_ = auVar105._0_4_ * auVar105._0_4_;
        auVar49._8_4_ = auVar105._8_4_ * auVar105._8_4_;
        auVar49._12_4_ = auVar105._12_4_ * auVar105._12_4_;
        auVar49._16_4_ = auVar105._16_4_ * auVar105._16_4_;
        auVar49._20_4_ = auVar105._20_4_ * auVar105._20_4_;
        auVar49._24_4_ = auVar105._24_4_ * auVar105._24_4_;
        auVar49._28_4_ = auVar105._28_4_;
        local_ac0 = vsubps_avx(local_620,auVar49);
        auVar50._4_4_ = local_ac0._4_4_ * fVar166 * 4.0;
        auVar50._0_4_ = local_ac0._0_4_ * fVar244 * 4.0;
        auVar50._8_4_ = local_ac0._8_4_ * fVar168 * 4.0;
        auVar50._12_4_ = local_ac0._12_4_ * fVar169 * 4.0;
        auVar50._16_4_ = local_ac0._16_4_ * fVar170 * 4.0;
        auVar50._20_4_ = local_ac0._20_4_ * fVar171 * 4.0;
        auVar50._24_4_ = local_ac0._24_4_ * fVar339 * 4.0;
        auVar50._28_4_ = auVar105._28_4_;
        auVar15 = vsubps_avx(auVar32,auVar50);
        local_8e0 = vcmpps_avx(auVar15,ZEXT832(0) << 0x20,5);
        auVar105 = local_8e0;
        if ((((((((local_8e0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_8e0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_8e0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_8e0 >> 0x7f,0) == '\0') &&
              (local_8e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_8e0 >> 0xbf,0) == '\0') &&
            (local_8e0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_8e0[0x1f]) {
          _local_8a0 = ZEXT1232(ZEXT412(0)) << 0x20;
          _local_840 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar201 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar228 = ZEXT1628(ZEXT816(0) << 0x40);
          auVar150._8_4_ = 0x7f800000;
          auVar150._0_8_ = 0x7f8000007f800000;
          auVar150._12_4_ = 0x7f800000;
          auVar150._16_4_ = 0x7f800000;
          auVar150._20_4_ = 0x7f800000;
          auVar150._24_4_ = 0x7f800000;
          auVar150._28_4_ = 0x7f800000;
          auVar256._8_4_ = 0xff800000;
          auVar256._0_8_ = 0xff800000ff800000;
          auVar256._12_4_ = 0xff800000;
          auVar256._16_4_ = 0xff800000;
          auVar256._20_4_ = 0xff800000;
          auVar256._24_4_ = 0xff800000;
          auVar256._28_4_ = 0xff800000;
          local_ac0 = auVar14;
          local_8e0 = auVar20;
          _local_880 = _local_8a0;
        }
        else {
          auVar14 = vsqrtps_avx(auVar15);
          auVar151._0_4_ = fVar244 + fVar244;
          auVar151._4_4_ = fVar166 + fVar166;
          auVar151._8_4_ = fVar168 + fVar168;
          auVar151._12_4_ = fVar169 + fVar169;
          auVar151._16_4_ = fVar170 + fVar170;
          auVar151._20_4_ = fVar171 + fVar171;
          auVar151._24_4_ = fVar339 + fVar339;
          auVar151._28_4_ = fVar190 + fVar190;
          auVar148 = vrcpps_avx(auVar151);
          fVar190 = auVar148._0_4_;
          fVar210 = auVar148._4_4_;
          auVar51._4_4_ = auVar151._4_4_ * fVar210;
          auVar51._0_4_ = auVar151._0_4_ * fVar190;
          fVar267 = auVar148._8_4_;
          auVar51._8_4_ = auVar151._8_4_ * fVar267;
          fVar211 = auVar148._12_4_;
          auVar51._12_4_ = auVar151._12_4_ * fVar211;
          fVar273 = auVar148._16_4_;
          auVar51._16_4_ = auVar151._16_4_ * fVar273;
          fVar212 = auVar148._20_4_;
          auVar51._20_4_ = auVar151._20_4_ * fVar212;
          fVar213 = auVar148._24_4_;
          auVar51._24_4_ = auVar151._24_4_ * fVar213;
          auVar51._28_4_ = auVar151._28_4_;
          auVar372 = vsubps_avx(auVar232,auVar51);
          fVar190 = fVar190 + fVar190 * auVar372._0_4_;
          fVar210 = fVar210 + fVar210 * auVar372._4_4_;
          fVar267 = fVar267 + fVar267 * auVar372._8_4_;
          fVar211 = fVar211 + fVar211 * auVar372._12_4_;
          fVar273 = fVar273 + fVar273 * auVar372._16_4_;
          fVar212 = fVar212 + fVar212 * auVar372._20_4_;
          fVar213 = fVar213 + fVar213 * auVar372._24_4_;
          fVar268 = auVar148._28_4_ + auVar372._28_4_;
          auVar152._0_8_ = local_5c0._0_8_ ^ 0x8000000080000000;
          auVar152._8_4_ = -local_5c0._8_4_;
          auVar152._12_4_ = -local_5c0._12_4_;
          auVar152._16_4_ = -local_5c0._16_4_;
          auVar152._20_4_ = -local_5c0._20_4_;
          auVar152._24_4_ = -local_5c0._24_4_;
          auVar152._28_4_ = -local_5c0._28_4_;
          auVar148 = vsubps_avx(auVar152,auVar14);
          fVar214 = auVar148._0_4_ * fVar190;
          fVar215 = auVar148._4_4_ * fVar210;
          auVar52._4_4_ = fVar215;
          auVar52._0_4_ = fVar214;
          fVar235 = auVar148._8_4_ * fVar267;
          auVar52._8_4_ = fVar235;
          fVar237 = auVar148._12_4_ * fVar211;
          auVar52._12_4_ = fVar237;
          fVar239 = auVar148._16_4_ * fVar273;
          auVar52._16_4_ = fVar239;
          fVar241 = auVar148._20_4_ * fVar212;
          auVar52._20_4_ = fVar241;
          fVar266 = auVar148._24_4_ * fVar213;
          auVar52._24_4_ = fVar266;
          auVar52._28_4_ = auVar148._28_4_;
          auVar148 = vsubps_avx(auVar14,local_5c0);
          fVar190 = auVar148._0_4_ * fVar190;
          fVar210 = auVar148._4_4_ * fVar210;
          auVar53._4_4_ = fVar210;
          auVar53._0_4_ = fVar190;
          fVar267 = auVar148._8_4_ * fVar267;
          auVar53._8_4_ = fVar267;
          fVar211 = auVar148._12_4_ * fVar211;
          auVar53._12_4_ = fVar211;
          fVar273 = auVar148._16_4_ * fVar273;
          auVar53._16_4_ = fVar273;
          fVar212 = auVar148._20_4_ * fVar212;
          auVar53._20_4_ = fVar212;
          fVar213 = auVar148._24_4_ * fVar213;
          auVar53._24_4_ = fVar213;
          auVar53._28_4_ = auVar104._28_4_;
          auVar8._4_4_ = fStack_3dc;
          auVar8._0_4_ = local_3e0;
          auVar8._8_4_ = fStack_3d8;
          auVar8._12_4_ = fStack_3d4;
          auVar8._16_4_ = fStack_3d0;
          auVar8._20_4_ = fStack_3cc;
          auVar8._24_4_ = fStack_3c8;
          auVar8._28_4_ = fStack_3c4;
          fVar269 = local_3e0 * (fVar214 * fVar322 + fVar340);
          fVar270 = fStack_3dc * (fVar215 * fVar326 + fVar344);
          fVar289 = fStack_3d8 * (fVar235 * fVar327 + fVar345);
          fVar292 = fStack_3d4 * (fVar237 * fVar328 + fVar346);
          fVar294 = fStack_3d0 * (fVar239 * fVar329 + fVar347);
          fVar296 = fStack_3cc * (fVar241 * fVar330 + fVar348);
          fVar272 = fStack_3c8 * (fVar266 * fVar331 + fVar349);
          auVar206._0_4_ = fVar88 + fVar265 * fVar269;
          auVar206._4_4_ = fVar116 + fVar291 * fVar270;
          auVar206._8_4_ = fVar119 + fVar234 * fVar289;
          auVar206._12_4_ = fVar122 + fVar264 * fVar292;
          auVar206._16_4_ = fVar124 + fVar286 * fVar294;
          auVar206._20_4_ = fVar126 + fVar386 * fVar296;
          auVar206._24_4_ = fVar128 + fVar11 * fVar272;
          auVar206._28_4_ = fVar130 + auVar148._28_4_ + fVar350;
          auVar54._4_4_ = (float)local_7c0._4_4_ * fVar215;
          auVar54._0_4_ = (float)local_7c0._0_4_ * fVar214;
          auVar54._8_4_ = fStack_7b8 * fVar235;
          auVar54._12_4_ = fStack_7b4 * fVar237;
          auVar54._16_4_ = fStack_7b0 * fVar239;
          auVar54._20_4_ = fStack_7ac * fVar241;
          auVar54._24_4_ = fStack_7a8 * fVar266;
          auVar54._28_4_ = fVar268;
          local_a20 = vsubps_avx(auVar54,auVar206);
          auVar230._0_4_ = fVar89 + fVar263 * fVar269;
          auVar230._4_4_ = fVar117 + fVar285 * fVar270;
          auVar230._8_4_ = fVar120 + fVar216 * fVar289;
          auVar230._12_4_ = fVar123 + fVar243 * fVar292;
          auVar230._16_4_ = fVar125 + fVar271 * fVar294;
          auVar230._20_4_ = fVar127 + fVar298 * fVar296;
          auVar230._24_4_ = fVar129 + fVar9 * fVar272;
          auVar230._28_4_ = fVar131 + fVar268;
          auVar55._4_4_ = (float)local_7e0._4_4_ * fVar215;
          auVar55._0_4_ = (float)local_7e0._0_4_ * fVar214;
          auVar55._8_4_ = fStack_7d8 * fVar235;
          auVar55._12_4_ = fStack_7d4 * fVar237;
          auVar55._16_4_ = fStack_7d0 * fVar239;
          auVar55._20_4_ = fStack_7cc * fVar241;
          auVar55._24_4_ = fStack_7c8 * fVar266;
          auVar55._28_4_ = fStack_984;
          _local_ae0 = vsubps_avx(auVar55,auVar230);
          auVar257._0_4_ = local_540._0_4_ + fVar209 * fVar269;
          auVar257._4_4_ = local_540._4_4_ + fVar288 * fVar270;
          auVar257._8_4_ = local_540._8_4_ + fVar217 * fVar289;
          auVar257._12_4_ = local_540._12_4_ + fVar246 * fVar292;
          auVar257._16_4_ = local_540._16_4_ + fVar274 * fVar294;
          auVar257._20_4_ = local_540._20_4_ + fVar355 * fVar296;
          auVar257._24_4_ = local_540._24_4_ + fVar10 * fVar272;
          auVar257._28_4_ = local_540._28_4_ + 0.0;
          auVar56._4_4_ = (float)local_800._4_4_ * fVar215;
          auVar56._0_4_ = (float)local_800._0_4_ * fVar214;
          auVar56._8_4_ = fStack_7f8 * fVar235;
          auVar56._12_4_ = fStack_7f4 * fVar237;
          auVar56._16_4_ = fStack_7f0 * fVar239;
          auVar56._20_4_ = fStack_7ec * fVar241;
          auVar56._24_4_ = fStack_7e8 * fVar266;
          auVar56._28_4_ = fStack_984;
          local_b00 = vsubps_avx(auVar56,auVar257);
          fVar214 = local_3e0 * (fVar190 * fVar322 + fVar340);
          fVar215 = fStack_3dc * (fVar210 * fVar326 + fVar344);
          fVar235 = fStack_3d8 * (fVar267 * fVar327 + fVar345);
          fVar237 = fStack_3d4 * (fVar211 * fVar328 + fVar346);
          fVar239 = fStack_3d0 * (fVar273 * fVar329 + fVar347);
          fVar241 = fStack_3cc * (fVar212 * fVar330 + fVar348);
          fVar266 = fStack_3c8 * (fVar213 * fVar331 + fVar349);
          auVar282._0_4_ = fVar88 + fVar265 * fVar214;
          auVar282._4_4_ = fVar116 + fVar291 * fVar215;
          auVar282._8_4_ = fVar119 + fVar234 * fVar235;
          auVar282._12_4_ = fVar122 + fVar264 * fVar237;
          auVar282._16_4_ = fVar124 + fVar286 * fVar239;
          auVar282._20_4_ = fVar126 + fVar386 * fVar241;
          auVar282._24_4_ = fVar128 + fVar11 * fVar266;
          auVar282._28_4_ = fVar130 + fStack_984;
          auVar57._4_4_ = fVar210 * (float)local_7c0._4_4_;
          auVar57._0_4_ = fVar190 * (float)local_7c0._0_4_;
          auVar57._8_4_ = fVar267 * fStack_7b8;
          auVar57._12_4_ = fVar211 * fStack_7b4;
          auVar57._16_4_ = fVar273 * fStack_7b0;
          auVar57._20_4_ = fVar212 * fStack_7ac;
          auVar57._24_4_ = fVar213 * fStack_7a8;
          auVar57._28_4_ = fStack_7a4;
          _local_880 = vsubps_avx(auVar57,auVar282);
          auVar283._0_4_ = fVar89 + fVar263 * fVar214;
          auVar283._4_4_ = fVar117 + fVar285 * fVar215;
          auVar283._8_4_ = fVar120 + fVar216 * fVar235;
          auVar283._12_4_ = fVar123 + fVar243 * fVar237;
          auVar283._16_4_ = fVar125 + fVar271 * fVar239;
          auVar283._20_4_ = fVar127 + fVar298 * fVar241;
          auVar283._24_4_ = fVar129 + fVar9 * fVar266;
          auVar283._28_4_ = fVar131 + local_880._28_4_;
          auVar58._4_4_ = (float)local_7e0._4_4_ * fVar210;
          auVar58._0_4_ = (float)local_7e0._0_4_ * fVar190;
          auVar58._8_4_ = fStack_7d8 * fVar267;
          auVar58._12_4_ = fStack_7d4 * fVar211;
          auVar58._16_4_ = fStack_7d0 * fVar273;
          auVar58._20_4_ = fStack_7cc * fVar212;
          auVar58._24_4_ = fStack_7c8 * fVar213;
          auVar58._28_4_ = fStack_7a4;
          _local_8a0 = vsubps_avx(auVar58,auVar283);
          auVar258._0_4_ = local_540._0_4_ + fVar209 * fVar214;
          auVar258._4_4_ = local_540._4_4_ + fVar288 * fVar215;
          auVar258._8_4_ = local_540._8_4_ + fVar217 * fVar235;
          auVar258._12_4_ = local_540._12_4_ + fVar246 * fVar237;
          auVar258._16_4_ = local_540._16_4_ + fVar274 * fVar239;
          auVar258._20_4_ = local_540._20_4_ + fVar355 * fVar241;
          auVar258._24_4_ = local_540._24_4_ + fVar10 * fVar266;
          auVar258._28_4_ = local_540._28_4_ + local_b00._28_4_ + fVar350;
          auVar59._4_4_ = (float)local_800._4_4_ * fVar210;
          auVar59._0_4_ = (float)local_800._0_4_ * fVar190;
          auVar59._8_4_ = fStack_7f8 * fVar267;
          auVar59._12_4_ = fStack_7f4 * fVar211;
          auVar59._16_4_ = fStack_7f0 * fVar273;
          auVar59._20_4_ = fStack_7ec * fVar212;
          auVar59._24_4_ = fStack_7e8 * fVar213;
          auVar59._28_4_ = local_8a0._28_4_;
          _local_840 = vsubps_avx(auVar59,auVar258);
          auVar148 = vcmpps_avx(auVar15,_DAT_02020f00,5);
          auVar259._8_4_ = 0x7f800000;
          auVar259._0_8_ = 0x7f8000007f800000;
          auVar259._12_4_ = 0x7f800000;
          auVar259._16_4_ = 0x7f800000;
          auVar259._20_4_ = 0x7f800000;
          auVar259._24_4_ = 0x7f800000;
          auVar259._28_4_ = 0x7f800000;
          auVar150 = vblendvps_avx(auVar259,auVar52,auVar148);
          auVar308._8_4_ = 0x7fffffff;
          auVar308._0_8_ = 0x7fffffff7fffffff;
          auVar308._12_4_ = 0x7fffffff;
          auVar308._16_4_ = 0x7fffffff;
          auVar308._20_4_ = 0x7fffffff;
          auVar308._24_4_ = 0x7fffffff;
          auVar308._28_4_ = 0x7fffffff;
          auVar15 = vandps_avx(auVar308,local_400);
          auVar15 = vmaxps_avx(local_4c0,auVar15);
          auVar60._4_4_ = auVar15._4_4_ * 1.9073486e-06;
          auVar60._0_4_ = auVar15._0_4_ * 1.9073486e-06;
          auVar60._8_4_ = auVar15._8_4_ * 1.9073486e-06;
          auVar60._12_4_ = auVar15._12_4_ * 1.9073486e-06;
          auVar60._16_4_ = auVar15._16_4_ * 1.9073486e-06;
          auVar60._20_4_ = auVar15._20_4_ * 1.9073486e-06;
          auVar60._24_4_ = auVar15._24_4_ * 1.9073486e-06;
          auVar60._28_4_ = auVar15._28_4_;
          auVar15 = vandps_avx(auVar308,local_660);
          auVar15 = vcmpps_avx(auVar15,auVar60,1);
          auVar260._8_4_ = 0xff800000;
          auVar260._0_8_ = 0xff800000ff800000;
          auVar260._12_4_ = 0xff800000;
          auVar260._16_4_ = 0xff800000;
          auVar260._20_4_ = 0xff800000;
          auVar260._24_4_ = 0xff800000;
          auVar260._28_4_ = 0xff800000;
          auVar256 = vblendvps_avx(auVar260,auVar53,auVar148);
          auVar14 = auVar148 & auVar15;
          if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0x7f,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0xbf,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar14[0x1f] < '\0') {
            auVar105 = vandps_avx(auVar15,auVar148);
            auVar134 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
            auVar372 = ZEXT1232(ZEXT412(0)) << 0x20;
            auVar14 = vcmpps_avx(local_ac0,auVar372,2);
            auVar390._8_4_ = 0xff800000;
            auVar390._0_8_ = 0xff800000ff800000;
            auVar390._12_4_ = 0xff800000;
            auVar390._16_4_ = 0xff800000;
            auVar390._20_4_ = 0xff800000;
            auVar390._24_4_ = 0xff800000;
            auVar390._28_4_ = 0xff800000;
            auVar392._8_4_ = 0x7f800000;
            auVar392._0_8_ = 0x7f8000007f800000;
            auVar392._12_4_ = 0x7f800000;
            auVar392._16_4_ = 0x7f800000;
            auVar392._20_4_ = 0x7f800000;
            auVar392._24_4_ = 0x7f800000;
            auVar392._28_4_ = 0x7f800000;
            auVar15 = vblendvps_avx(auVar392,auVar390,auVar14);
            auVar197 = vpmovsxwd_avx(auVar134);
            auVar134 = vpunpckhwd_avx(auVar134,auVar134);
            auVar309._16_16_ = auVar134;
            auVar309._0_16_ = auVar197;
            auVar150 = vblendvps_avx(auVar150,auVar15,auVar309);
            auVar8 = vblendvps_avx(auVar390,auVar392,auVar14);
            auVar256 = vblendvps_avx(auVar256,auVar8,auVar309);
            auVar15 = vcmpps_avx(auVar372,ZEXT1232(ZEXT412(0)) << 0x20,0xf);
            auVar189._0_4_ = auVar105._0_4_ ^ auVar15._0_4_;
            auVar189._4_4_ = auVar105._4_4_ ^ auVar15._4_4_;
            auVar189._8_4_ = auVar105._8_4_ ^ auVar15._8_4_;
            auVar189._12_4_ = auVar105._12_4_ ^ auVar15._12_4_;
            auVar189._16_4_ = auVar105._16_4_ ^ auVar15._16_4_;
            auVar189._20_4_ = auVar105._20_4_ ^ auVar15._20_4_;
            auVar189._24_4_ = auVar105._24_4_ ^ auVar15._24_4_;
            auVar189._28_4_ = auVar105._28_4_ ^ auVar15._28_4_;
            auVar105 = vorps_avx(auVar14,auVar189);
            auVar105 = vandps_avx(auVar148,auVar105);
          }
          auVar354 = ZEXT3264(auVar8);
          auVar201 = local_a20._0_28_;
          auVar228 = local_ae0._0_28_;
          auVar335 = local_b00._0_28_;
        }
        auVar284 = ZEXT3264(_local_9a0);
        _local_480 = local_640;
        local_460 = vminps_avx(local_420,auVar150);
        _local_440 = vmaxps_avx(local_640,auVar256);
        auVar15 = vcmpps_avx(local_640,local_460,2);
        local_540 = vandps_avx(auVar104,auVar15);
        local_5e0 = local_540;
        auVar15 = vcmpps_avx(_local_440,local_420,2);
        local_600 = vandps_avx(auVar104,auVar15);
        auVar104 = vorps_avx(local_600,local_540);
        if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar104 >> 0x7f,0) != '\0') ||
              (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar104 >> 0xbf,0) != '\0') ||
            (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar104[0x1f] < '\0') {
          local_580 = local_600;
          local_860 = vcmpps_avx(ZEXT1632(ZEXT816(0) << 0x20),ZEXT1632(ZEXT816(0) << 0x20),0xf);
          local_5c0._0_4_ = auVar105._0_4_ ^ local_860._0_4_;
          local_5c0._4_4_ = auVar105._4_4_ ^ local_860._4_4_;
          local_5c0._8_4_ = (float)(auVar105._8_4_ ^ local_860._8_4_);
          local_5c0._12_4_ = (float)(auVar105._12_4_ ^ local_860._12_4_);
          local_5c0._16_4_ = (float)(auVar105._16_4_ ^ local_860._16_4_);
          local_5c0._20_4_ = (float)(auVar105._20_4_ ^ local_860._20_4_);
          local_5c0._24_4_ = (float)(auVar105._24_4_ ^ local_860._24_4_);
          local_5c0._28_4_ = (float)((uint)auVar105._28_4_ ^ (uint)local_860._28_4_);
          auVar111._0_4_ =
               auVar201._0_4_ * (float)local_7c0._0_4_ +
               auVar228._0_4_ * (float)local_7e0._0_4_ + auVar335._0_4_ * (float)local_800._0_4_;
          auVar111._4_4_ =
               auVar201._4_4_ * (float)local_7c0._4_4_ +
               auVar228._4_4_ * (float)local_7e0._4_4_ + auVar335._4_4_ * (float)local_800._4_4_;
          auVar111._8_4_ =
               auVar201._8_4_ * fStack_7b8 +
               auVar228._8_4_ * fStack_7d8 + auVar335._8_4_ * fStack_7f8;
          auVar111._12_4_ =
               auVar201._12_4_ * fStack_7b4 +
               auVar228._12_4_ * fStack_7d4 + auVar335._12_4_ * fStack_7f4;
          auVar111._16_4_ =
               auVar201._16_4_ * fStack_7b0 +
               auVar228._16_4_ * fStack_7d0 + auVar335._16_4_ * fStack_7f0;
          auVar111._20_4_ =
               auVar201._20_4_ * fStack_7ac +
               auVar228._20_4_ * fStack_7cc + auVar335._20_4_ * fStack_7ec;
          auVar111._24_4_ =
               auVar201._24_4_ * fStack_7a8 +
               auVar228._24_4_ * fStack_7c8 + auVar335._24_4_ * fStack_7e8;
          auVar111._28_4_ = local_860._28_4_ + local_540._28_4_ + auVar105._28_4_;
          auVar153._8_4_ = 0x7fffffff;
          auVar153._0_8_ = 0x7fffffff7fffffff;
          auVar153._12_4_ = 0x7fffffff;
          auVar153._16_4_ = 0x7fffffff;
          auVar153._20_4_ = 0x7fffffff;
          auVar153._24_4_ = 0x7fffffff;
          auVar153._28_4_ = 0x7fffffff;
          auVar104 = vandps_avx(auVar111,auVar153);
          auVar154._8_4_ = 0x3e99999a;
          auVar154._0_8_ = 0x3e99999a3e99999a;
          auVar154._12_4_ = 0x3e99999a;
          auVar154._16_4_ = 0x3e99999a;
          auVar154._20_4_ = 0x3e99999a;
          auVar154._24_4_ = 0x3e99999a;
          auVar154._28_4_ = 0x3e99999a;
          auVar104 = vcmpps_avx(auVar104,auVar154,1);
          auVar104 = vorps_avx(auVar104,local_5c0);
          auVar155._8_4_ = 3;
          auVar155._0_8_ = 0x300000003;
          auVar155._12_4_ = 3;
          auVar155._16_4_ = 3;
          auVar155._20_4_ = 3;
          auVar155._24_4_ = 3;
          auVar155._28_4_ = 3;
          auVar184._8_4_ = 2;
          auVar184._0_8_ = 0x200000002;
          auVar184._12_4_ = 2;
          auVar184._16_4_ = 2;
          auVar184._20_4_ = 2;
          auVar184._24_4_ = 2;
          auVar184._28_4_ = 2;
          auVar104 = vblendvps_avx(auVar184,auVar155,auVar104);
          local_5a0 = ZEXT432((uint)uVar85);
          auVar197 = vpshufd_avx(ZEXT416((uint)uVar85),0);
          auVar134 = vpcmpgtd_avx(auVar104._16_16_,auVar197);
          local_660._0_16_ = auVar197;
          auVar197 = vpcmpgtd_avx(auVar104._0_16_,auVar197);
          auVar156._16_16_ = auVar134;
          auVar156._0_16_ = auVar197;
          local_560 = vblendps_avx(ZEXT1632(auVar197),auVar156,0xf0);
          local_5e0 = vandnps_avx(local_560,local_540);
          auVar104 = local_540 & ~local_560;
          auVar208 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
          local_620._0_8_ = uVar85;
          auVar105 = _local_440;
          if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar104 >> 0x7f,0) != '\0') ||
                (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar104 >> 0xbf,0) != '\0') ||
              (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar104[0x1f] < '\0') {
            local_820._4_4_ = local_640._4_4_ + (float)local_9a0._4_4_;
            local_820._0_4_ = local_640._0_4_ + (float)local_9a0._0_4_;
            fStack_818 = local_640._8_4_ + fStack_998;
            fStack_814 = local_640._12_4_ + fStack_994;
            fStack_810 = local_640._16_4_ + fStack_990;
            fStack_80c = local_640._20_4_ + fStack_98c;
            fStack_808 = local_640._24_4_ + fStack_988;
            fStack_804 = local_640._28_4_ + fStack_984;
            local_9c0 = _local_440;
            do {
              auVar220 = auVar208._0_16_;
              auVar157._8_4_ = 0x7f800000;
              auVar157._0_8_ = 0x7f8000007f800000;
              auVar157._12_4_ = 0x7f800000;
              auVar157._16_4_ = 0x7f800000;
              auVar157._20_4_ = 0x7f800000;
              auVar157._24_4_ = 0x7f800000;
              auVar157._28_4_ = 0x7f800000;
              auVar104 = vblendvps_avx(auVar157,local_640,local_5e0);
              auVar105 = vshufps_avx(auVar104,auVar104,0xb1);
              auVar105 = vminps_avx(auVar104,auVar105);
              auVar15 = vshufpd_avx(auVar105,auVar105,5);
              auVar105 = vminps_avx(auVar105,auVar15);
              auVar15 = vperm2f128_avx(auVar105,auVar105,1);
              auVar105 = vminps_avx(auVar105,auVar15);
              auVar105 = vcmpps_avx(auVar104,auVar105,0);
              auVar15 = local_5e0 & auVar105;
              auVar104 = local_5e0;
              if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar15 >> 0x7f,0) != '\0') ||
                    (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar15 >> 0xbf,0) != '\0') ||
                  (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar15[0x1f] < '\0') {
                auVar104 = vandps_avx(auVar105,local_5e0);
              }
              uVar84 = vmovmskps_avx(auVar104);
              uVar4 = 0;
              if (uVar84 != 0) {
                for (; (uVar84 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                }
              }
              uVar85 = (ulong)uVar4;
              *(undefined4 *)(local_5e0 + uVar85 * 4) = 0;
              fVar190 = local_500[uVar85];
              uVar4 = *(uint *)(local_480 + uVar85 * 4);
              fVar263 = local_b04;
              if ((float)local_940._0_4_ < 0.0) {
                fVar263 = sqrtf((float)local_940._0_4_);
                auVar220._8_4_ = 0x7fffffff;
                auVar220._0_8_ = 0x7fffffff7fffffff;
                auVar220._12_4_ = 0x7fffffff;
              }
              auVar233 = ZEXT464(uVar4);
              auVar197 = vminps_avx(_local_a60,_local_a80);
              auVar134 = vmaxps_avx(_local_a60,_local_a80);
              auVar95 = vminps_avx(_local_a70,_local_a90);
              auVar176 = vminps_avx(auVar197,auVar95);
              auVar197 = vmaxps_avx(_local_a70,_local_a90);
              auVar95 = vmaxps_avx(auVar134,auVar197);
              auVar134 = vandps_avx(auVar176,auVar220);
              auVar197 = vandps_avx(auVar95,auVar220);
              auVar134 = vmaxps_avx(auVar134,auVar197);
              auVar197 = vmovshdup_avx(auVar134);
              auVar197 = vmaxss_avx(auVar197,auVar134);
              auVar134 = vshufpd_avx(auVar134,auVar134,1);
              auVar134 = vmaxss_avx(auVar134,auVar197);
              local_a20._0_4_ = auVar134._0_4_ * 1.9073486e-06;
              local_900._0_4_ = fVar263 * 1.9073486e-06;
              local_7a0._0_16_ = vshufps_avx(auVar95,auVar95,0xff);
              lVar82 = 4;
              do {
                local_b00._0_4_ = 1.0 - fVar190;
                auVar134 = vshufps_avx(ZEXT416((uint)fVar190),ZEXT416((uint)fVar190),0);
                fVar263 = auVar134._0_4_;
                fVar209 = auVar134._4_4_;
                fVar265 = auVar134._8_4_;
                fVar210 = auVar134._12_4_;
                auVar134 = vshufps_avx(ZEXT416((uint)local_b00._0_4_),ZEXT416((uint)local_b00._0_4_)
                                       ,0);
                fVar267 = auVar134._0_4_;
                fVar211 = auVar134._4_4_;
                fVar273 = auVar134._8_4_;
                fVar285 = auVar134._12_4_;
                fVar288 = (float)local_a70._0_4_ * fVar263 + (float)local_a80._0_4_ * fVar267;
                fVar291 = (float)local_a70._4_4_ * fVar209 + (float)local_a80._4_4_ * fVar211;
                fVar212 = fStack_a68 * fVar265 + fStack_a78 * fVar273;
                fVar213 = fStack_a64 * fVar210 + fStack_a74 * fVar285;
                auVar250._0_4_ =
                     fVar267 * ((float)local_a80._0_4_ * fVar263 + fVar267 * (float)local_a60._0_4_)
                     + fVar263 * fVar288;
                auVar250._4_4_ =
                     fVar211 * ((float)local_a80._4_4_ * fVar209 + fVar211 * (float)local_a60._4_4_)
                     + fVar209 * fVar291;
                auVar250._8_4_ =
                     fVar273 * (fStack_a78 * fVar265 + fVar273 * fStack_a58) + fVar265 * fVar212;
                auVar250._12_4_ =
                     fVar285 * (fStack_a74 * fVar210 + fVar285 * fStack_a54) + fVar210 * fVar213;
                auVar193._0_4_ =
                     fVar267 * fVar288 +
                     fVar263 * (fVar263 * (float)local_a90._0_4_ + (float)local_a70._0_4_ * fVar267)
                ;
                auVar193._4_4_ =
                     fVar211 * fVar291 +
                     fVar209 * (fVar209 * (float)local_a90._4_4_ + (float)local_a70._4_4_ * fVar211)
                ;
                auVar193._8_4_ =
                     fVar273 * fVar212 + fVar265 * (fVar265 * fStack_a88 + fStack_a68 * fVar273);
                auVar193._12_4_ =
                     fVar285 * fVar213 + fVar210 * (fVar210 * fStack_a84 + fStack_a64 * fVar285);
                auVar134 = vshufps_avx(auVar233._0_16_,auVar233._0_16_,0);
                auVar135._0_4_ = auVar134._0_4_ * (float)local_930._0_4_ + 0.0;
                auVar135._4_4_ = auVar134._4_4_ * (float)local_930._4_4_ + 0.0;
                auVar135._8_4_ = auVar134._8_4_ * fStack_928 + 0.0;
                auVar135._12_4_ = auVar134._12_4_ * fStack_924 + 0.0;
                auVar94._0_4_ = fVar267 * auVar250._0_4_ + fVar263 * auVar193._0_4_;
                auVar94._4_4_ = fVar211 * auVar250._4_4_ + fVar209 * auVar193._4_4_;
                auVar94._8_4_ = fVar273 * auVar250._8_4_ + fVar265 * auVar193._8_4_;
                auVar94._12_4_ = fVar285 * auVar250._12_4_ + fVar210 * auVar193._12_4_;
                local_8e0._0_16_ = auVar94;
                auVar134 = vsubps_avx(auVar135,auVar94);
                _local_ae0 = auVar134;
                auVar134 = vdpps_avx(auVar134,auVar134,0x7f);
                fVar263 = auVar134._0_4_;
                local_bc0 = auVar233._0_4_;
                if (fVar263 < 0.0) {
                  local_b00._0_16_ = ZEXT416((uint)local_b00._0_4_);
                  local_ac0._0_16_ = auVar250;
                  local_960._0_16_ = auVar193;
                  fVar209 = sqrtf(fVar263);
                  auVar193 = local_960._0_16_;
                  auVar250 = local_ac0._0_16_;
                }
                else {
                  auVar197 = vsqrtss_avx(auVar134,auVar134);
                  fVar209 = auVar197._0_4_;
                }
                auVar197 = vsubps_avx(auVar193,auVar250);
                auVar277._0_4_ = auVar197._0_4_ * 3.0;
                auVar277._4_4_ = auVar197._4_4_ * 3.0;
                auVar277._8_4_ = auVar197._8_4_ * 3.0;
                auVar277._12_4_ = auVar197._12_4_ * 3.0;
                auVar197 = vshufps_avx(ZEXT416((uint)(fVar190 * 6.0)),ZEXT416((uint)(fVar190 * 6.0))
                                       ,0);
                auVar95 = ZEXT416((uint)(((float)local_b00._0_4_ - (fVar190 + fVar190)) * 6.0));
                auVar176 = vshufps_avx(auVar95,auVar95,0);
                auVar95 = ZEXT416((uint)((fVar190 -
                                         ((float)local_b00._0_4_ + (float)local_b00._0_4_)) * 6.0));
                auVar194 = vshufps_avx(auVar95,auVar95,0);
                auVar91 = vshufps_avx(ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),
                                      ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),0);
                auVar95 = vdpps_avx(auVar277,auVar277,0x7f);
                auVar136._0_4_ =
                     auVar91._0_4_ * (float)local_a60._0_4_ +
                     auVar194._0_4_ * (float)local_a80._0_4_ +
                     auVar197._0_4_ * (float)local_a90._0_4_ +
                     auVar176._0_4_ * (float)local_a70._0_4_;
                auVar136._4_4_ =
                     auVar91._4_4_ * (float)local_a60._4_4_ +
                     auVar194._4_4_ * (float)local_a80._4_4_ +
                     auVar197._4_4_ * (float)local_a90._4_4_ +
                     auVar176._4_4_ * (float)local_a70._4_4_;
                auVar136._8_4_ =
                     auVar91._8_4_ * fStack_a58 +
                     auVar194._8_4_ * fStack_a78 +
                     auVar197._8_4_ * fStack_a88 + auVar176._8_4_ * fStack_a68;
                auVar136._12_4_ =
                     auVar91._12_4_ * fStack_a54 +
                     auVar194._12_4_ * fStack_a74 +
                     auVar197._12_4_ * fStack_a84 + auVar176._12_4_ * fStack_a64;
                auVar197 = vblendps_avx(auVar95,_DAT_01feba10,0xe);
                auVar176 = vrsqrtss_avx(auVar197,auVar197);
                fVar210 = auVar176._0_4_;
                fVar265 = auVar95._0_4_;
                auVar176 = vdpps_avx(auVar277,auVar136,0x7f);
                auVar194 = vshufps_avx(auVar95,auVar95,0);
                auVar137._0_4_ = auVar136._0_4_ * auVar194._0_4_;
                auVar137._4_4_ = auVar136._4_4_ * auVar194._4_4_;
                auVar137._8_4_ = auVar136._8_4_ * auVar194._8_4_;
                auVar137._12_4_ = auVar136._12_4_ * auVar194._12_4_;
                auVar176 = vshufps_avx(auVar176,auVar176,0);
                auVar221._0_4_ = auVar277._0_4_ * auVar176._0_4_;
                auVar221._4_4_ = auVar277._4_4_ * auVar176._4_4_;
                auVar221._8_4_ = auVar277._8_4_ * auVar176._8_4_;
                auVar221._12_4_ = auVar277._12_4_ * auVar176._12_4_;
                auVar91 = vsubps_avx(auVar137,auVar221);
                auVar176 = vrcpss_avx(auVar197,auVar197);
                auVar197 = vmaxss_avx(ZEXT416((uint)local_a20._0_4_),
                                      ZEXT416((uint)(local_bc0 * (float)local_900._0_4_)));
                auVar176 = ZEXT416((uint)(auVar176._0_4_ * (2.0 - fVar265 * auVar176._0_4_)));
                auVar176 = vshufps_avx(auVar176,auVar176,0);
                uVar85 = CONCAT44(auVar277._4_4_,auVar277._0_4_);
                local_a00._0_8_ = uVar85 ^ 0x8000000080000000;
                local_a00._8_4_ = -auVar277._8_4_;
                local_a00._12_4_ = -auVar277._12_4_;
                auVar194 = ZEXT416((uint)(fVar210 * 1.5 +
                                         fVar265 * -0.5 * fVar210 * fVar210 * fVar210));
                auVar194 = vshufps_avx(auVar194,auVar194,0);
                auVar195._0_4_ = auVar194._0_4_ * auVar91._0_4_ * auVar176._0_4_;
                auVar195._4_4_ = auVar194._4_4_ * auVar91._4_4_ * auVar176._4_4_;
                auVar195._8_4_ = auVar194._8_4_ * auVar91._8_4_ * auVar176._8_4_;
                auVar195._12_4_ = auVar194._12_4_ * auVar91._12_4_ * auVar176._12_4_;
                auVar334._0_4_ = auVar277._0_4_ * auVar194._0_4_;
                auVar334._4_4_ = auVar277._4_4_ * auVar194._4_4_;
                auVar334._8_4_ = auVar277._8_4_ * auVar194._8_4_;
                auVar334._12_4_ = auVar277._12_4_ * auVar194._12_4_;
                local_b00._0_16_ = auVar277;
                local_ac0._0_4_ = auVar197._0_4_;
                if (fVar265 < 0.0) {
                  local_960._0_4_ = fVar209;
                  local_980._0_16_ = auVar334;
                  local_920._0_16_ = auVar195;
                  fVar210 = sqrtf(fVar265);
                  auVar195 = local_920._0_16_;
                  auVar334 = local_980._0_16_;
                  fVar209 = (float)local_960._0_4_;
                  fVar265 = (float)local_ac0._0_4_;
                }
                else {
                  auVar95 = vsqrtss_avx(auVar95,auVar95);
                  fVar210 = auVar95._0_4_;
                  fVar265 = auVar197._0_4_;
                }
                auVar197 = vdpps_avx(_local_ae0,auVar334,0x7f);
                local_960._0_4_ =
                     ((float)local_a20._0_4_ / fVar210) * (fVar209 + 1.0) +
                     fVar265 + fVar209 * (float)local_a20._0_4_;
                auVar95 = vdpps_avx(local_a00._0_16_,auVar334,0x7f);
                auVar176 = vdpps_avx(_local_ae0,auVar195,0x7f);
                auVar194 = vdpps_avx(_local_930,auVar334,0x7f);
                auVar91 = vdpps_avx(_local_ae0,local_a00._0_16_,0x7f);
                fVar209 = auVar95._0_4_ + auVar176._0_4_;
                fVar210 = auVar197._0_4_;
                auVar96._0_4_ = fVar210 * fVar210;
                auVar96._4_4_ = auVar197._4_4_ * auVar197._4_4_;
                auVar96._8_4_ = auVar197._8_4_ * auVar197._8_4_;
                auVar96._12_4_ = auVar197._12_4_ * auVar197._12_4_;
                auVar176 = vsubps_avx(auVar134,auVar96);
                local_a00._0_16_ = ZEXT416((uint)fVar209);
                auVar95 = vdpps_avx(_local_ae0,_local_930,0x7f);
                fVar267 = auVar91._0_4_ - fVar210 * fVar209;
                fVar210 = auVar95._0_4_ - fVar210 * auVar194._0_4_;
                auVar95 = vrsqrtss_avx(auVar176,auVar176);
                fVar211 = auVar176._0_4_;
                fVar209 = auVar95._0_4_;
                fVar209 = fVar209 * 1.5 + fVar211 * -0.5 * fVar209 * fVar209 * fVar209;
                if (fVar211 < 0.0) {
                  local_980._0_16_ = auVar197;
                  local_920._0_16_ = auVar194;
                  local_740._0_4_ = fVar267;
                  local_760._0_4_ = fVar210;
                  local_780._0_4_ = fVar209;
                  fVar211 = sqrtf(fVar211);
                  fVar209 = (float)local_780._0_4_;
                  fVar267 = (float)local_740._0_4_;
                  fVar210 = (float)local_760._0_4_;
                  auVar194 = local_920._0_16_;
                  auVar197 = local_980._0_16_;
                  fVar265 = (float)local_ac0._0_4_;
                }
                else {
                  auVar95 = vsqrtss_avx(auVar176,auVar176);
                  fVar211 = auVar95._0_4_;
                }
                auVar176 = vpermilps_avx(local_8e0._0_16_,0xff);
                auVar91 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
                fVar267 = fVar267 * fVar209 - auVar91._0_4_;
                auVar222._0_8_ = auVar194._0_8_ ^ 0x8000000080000000;
                auVar222._8_4_ = auVar194._8_4_ ^ 0x80000000;
                auVar222._12_4_ = auVar194._12_4_ ^ 0x80000000;
                auVar251._0_4_ = -fVar267;
                auVar251._4_4_ = 0x80000000;
                auVar251._8_4_ = 0x80000000;
                auVar251._12_4_ = 0x80000000;
                auVar354 = ZEXT1664(local_a00._0_16_);
                auVar95 = vinsertps_avx(ZEXT416((uint)(fVar210 * fVar209)),auVar222,0x10);
                auVar194 = vmovsldup_avx(ZEXT416((uint)(local_a00._0_4_ * fVar210 * fVar209 -
                                                       auVar194._0_4_ * fVar267)));
                auVar95 = vdivps_avx(auVar95,auVar194);
                auVar92 = ZEXT416((uint)(fVar211 - auVar176._0_4_));
                auVar176 = vinsertps_avx(auVar197,auVar92,0x10);
                auVar196._0_4_ = auVar176._0_4_ * auVar95._0_4_;
                auVar196._4_4_ = auVar176._4_4_ * auVar95._4_4_;
                auVar196._8_4_ = auVar176._8_4_ * auVar95._8_4_;
                auVar196._12_4_ = auVar176._12_4_ * auVar95._12_4_;
                auVar95 = vinsertps_avx(auVar251,local_a00._0_16_,0x1c);
                auVar95 = vdivps_avx(auVar95,auVar194);
                auVar177._0_4_ = auVar176._0_4_ * auVar95._0_4_;
                auVar177._4_4_ = auVar176._4_4_ * auVar95._4_4_;
                auVar177._8_4_ = auVar176._8_4_ * auVar95._8_4_;
                auVar177._12_4_ = auVar176._12_4_ * auVar95._12_4_;
                auVar95 = vhaddps_avx(auVar196,auVar196);
                auVar176 = vhaddps_avx(auVar177,auVar177);
                fVar190 = fVar190 - auVar95._0_4_;
                local_bc0 = local_bc0 - auVar176._0_4_;
                auVar233 = ZEXT464((uint)local_bc0);
                auVar223._8_4_ = 0x7fffffff;
                auVar223._0_8_ = 0x7fffffff7fffffff;
                auVar223._12_4_ = 0x7fffffff;
                auVar208 = ZEXT1664(auVar223);
                auVar197 = vandps_avx(auVar197,auVar223);
                if ((float)local_960._0_4_ <= auVar197._0_4_) {
LAB_00f7a871:
                  bVar61 = false;
                }
                else {
                  auVar197 = vandps_avx(auVar92,auVar223);
                  if ((float)local_7a0._0_4_ * 1.9073486e-06 + fVar265 + (float)local_960._0_4_ <=
                      auVar197._0_4_) goto LAB_00f7a871;
                  local_bc0 = local_bc0 + (float)local_8c0._0_4_;
                  auVar233 = ZEXT464((uint)local_bc0);
                  bVar61 = true;
                  if (((fVar245 <= local_bc0) &&
                      (fVar209 = *(float *)(ray + k * 4 + 0x80), local_bc0 <= fVar209)) &&
                     ((0.0 <= fVar190 && (fVar190 <= 1.0)))) {
                    auVar134 = vrsqrtss_avx(auVar134,auVar134);
                    fVar265 = auVar134._0_4_;
                    auVar83 = (undefined1  [8])(context->scene->geometries).items[uVar79].ptr;
                    if ((((Geometry *)auVar83)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar134 = ZEXT416((uint)(fVar265 * 1.5 +
                                               fVar263 * -0.5 * fVar265 * fVar265 * fVar265));
                      auVar134 = vshufps_avx(auVar134,auVar134,0);
                      auVar138._0_4_ = auVar134._0_4_ * (float)local_ae0._0_4_;
                      auVar138._4_4_ = auVar134._4_4_ * (float)local_ae0._4_4_;
                      auVar138._8_4_ = auVar134._8_4_ * fStack_ad8;
                      auVar138._12_4_ = auVar134._12_4_ * fStack_ad4;
                      auVar97._0_4_ = local_b00._0_4_ + auVar91._0_4_ * auVar138._0_4_;
                      auVar97._4_4_ = local_b00._4_4_ + auVar91._4_4_ * auVar138._4_4_;
                      auVar97._8_4_ = local_b00._8_4_ + auVar91._8_4_ * auVar138._8_4_;
                      auVar97._12_4_ = local_b00._12_4_ + auVar91._12_4_ * auVar138._12_4_;
                      auVar134 = vshufps_avx(auVar138,auVar138,0xc9);
                      auVar197 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
                      auVar139._0_4_ = auVar197._0_4_ * auVar138._0_4_;
                      auVar139._4_4_ = auVar197._4_4_ * auVar138._4_4_;
                      auVar139._8_4_ = auVar197._8_4_ * auVar138._8_4_;
                      auVar139._12_4_ = auVar197._12_4_ * auVar138._12_4_;
                      auVar178._0_4_ = local_b00._0_4_ * auVar134._0_4_;
                      auVar178._4_4_ = local_b00._4_4_ * auVar134._4_4_;
                      auVar178._8_4_ = local_b00._8_4_ * auVar134._8_4_;
                      auVar178._12_4_ = local_b00._12_4_ * auVar134._12_4_;
                      auVar95 = vsubps_avx(auVar178,auVar139);
                      auVar134 = vshufps_avx(auVar95,auVar95,0xc9);
                      auVar197 = vshufps_avx(auVar97,auVar97,0xc9);
                      auVar179._0_4_ = auVar197._0_4_ * auVar134._0_4_;
                      auVar179._4_4_ = auVar197._4_4_ * auVar134._4_4_;
                      auVar179._8_4_ = auVar197._8_4_ * auVar134._8_4_;
                      auVar179._12_4_ = auVar197._12_4_ * auVar134._12_4_;
                      auVar134 = vshufps_avx(auVar95,auVar95,0xd2);
                      auVar98._0_4_ = auVar97._0_4_ * auVar134._0_4_;
                      auVar98._4_4_ = auVar97._4_4_ * auVar134._4_4_;
                      auVar98._8_4_ = auVar97._8_4_ * auVar134._8_4_;
                      auVar98._12_4_ = auVar97._12_4_ * auVar134._12_4_;
                      auVar134 = vsubps_avx(auVar179,auVar98);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (((Geometry *)auVar83)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = local_bc0;
                        uVar1 = vextractps_avx(auVar134,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                        uVar1 = vextractps_avx(auVar134,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                        *(int *)(ray + k * 4 + 0xe0) = auVar134._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar190;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_b10;
                        *(uint *)(ray + k * 4 + 0x120) = uVar79;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_6d0 = vshufps_avx(ZEXT416((uint)fVar190),ZEXT416((uint)fVar190),0);
                        local_700 = (RTCHitN  [16])vshufps_avx(auVar134,auVar134,0x55);
                        auVar197 = vshufps_avx(auVar134,auVar134,0xaa);
                        local_6e0 = vshufps_avx(auVar134,auVar134,0);
                        auStack_6f0 = auVar197;
                        local_6c0 = ZEXT816(0) << 0x20;
                        local_6b0 = local_720._0_8_;
                        uStack_6a8 = local_720._8_8_;
                        local_6a0 = local_710._0_8_;
                        uStack_698 = local_710._8_8_;
                        uVar4 = context->user->instID[0];
                        _local_690 = CONCAT44(uVar4,uVar4);
                        _uStack_688 = CONCAT44(uVar4,uVar4);
                        uVar4 = context->user->instPrimID[0];
                        _uStack_680 = CONCAT44(uVar4,uVar4);
                        _uStack_678 = CONCAT44(uVar4,uVar4);
                        *(float *)(ray + k * 4 + 0x80) = local_bc0;
                        local_b20 = *local_9c8;
                        uStack_b18 = local_9c8[1];
                        local_a50.valid = (int *)&local_b20;
                        local_a50.geometryUserPtr = ((Geometry *)auVar83)->userPtr;
                        local_a50.context = context->user;
                        local_a50.hit = local_700;
                        local_a50.N = 4;
                        local_a50.ray = (RTCRayN *)ray;
                        if (((Geometry *)auVar83)->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          local_ae0 = auVar83;
                          auVar354 = ZEXT1664(local_a00._0_16_);
                          (*((Geometry *)auVar83)->intersectionFilterN)(&local_a50);
                          auVar83 = local_ae0;
                        }
                        auVar73._8_8_ = uStack_b18;
                        auVar73._0_8_ = local_b20;
                        if (auVar73 == (undefined1  [16])0x0) {
                          auVar134 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar134 = auVar134 ^ _DAT_01febe20;
                          auVar208 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var6 = context->args->filter;
                          auVar208 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((((Geometry *)auVar83)->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar354 = ZEXT1664(auVar354._0_16_);
                            (*p_Var6)(&local_a50);
                            auVar208 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar74._8_8_ = uStack_b18;
                          auVar74._0_8_ = local_b20;
                          auVar95 = vpcmpeqd_avx(auVar74,_DAT_01feba10);
                          auVar197 = vpcmpeqd_avx(auVar197,auVar197);
                          auVar134 = auVar95 ^ auVar197;
                          if (auVar74 != (undefined1  [16])0x0) {
                            auVar95 = auVar95 ^ auVar197;
                            auVar197 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])local_a50.hit);
                            *(undefined1 (*) [16])(local_a50.ray + 0xc0) = auVar197;
                            auVar197 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                               (local_a50.hit + 0x10));
                            *(undefined1 (*) [16])(local_a50.ray + 0xd0) = auVar197;
                            auVar197 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                               (local_a50.hit + 0x20));
                            *(undefined1 (*) [16])(local_a50.ray + 0xe0) = auVar197;
                            auVar197 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                               (local_a50.hit + 0x30));
                            *(undefined1 (*) [16])(local_a50.ray + 0xf0) = auVar197;
                            auVar197 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                               (local_a50.hit + 0x40));
                            *(undefined1 (*) [16])(local_a50.ray + 0x100) = auVar197;
                            auVar197 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                               (local_a50.hit + 0x50));
                            *(undefined1 (*) [16])(local_a50.ray + 0x110) = auVar197;
                            auVar197 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                               (local_a50.hit + 0x60));
                            *(undefined1 (*) [16])(local_a50.ray + 0x120) = auVar197;
                            auVar197 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                               (local_a50.hit + 0x70));
                            *(undefined1 (*) [16])(local_a50.ray + 0x130) = auVar197;
                            auVar197 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                               (local_a50.hit + 0x80));
                            *(undefined1 (*) [16])(local_a50.ray + 0x140) = auVar197;
                          }
                        }
                        auVar233 = ZEXT464((uint)local_bc0);
                        auVar140._8_8_ = 0x100000001;
                        auVar140._0_8_ = 0x100000001;
                        if ((auVar140 & auVar134) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar209;
                        }
                      }
                    }
                  }
                }
                auVar104 = local_5e0;
                bVar86 = lVar82 != 0;
                lVar82 = lVar82 + -1;
              } while ((!bVar61) && (bVar86));
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar112._4_4_ = uVar1;
              auVar112._0_4_ = uVar1;
              auVar112._8_4_ = uVar1;
              auVar112._12_4_ = uVar1;
              auVar112._16_4_ = uVar1;
              auVar112._20_4_ = uVar1;
              auVar112._24_4_ = uVar1;
              auVar112._28_4_ = uVar1;
              auVar105 = vcmpps_avx(_local_820,auVar112,2);
              local_5e0 = vandps_avx(auVar105,local_5e0);
              auVar104 = auVar104 & auVar105;
              uVar85 = local_620._0_8_;
              auVar105 = local_9c0;
            } while ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar104 >> 0x7f,0) != '\0') ||
                       (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar104 >> 0xbf,0) != '\0') ||
                     (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar104[0x1f] < '\0');
          }
          auVar113._0_4_ =
               (float)local_880._0_4_ * (float)local_7c0._0_4_ +
               (float)local_8a0._0_4_ * (float)local_7e0._0_4_ +
               (float)local_840._0_4_ * (float)local_800._0_4_;
          auVar113._4_4_ =
               (float)local_880._4_4_ * (float)local_7c0._4_4_ +
               (float)local_8a0._4_4_ * (float)local_7e0._4_4_ +
               (float)local_840._4_4_ * (float)local_800._4_4_;
          auVar113._8_4_ =
               fStack_878 * fStack_7b8 + fStack_898 * fStack_7d8 + fStack_838 * fStack_7f8;
          auVar113._12_4_ =
               fStack_874 * fStack_7b4 + fStack_894 * fStack_7d4 + fStack_834 * fStack_7f4;
          auVar113._16_4_ =
               fStack_870 * fStack_7b0 + fStack_890 * fStack_7d0 + fStack_830 * fStack_7f0;
          auVar113._20_4_ =
               fStack_86c * fStack_7ac + fStack_88c * fStack_7cc + fStack_82c * fStack_7ec;
          auVar113._24_4_ =
               fStack_868 * fStack_7a8 + fStack_888 * fStack_7c8 + fStack_828 * fStack_7e8;
          auVar113._28_4_ = fStack_864 + fStack_884 + fStack_824;
          auVar158._8_4_ = 0x7fffffff;
          auVar158._0_8_ = 0x7fffffff7fffffff;
          auVar158._12_4_ = 0x7fffffff;
          auVar158._16_4_ = 0x7fffffff;
          auVar158._20_4_ = 0x7fffffff;
          auVar158._24_4_ = 0x7fffffff;
          auVar158._28_4_ = 0x7fffffff;
          auVar104 = vandps_avx(auVar113,auVar158);
          auVar159._8_4_ = 0x3e99999a;
          auVar159._0_8_ = 0x3e99999a3e99999a;
          auVar159._12_4_ = 0x3e99999a;
          auVar159._16_4_ = 0x3e99999a;
          auVar159._20_4_ = 0x3e99999a;
          auVar159._24_4_ = 0x3e99999a;
          auVar159._28_4_ = 0x3e99999a;
          auVar104 = vcmpps_avx(auVar104,auVar159,1);
          auVar15 = vorps_avx(auVar104,local_5c0);
          auVar160._0_4_ = auVar105._0_4_ + (float)local_9a0._0_4_;
          auVar160._4_4_ = auVar105._4_4_ + (float)local_9a0._4_4_;
          auVar160._8_4_ = auVar105._8_4_ + fStack_998;
          auVar160._12_4_ = auVar105._12_4_ + fStack_994;
          auVar160._16_4_ = auVar105._16_4_ + fStack_990;
          auVar160._20_4_ = auVar105._20_4_ + fStack_98c;
          auVar160._24_4_ = auVar105._24_4_ + fStack_988;
          auVar160._28_4_ = auVar105._28_4_ + fStack_984;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar185._4_4_ = uVar1;
          auVar185._0_4_ = uVar1;
          auVar185._8_4_ = uVar1;
          auVar185._12_4_ = uVar1;
          auVar185._16_4_ = uVar1;
          auVar185._20_4_ = uVar1;
          auVar185._24_4_ = uVar1;
          auVar185._28_4_ = uVar1;
          auVar104 = vcmpps_avx(auVar160,auVar185,2);
          _local_880 = vandps_avx(auVar104,local_580);
          auVar161._8_4_ = 3;
          auVar161._0_8_ = 0x300000003;
          auVar161._12_4_ = 3;
          auVar161._16_4_ = 3;
          auVar161._20_4_ = 3;
          auVar161._24_4_ = 3;
          auVar161._28_4_ = 3;
          auVar186._8_4_ = 2;
          auVar186._0_8_ = 0x200000002;
          auVar186._12_4_ = 2;
          auVar186._16_4_ = 2;
          auVar186._20_4_ = 2;
          auVar186._24_4_ = 2;
          auVar186._28_4_ = 2;
          auVar104 = vblendvps_avx(auVar186,auVar161,auVar15);
          auVar134 = vpcmpgtd_avx(auVar104._16_16_,local_660._0_16_);
          auVar197 = vpshufd_avx(local_5a0._0_16_,0);
          auVar197 = vpcmpgtd_avx(auVar104._0_16_,auVar197);
          auVar162._16_16_ = auVar134;
          auVar162._0_16_ = auVar197;
          _local_8a0 = vblendps_avx(ZEXT1632(auVar197),auVar162,0xf0);
          local_600 = vandnps_avx(_local_8a0,_local_880);
          auVar104 = _local_880 & ~_local_8a0;
          if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar104 >> 0x7f,0) != '\0') ||
                (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar104 >> 0xbf,0) != '\0') ||
              (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar104[0x1f] < '\0') {
            local_7a0 = _local_440;
            local_820._4_4_ = (float)local_440._4_4_ + (float)local_9a0._4_4_;
            local_820._0_4_ = (float)local_440._0_4_ + (float)local_9a0._0_4_;
            fStack_818 = fStack_438 + fStack_998;
            fStack_814 = fStack_434 + fStack_994;
            fStack_810 = fStack_430 + fStack_990;
            fStack_80c = fStack_42c + fStack_98c;
            fStack_808 = fStack_428 + fStack_988;
            fStack_804 = fStack_424 + fStack_984;
            do {
              auVar224 = auVar208._0_16_;
              auVar163._8_4_ = 0x7f800000;
              auVar163._0_8_ = 0x7f8000007f800000;
              auVar163._12_4_ = 0x7f800000;
              auVar163._16_4_ = 0x7f800000;
              auVar163._20_4_ = 0x7f800000;
              auVar163._24_4_ = 0x7f800000;
              auVar163._28_4_ = 0x7f800000;
              auVar104 = vblendvps_avx(auVar163,local_7a0,local_600);
              auVar105 = vshufps_avx(auVar104,auVar104,0xb1);
              auVar105 = vminps_avx(auVar104,auVar105);
              auVar15 = vshufpd_avx(auVar105,auVar105,5);
              auVar105 = vminps_avx(auVar105,auVar15);
              auVar15 = vperm2f128_avx(auVar105,auVar105,1);
              auVar105 = vminps_avx(auVar105,auVar15);
              auVar105 = vcmpps_avx(auVar104,auVar105,0);
              auVar15 = local_600 & auVar105;
              auVar104 = local_600;
              if ((((((((auVar15 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar15 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar15 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar15 >> 0x7f,0) != '\0') ||
                    (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar15 >> 0xbf,0) != '\0') ||
                  (auVar15 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar15[0x1f] < '\0') {
                auVar104 = vandps_avx(auVar105,local_600);
              }
              uVar84 = vmovmskps_avx(auVar104);
              uVar4 = 0;
              if (uVar84 != 0) {
                for (; (uVar84 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
                }
              }
              uVar85 = (ulong)uVar4;
              *(undefined4 *)(local_600 + uVar85 * 4) = 0;
              fVar190 = local_520[uVar85];
              uVar4 = *(uint *)(local_420 + uVar85 * 4);
              fVar263 = local_b08;
              if ((float)local_940._0_4_ < 0.0) {
                fVar263 = sqrtf((float)local_940._0_4_);
                auVar224._8_4_ = 0x7fffffff;
                auVar224._0_8_ = 0x7fffffff7fffffff;
                auVar224._12_4_ = 0x7fffffff;
              }
              auVar233 = ZEXT464(uVar4);
              auVar197 = vminps_avx(_local_a60,_local_a80);
              auVar134 = vmaxps_avx(_local_a60,_local_a80);
              auVar95 = vminps_avx(_local_a70,_local_a90);
              auVar176 = vminps_avx(auVar197,auVar95);
              auVar197 = vmaxps_avx(_local_a70,_local_a90);
              auVar95 = vmaxps_avx(auVar134,auVar197);
              auVar134 = vandps_avx(auVar176,auVar224);
              auVar197 = vandps_avx(auVar95,auVar224);
              auVar134 = vmaxps_avx(auVar134,auVar197);
              auVar197 = vmovshdup_avx(auVar134);
              auVar197 = vmaxss_avx(auVar197,auVar134);
              auVar134 = vshufpd_avx(auVar134,auVar134,1);
              auVar134 = vmaxss_avx(auVar134,auVar197);
              local_a20._0_4_ = auVar134._0_4_ * 1.9073486e-06;
              local_960._0_4_ = fVar263 * 1.9073486e-06;
              local_780._0_16_ = vshufps_avx(auVar95,auVar95,0xff);
              lVar82 = 4;
              do {
                local_b00._0_4_ = 1.0 - fVar190;
                auVar134 = vshufps_avx(ZEXT416((uint)fVar190),ZEXT416((uint)fVar190),0);
                fVar263 = auVar134._0_4_;
                fVar209 = auVar134._4_4_;
                fVar265 = auVar134._8_4_;
                fVar210 = auVar134._12_4_;
                auVar134 = vshufps_avx(ZEXT416((uint)local_b00._0_4_),ZEXT416((uint)local_b00._0_4_)
                                       ,0);
                fVar267 = auVar134._0_4_;
                fVar211 = auVar134._4_4_;
                fVar273 = auVar134._8_4_;
                fVar285 = auVar134._12_4_;
                fVar288 = (float)local_a70._0_4_ * fVar263 + (float)local_a80._0_4_ * fVar267;
                fVar291 = (float)local_a70._4_4_ * fVar209 + (float)local_a80._4_4_ * fVar211;
                fVar212 = fStack_a68 * fVar265 + fStack_a78 * fVar273;
                fVar213 = fStack_a64 * fVar210 + fStack_a74 * fVar285;
                auVar252._0_4_ =
                     fVar267 * ((float)local_a80._0_4_ * fVar263 + fVar267 * (float)local_a60._0_4_)
                     + fVar263 * fVar288;
                auVar252._4_4_ =
                     fVar211 * ((float)local_a80._4_4_ * fVar209 + fVar211 * (float)local_a60._4_4_)
                     + fVar209 * fVar291;
                auVar252._8_4_ =
                     fVar273 * (fStack_a78 * fVar265 + fVar273 * fStack_a58) + fVar265 * fVar212;
                auVar252._12_4_ =
                     fVar285 * (fStack_a74 * fVar210 + fVar285 * fStack_a54) + fVar210 * fVar213;
                auVar198._0_4_ =
                     fVar267 * fVar288 +
                     fVar263 * (fVar263 * (float)local_a90._0_4_ + (float)local_a70._0_4_ * fVar267)
                ;
                auVar198._4_4_ =
                     fVar211 * fVar291 +
                     fVar209 * (fVar209 * (float)local_a90._4_4_ + (float)local_a70._4_4_ * fVar211)
                ;
                auVar198._8_4_ =
                     fVar273 * fVar212 + fVar265 * (fVar265 * fStack_a88 + fStack_a68 * fVar273);
                auVar198._12_4_ =
                     fVar285 * fVar213 + fVar210 * (fVar210 * fStack_a84 + fStack_a64 * fVar285);
                auVar134 = vshufps_avx(auVar233._0_16_,auVar233._0_16_,0);
                auVar141._0_4_ = auVar134._0_4_ * (float)local_930._0_4_ + 0.0;
                auVar141._4_4_ = auVar134._4_4_ * (float)local_930._4_4_ + 0.0;
                auVar141._8_4_ = auVar134._8_4_ * fStack_928 + 0.0;
                auVar141._12_4_ = auVar134._12_4_ * fStack_924 + 0.0;
                auVar99._0_4_ = fVar267 * auVar252._0_4_ + fVar263 * auVar198._0_4_;
                auVar99._4_4_ = fVar211 * auVar252._4_4_ + fVar209 * auVar198._4_4_;
                auVar99._8_4_ = fVar273 * auVar252._8_4_ + fVar265 * auVar198._8_4_;
                auVar99._12_4_ = fVar285 * auVar252._12_4_ + fVar210 * auVar198._12_4_;
                local_8e0._0_16_ = auVar99;
                auVar134 = vsubps_avx(auVar141,auVar99);
                _local_ae0 = auVar134;
                auVar134 = vdpps_avx(auVar134,auVar134,0x7f);
                fVar263 = auVar134._0_4_;
                local_bc0 = auVar233._0_4_;
                if (fVar263 < 0.0) {
                  local_b00._0_16_ = ZEXT416((uint)local_b00._0_4_);
                  local_ac0._0_16_ = auVar252;
                  local_a00._0_16_ = auVar198;
                  fVar209 = sqrtf(fVar263);
                  auVar198 = local_a00._0_16_;
                  auVar252 = local_ac0._0_16_;
                }
                else {
                  auVar197 = vsqrtss_avx(auVar134,auVar134);
                  fVar209 = auVar197._0_4_;
                }
                auVar197 = vsubps_avx(auVar198,auVar252);
                auVar278._0_4_ = auVar197._0_4_ * 3.0;
                auVar278._4_4_ = auVar197._4_4_ * 3.0;
                auVar278._8_4_ = auVar197._8_4_ * 3.0;
                auVar278._12_4_ = auVar197._12_4_ * 3.0;
                auVar197 = vshufps_avx(ZEXT416((uint)(fVar190 * 6.0)),ZEXT416((uint)(fVar190 * 6.0))
                                       ,0);
                auVar95 = ZEXT416((uint)(((float)local_b00._0_4_ - (fVar190 + fVar190)) * 6.0));
                auVar176 = vshufps_avx(auVar95,auVar95,0);
                auVar95 = ZEXT416((uint)((fVar190 -
                                         ((float)local_b00._0_4_ + (float)local_b00._0_4_)) * 6.0));
                auVar194 = vshufps_avx(auVar95,auVar95,0);
                auVar91 = vshufps_avx(ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),
                                      ZEXT416((uint)((float)local_b00._0_4_ * 6.0)),0);
                auVar95 = vdpps_avx(auVar278,auVar278,0x7f);
                auVar142._0_4_ =
                     auVar91._0_4_ * (float)local_a60._0_4_ +
                     auVar194._0_4_ * (float)local_a80._0_4_ +
                     auVar197._0_4_ * (float)local_a90._0_4_ +
                     auVar176._0_4_ * (float)local_a70._0_4_;
                auVar142._4_4_ =
                     auVar91._4_4_ * (float)local_a60._4_4_ +
                     auVar194._4_4_ * (float)local_a80._4_4_ +
                     auVar197._4_4_ * (float)local_a90._4_4_ +
                     auVar176._4_4_ * (float)local_a70._4_4_;
                auVar142._8_4_ =
                     auVar91._8_4_ * fStack_a58 +
                     auVar194._8_4_ * fStack_a78 +
                     auVar197._8_4_ * fStack_a88 + auVar176._8_4_ * fStack_a68;
                auVar142._12_4_ =
                     auVar91._12_4_ * fStack_a54 +
                     auVar194._12_4_ * fStack_a74 +
                     auVar197._12_4_ * fStack_a84 + auVar176._12_4_ * fStack_a64;
                auVar197 = vblendps_avx(auVar95,_DAT_01feba10,0xe);
                auVar176 = vrsqrtss_avx(auVar197,auVar197);
                fVar210 = auVar176._0_4_;
                fVar265 = auVar95._0_4_;
                auVar176 = vdpps_avx(auVar278,auVar142,0x7f);
                auVar194 = vshufps_avx(auVar95,auVar95,0);
                auVar143._0_4_ = auVar142._0_4_ * auVar194._0_4_;
                auVar143._4_4_ = auVar142._4_4_ * auVar194._4_4_;
                auVar143._8_4_ = auVar142._8_4_ * auVar194._8_4_;
                auVar143._12_4_ = auVar142._12_4_ * auVar194._12_4_;
                auVar176 = vshufps_avx(auVar176,auVar176,0);
                auVar225._0_4_ = auVar278._0_4_ * auVar176._0_4_;
                auVar225._4_4_ = auVar278._4_4_ * auVar176._4_4_;
                auVar225._8_4_ = auVar278._8_4_ * auVar176._8_4_;
                auVar225._12_4_ = auVar278._12_4_ * auVar176._12_4_;
                auVar91 = vsubps_avx(auVar143,auVar225);
                auVar176 = vrcpss_avx(auVar197,auVar197);
                auVar197 = vmaxss_avx(ZEXT416((uint)local_a20._0_4_),
                                      ZEXT416((uint)(local_bc0 * (float)local_960._0_4_)));
                auVar176 = ZEXT416((uint)(auVar176._0_4_ * (2.0 - fVar265 * auVar176._0_4_)));
                auVar176 = vshufps_avx(auVar176,auVar176,0);
                uVar85 = CONCAT44(auVar278._4_4_,auVar278._0_4_);
                auVar253._0_8_ = uVar85 ^ 0x8000000080000000;
                auVar253._8_4_ = -auVar278._8_4_;
                auVar253._12_4_ = -auVar278._12_4_;
                auVar194 = ZEXT416((uint)(fVar210 * 1.5 +
                                         fVar265 * -0.5 * fVar210 * fVar210 * fVar210));
                auVar194 = vshufps_avx(auVar194,auVar194,0);
                auVar199._0_4_ = auVar194._0_4_ * auVar91._0_4_ * auVar176._0_4_;
                auVar199._4_4_ = auVar194._4_4_ * auVar91._4_4_ * auVar176._4_4_;
                auVar199._8_4_ = auVar194._8_4_ * auVar91._8_4_ * auVar176._8_4_;
                auVar199._12_4_ = auVar194._12_4_ * auVar91._12_4_ * auVar176._12_4_;
                auVar324._0_4_ = auVar278._0_4_ * auVar194._0_4_;
                auVar324._4_4_ = auVar278._4_4_ * auVar194._4_4_;
                auVar324._8_4_ = auVar278._8_4_ * auVar194._8_4_;
                auVar324._12_4_ = auVar278._12_4_ * auVar194._12_4_;
                local_b00._0_16_ = auVar278;
                local_ac0._0_4_ = auVar197._0_4_;
                if (fVar265 < 0.0) {
                  local_a00._0_4_ = fVar209;
                  local_900._0_16_ = auVar253;
                  local_9c0._0_16_ = auVar324;
                  local_980._0_16_ = auVar199;
                  fVar210 = sqrtf(fVar265);
                  auVar199 = local_980._0_16_;
                  auVar253 = local_900._0_16_;
                  auVar324 = local_9c0._0_16_;
                  fVar265 = (float)local_ac0._0_4_;
                  fVar209 = (float)local_a00._0_4_;
                }
                else {
                  auVar95 = vsqrtss_avx(auVar95,auVar95);
                  fVar210 = auVar95._0_4_;
                  fVar265 = auVar197._0_4_;
                }
                auVar197 = vdpps_avx(_local_ae0,auVar324,0x7f);
                fVar209 = ((float)local_a20._0_4_ / fVar210) * (fVar209 + 1.0) +
                          fVar265 + fVar209 * (float)local_a20._0_4_;
                auVar95 = vdpps_avx(auVar253,auVar324,0x7f);
                auVar176 = vdpps_avx(_local_ae0,auVar199,0x7f);
                auVar194 = vdpps_avx(_local_930,auVar324,0x7f);
                auVar91 = vdpps_avx(_local_ae0,auVar253,0x7f);
                fVar210 = auVar95._0_4_ + auVar176._0_4_;
                fVar267 = auVar197._0_4_;
                auVar100._0_4_ = fVar267 * fVar267;
                auVar100._4_4_ = auVar197._4_4_ * auVar197._4_4_;
                auVar100._8_4_ = auVar197._8_4_ * auVar197._8_4_;
                auVar100._12_4_ = auVar197._12_4_ * auVar197._12_4_;
                auVar176 = vsubps_avx(auVar134,auVar100);
                auVar95 = vdpps_avx(_local_ae0,_local_930,0x7f);
                fVar211 = auVar91._0_4_ - fVar267 * fVar210;
                fVar273 = auVar95._0_4_ - fVar267 * auVar194._0_4_;
                auVar95 = vrsqrtss_avx(auVar176,auVar176);
                fVar285 = auVar176._0_4_;
                fVar267 = auVar95._0_4_;
                fVar267 = fVar267 * 1.5 + fVar285 * -0.5 * fVar267 * fVar267 * fVar267;
                if (fVar285 < 0.0) {
                  local_a00._0_16_ = auVar197;
                  local_900._0_4_ = fVar209;
                  local_9c0._0_16_ = ZEXT416((uint)fVar210);
                  local_980._0_16_ = auVar194;
                  local_920._0_4_ = fVar211;
                  local_740._0_4_ = fVar273;
                  local_760._0_4_ = fVar267;
                  fVar285 = sqrtf(fVar285);
                  fVar209 = (float)local_900._0_4_;
                  fVar267 = (float)local_760._0_4_;
                  fVar211 = (float)local_920._0_4_;
                  fVar273 = (float)local_740._0_4_;
                  auVar194 = local_980._0_16_;
                  auVar197 = local_a00._0_16_;
                  auVar95 = local_9c0._0_16_;
                  fVar265 = (float)local_ac0._0_4_;
                }
                else {
                  auVar95 = vsqrtss_avx(auVar176,auVar176);
                  fVar285 = auVar95._0_4_;
                  auVar95 = ZEXT416((uint)fVar210);
                }
                auVar354 = ZEXT1664(local_b00._0_16_);
                auVar144 = vpermilps_avx(local_8e0._0_16_,0xff);
                auVar92 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xff);
                fVar210 = fVar211 * fVar267 - auVar92._0_4_;
                auVar226._0_8_ = auVar194._0_8_ ^ 0x8000000080000000;
                auVar226._8_4_ = auVar194._8_4_ ^ 0x80000000;
                auVar226._12_4_ = auVar194._12_4_ ^ 0x80000000;
                auVar254._0_4_ = -fVar210;
                auVar254._4_4_ = 0x80000000;
                auVar254._8_4_ = 0x80000000;
                auVar254._12_4_ = 0x80000000;
                auVar176 = vinsertps_avx(ZEXT416((uint)(fVar273 * fVar267)),auVar226,0x10);
                auVar91 = vmovsldup_avx(ZEXT416((uint)(auVar95._0_4_ * fVar273 * fVar267 -
                                                      auVar194._0_4_ * fVar210)));
                auVar176 = vdivps_avx(auVar176,auVar91);
                auVar144 = ZEXT416((uint)(fVar285 - auVar144._0_4_));
                auVar194 = vinsertps_avx(auVar197,auVar144,0x10);
                auVar200._0_4_ = auVar194._0_4_ * auVar176._0_4_;
                auVar200._4_4_ = auVar194._4_4_ * auVar176._4_4_;
                auVar200._8_4_ = auVar194._8_4_ * auVar176._8_4_;
                auVar200._12_4_ = auVar194._12_4_ * auVar176._12_4_;
                auVar95 = vinsertps_avx(auVar254,auVar95,0x1c);
                auVar95 = vdivps_avx(auVar95,auVar91);
                auVar180._0_4_ = auVar194._0_4_ * auVar95._0_4_;
                auVar180._4_4_ = auVar194._4_4_ * auVar95._4_4_;
                auVar180._8_4_ = auVar194._8_4_ * auVar95._8_4_;
                auVar180._12_4_ = auVar194._12_4_ * auVar95._12_4_;
                auVar95 = vhaddps_avx(auVar200,auVar200);
                auVar176 = vhaddps_avx(auVar180,auVar180);
                fVar190 = fVar190 - auVar95._0_4_;
                local_bc0 = local_bc0 - auVar176._0_4_;
                auVar233 = ZEXT464((uint)local_bc0);
                auVar227._8_4_ = 0x7fffffff;
                auVar227._0_8_ = 0x7fffffff7fffffff;
                auVar227._12_4_ = 0x7fffffff;
                auVar208 = ZEXT1664(auVar227);
                auVar197 = vandps_avx(auVar197,auVar227);
                if (fVar209 <= auVar197._0_4_) {
LAB_00f7b459:
                  bVar61 = false;
                }
                else {
                  auVar197 = vandps_avx(auVar144,auVar227);
                  if ((float)local_780._0_4_ * 1.9073486e-06 + fVar265 + fVar209 <= auVar197._0_4_)
                  goto LAB_00f7b459;
                  local_bc0 = local_bc0 + (float)local_8c0._0_4_;
                  auVar233 = ZEXT464((uint)local_bc0);
                  bVar61 = true;
                  if ((((fVar245 <= local_bc0) &&
                       (fVar209 = *(float *)(ray + k * 4 + 0x80), local_bc0 <= fVar209)) &&
                      (0.0 <= fVar190)) && (fVar190 <= 1.0)) {
                    auVar134 = vrsqrtss_avx(auVar134,auVar134);
                    fVar265 = auVar134._0_4_;
                    auVar83 = (undefined1  [8])(context->scene->geometries).items[uVar79].ptr;
                    if ((((Geometry *)auVar83)->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      auVar134 = ZEXT416((uint)(fVar265 * 1.5 +
                                               fVar263 * -0.5 * fVar265 * fVar265 * fVar265));
                      auVar134 = vshufps_avx(auVar134,auVar134,0);
                      auVar145._0_4_ = auVar134._0_4_ * (float)local_ae0._0_4_;
                      auVar145._4_4_ = auVar134._4_4_ * (float)local_ae0._4_4_;
                      auVar145._8_4_ = auVar134._8_4_ * fStack_ad8;
                      auVar145._12_4_ = auVar134._12_4_ * fStack_ad4;
                      auVar101._0_4_ = local_b00._0_4_ + auVar92._0_4_ * auVar145._0_4_;
                      auVar101._4_4_ = local_b00._4_4_ + auVar92._4_4_ * auVar145._4_4_;
                      auVar101._8_4_ = local_b00._8_4_ + auVar92._8_4_ * auVar145._8_4_;
                      auVar101._12_4_ = local_b00._12_4_ + auVar92._12_4_ * auVar145._12_4_;
                      auVar134 = vshufps_avx(auVar145,auVar145,0xc9);
                      auVar197 = vshufps_avx(local_b00._0_16_,local_b00._0_16_,0xc9);
                      auVar146._0_4_ = auVar197._0_4_ * auVar145._0_4_;
                      auVar146._4_4_ = auVar197._4_4_ * auVar145._4_4_;
                      auVar146._8_4_ = auVar197._8_4_ * auVar145._8_4_;
                      auVar146._12_4_ = auVar197._12_4_ * auVar145._12_4_;
                      auVar181._0_4_ = local_b00._0_4_ * auVar134._0_4_;
                      auVar181._4_4_ = local_b00._4_4_ * auVar134._4_4_;
                      auVar181._8_4_ = local_b00._8_4_ * auVar134._8_4_;
                      auVar181._12_4_ = local_b00._12_4_ * auVar134._12_4_;
                      auVar95 = vsubps_avx(auVar181,auVar146);
                      auVar134 = vshufps_avx(auVar95,auVar95,0xc9);
                      auVar197 = vshufps_avx(auVar101,auVar101,0xc9);
                      auVar182._0_4_ = auVar197._0_4_ * auVar134._0_4_;
                      auVar182._4_4_ = auVar197._4_4_ * auVar134._4_4_;
                      auVar182._8_4_ = auVar197._8_4_ * auVar134._8_4_;
                      auVar182._12_4_ = auVar197._12_4_ * auVar134._12_4_;
                      auVar134 = vshufps_avx(auVar95,auVar95,0xd2);
                      auVar102._0_4_ = auVar101._0_4_ * auVar134._0_4_;
                      auVar102._4_4_ = auVar101._4_4_ * auVar134._4_4_;
                      auVar102._8_4_ = auVar101._8_4_ * auVar134._8_4_;
                      auVar102._12_4_ = auVar101._12_4_ * auVar134._12_4_;
                      auVar134 = vsubps_avx(auVar182,auVar102);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (((Geometry *)auVar83)->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        *(float *)(ray + k * 4 + 0x80) = local_bc0;
                        uVar1 = vextractps_avx(auVar134,1);
                        *(undefined4 *)(ray + k * 4 + 0xc0) = uVar1;
                        uVar1 = vextractps_avx(auVar134,2);
                        *(undefined4 *)(ray + k * 4 + 0xd0) = uVar1;
                        *(int *)(ray + k * 4 + 0xe0) = auVar134._0_4_;
                        *(float *)(ray + k * 4 + 0xf0) = fVar190;
                        *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                        *(int *)(ray + k * 4 + 0x110) = (int)local_b10;
                        *(uint *)(ray + k * 4 + 0x120) = uVar79;
                        *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                        *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                      }
                      else {
                        local_6d0 = vshufps_avx(ZEXT416((uint)fVar190),ZEXT416((uint)fVar190),0);
                        local_700 = (RTCHitN  [16])vshufps_avx(auVar134,auVar134,0x55);
                        auVar197 = vshufps_avx(auVar134,auVar134,0xaa);
                        local_6e0 = vshufps_avx(auVar134,auVar134,0);
                        auStack_6f0 = auVar197;
                        local_6c0 = ZEXT816(0) << 0x20;
                        local_6b0 = local_720._0_8_;
                        uStack_6a8 = local_720._8_8_;
                        local_6a0 = local_710._0_8_;
                        uStack_698 = local_710._8_8_;
                        uVar4 = context->user->instID[0];
                        _local_690 = CONCAT44(uVar4,uVar4);
                        _uStack_688 = CONCAT44(uVar4,uVar4);
                        uVar4 = context->user->instPrimID[0];
                        _uStack_680 = CONCAT44(uVar4,uVar4);
                        _uStack_678 = CONCAT44(uVar4,uVar4);
                        *(float *)(ray + k * 4 + 0x80) = local_bc0;
                        local_b20 = *local_9c8;
                        uStack_b18 = local_9c8[1];
                        local_a50.valid = (int *)&local_b20;
                        local_a50.geometryUserPtr = ((Geometry *)auVar83)->userPtr;
                        local_a50.context = context->user;
                        local_a50.hit = local_700;
                        local_a50.N = 4;
                        local_a50.ray = (RTCRayN *)ray;
                        if (((Geometry *)auVar83)->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                          local_ae0 = auVar83;
                          auVar354 = ZEXT1664(local_b00._0_16_);
                          (*((Geometry *)auVar83)->intersectionFilterN)(&local_a50);
                          auVar83 = local_ae0;
                        }
                        auVar75._8_8_ = uStack_b18;
                        auVar75._0_8_ = local_b20;
                        if (auVar75 == (undefined1  [16])0x0) {
                          auVar134 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01feba10);
                          auVar134 = auVar134 ^ _DAT_01febe20;
                          auVar208 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                        }
                        else {
                          p_Var6 = context->args->filter;
                          auVar208 = ZEXT1664(CONCAT412(0x7fffffff,
                                                        CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((((Geometry *)auVar83)->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar354 = ZEXT1664(auVar354._0_16_);
                            (*p_Var6)(&local_a50);
                            auVar208 = ZEXT1664(CONCAT412(0x7fffffff,
                                                          CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
                          }
                          auVar76._8_8_ = uStack_b18;
                          auVar76._0_8_ = local_b20;
                          auVar95 = vpcmpeqd_avx(auVar76,_DAT_01feba10);
                          auVar197 = vpcmpeqd_avx(auVar197,auVar197);
                          auVar134 = auVar95 ^ auVar197;
                          if (auVar76 != (undefined1  [16])0x0) {
                            auVar95 = auVar95 ^ auVar197;
                            auVar197 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])local_a50.hit);
                            *(undefined1 (*) [16])(local_a50.ray + 0xc0) = auVar197;
                            auVar197 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                               (local_a50.hit + 0x10));
                            *(undefined1 (*) [16])(local_a50.ray + 0xd0) = auVar197;
                            auVar197 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                               (local_a50.hit + 0x20));
                            *(undefined1 (*) [16])(local_a50.ray + 0xe0) = auVar197;
                            auVar197 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                               (local_a50.hit + 0x30));
                            *(undefined1 (*) [16])(local_a50.ray + 0xf0) = auVar197;
                            auVar197 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                               (local_a50.hit + 0x40));
                            *(undefined1 (*) [16])(local_a50.ray + 0x100) = auVar197;
                            auVar197 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                               (local_a50.hit + 0x50));
                            *(undefined1 (*) [16])(local_a50.ray + 0x110) = auVar197;
                            auVar197 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                               (local_a50.hit + 0x60));
                            *(undefined1 (*) [16])(local_a50.ray + 0x120) = auVar197;
                            auVar197 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                               (local_a50.hit + 0x70));
                            *(undefined1 (*) [16])(local_a50.ray + 0x130) = auVar197;
                            auVar197 = vmaskmovps_avx(auVar95,*(undefined1 (*) [16])
                                                               (local_a50.hit + 0x80));
                            *(undefined1 (*) [16])(local_a50.ray + 0x140) = auVar197;
                          }
                        }
                        auVar233 = ZEXT464((uint)local_bc0);
                        auVar147._8_8_ = 0x100000001;
                        auVar147._0_8_ = 0x100000001;
                        if ((auVar147 & auVar134) == (undefined1  [16])0x0) {
                          *(float *)(ray + k * 4 + 0x80) = fVar209;
                        }
                      }
                    }
                  }
                }
                auVar104 = local_600;
                bVar86 = lVar82 != 0;
                lVar82 = lVar82 + -1;
              } while ((!bVar61) && (bVar86));
              uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
              auVar114._4_4_ = uVar1;
              auVar114._0_4_ = uVar1;
              auVar114._8_4_ = uVar1;
              auVar114._12_4_ = uVar1;
              auVar114._16_4_ = uVar1;
              auVar114._20_4_ = uVar1;
              auVar114._24_4_ = uVar1;
              auVar114._28_4_ = uVar1;
              auVar105 = vcmpps_avx(_local_820,auVar114,2);
              local_600 = vandps_avx(auVar105,local_600);
              auVar104 = auVar104 & auVar105;
              uVar85 = local_620._0_8_;
            } while ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar104 >> 0x7f,0) != '\0') ||
                       (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar104 >> 0xbf,0) != '\0') ||
                     (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar104[0x1f] < '\0');
          }
          auVar104 = vandps_avx(local_560,local_540);
          auVar105 = vandps_avx(_local_8a0,_local_880);
          auVar284 = ZEXT3264(_local_9a0);
          auVar187._0_4_ = local_9a0._0_4_ + local_480._0_4_;
          auVar187._4_4_ = local_9a0._4_4_ + local_480._4_4_;
          auVar187._8_4_ = local_9a0._8_4_ + local_480._8_4_;
          auVar187._12_4_ = local_9a0._12_4_ + local_480._12_4_;
          auVar187._16_4_ = local_9a0._16_4_ + local_480._16_4_;
          auVar187._20_4_ = local_9a0._20_4_ + local_480._20_4_;
          auVar187._24_4_ = local_9a0._24_4_ + local_480._24_4_;
          auVar187._28_4_ = local_9a0._28_4_ + local_480._28_4_;
          uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
          auVar231._4_4_ = uVar1;
          auVar231._0_4_ = uVar1;
          auVar231._8_4_ = uVar1;
          auVar231._12_4_ = uVar1;
          auVar231._16_4_ = uVar1;
          auVar231._20_4_ = uVar1;
          auVar231._24_4_ = uVar1;
          auVar231._28_4_ = uVar1;
          auVar15 = vcmpps_avx(auVar187,auVar231,2);
          auVar104 = vandps_avx(auVar15,auVar104);
          auVar261._0_4_ = local_9a0._0_4_ + local_440._0_4_;
          auVar261._4_4_ = local_9a0._4_4_ + local_440._4_4_;
          auVar261._8_4_ = local_9a0._8_4_ + local_440._8_4_;
          auVar261._12_4_ = local_9a0._12_4_ + local_440._12_4_;
          auVar261._16_4_ = local_9a0._16_4_ + local_440._16_4_;
          auVar261._20_4_ = local_9a0._20_4_ + local_440._20_4_;
          auVar261._24_4_ = local_9a0._24_4_ + local_440._24_4_;
          auVar261._28_4_ = local_9a0._28_4_ + local_440._28_4_;
          auVar15 = vcmpps_avx(auVar261,auVar231,2);
          auVar105 = vandps_avx(auVar15,auVar105);
          auVar105 = vorps_avx(auVar104,auVar105);
          if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar105 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar105 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar105 >> 0x7f,0) == '\0') &&
                (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar105 >> 0xbf,0) == '\0') &&
              (auVar105 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar105[0x1f]) {
            auVar232._8_4_ = 0x3f800000;
            auVar232._0_8_ = &DAT_3f8000003f800000;
            auVar232._12_4_ = 0x3f800000;
            auVar232._16_4_ = 0x3f800000;
            auVar232._20_4_ = 0x3f800000;
            auVar232._24_4_ = 0x3f800000;
            auVar232._28_4_ = 0x3f800000;
            goto LAB_00f79aa5;
          }
          *(undefined1 (*) [32])(auStack_180 + uVar80 * 0x60) = auVar105;
          auVar104 = vblendvps_avx(_local_440,_local_480,auVar104);
          *(undefined1 (*) [32])(auStack_160 + uVar80 * 0x60) = auVar104;
          uVar2 = vmovlps_avx(auVar304);
          *(undefined8 *)(afStack_140 + uVar80 * 0x18) = uVar2;
          auStack_138[uVar80 * 0x18] = (int)uVar85 + 1;
          uVar80 = (ulong)((int)uVar80 + 1);
        }
        auVar233 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
    }
    auVar310 = ZEXT1664(auVar304);
    do {
      if ((int)uVar80 == 0) {
        uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar103._4_4_ = uVar1;
        auVar103._0_4_ = uVar1;
        auVar103._8_4_ = uVar1;
        auVar103._12_4_ = uVar1;
        auVar134 = vcmpps_avx(local_4d0,auVar103,2);
        uVar79 = vmovmskps_avx(auVar134);
        uVar79 = (uint)local_8a8 & uVar79;
        if (uVar79 == 0) {
          return;
        }
        goto LAB_00f78d69;
      }
      uVar81 = (ulong)((int)uVar80 - 1);
      lVar82 = uVar81 * 0x60;
      auVar104 = *(undefined1 (*) [32])(auStack_160 + lVar82);
      auVar110._0_4_ = auVar284._0_4_ + auVar104._0_4_;
      auVar110._4_4_ = auVar284._4_4_ + auVar104._4_4_;
      auVar110._8_4_ = auVar284._8_4_ + auVar104._8_4_;
      auVar110._12_4_ = auVar284._12_4_ + auVar104._12_4_;
      auVar110._16_4_ = auVar284._16_4_ + auVar104._16_4_;
      auVar110._20_4_ = auVar284._20_4_ + auVar104._20_4_;
      auVar110._24_4_ = auVar284._24_4_ + auVar104._24_4_;
      auVar110._28_4_ = auVar284._28_4_ + auVar104._28_4_;
      uVar1 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar207._4_4_ = uVar1;
      auVar207._0_4_ = uVar1;
      auVar207._8_4_ = uVar1;
      auVar207._12_4_ = uVar1;
      auVar207._16_4_ = uVar1;
      auVar207._20_4_ = uVar1;
      auVar207._24_4_ = uVar1;
      auVar207._28_4_ = uVar1;
      auVar15 = vcmpps_avx(auVar110,auVar207,2);
      auVar105 = vandps_avx(auVar15,*(undefined1 (*) [32])(auStack_180 + lVar82));
      _local_700 = auVar105;
      auVar148 = *(undefined1 (*) [32])(auStack_180 + lVar82) & auVar15;
      bVar67 = (auVar148 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar68 = (auVar148 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar66 = (auVar148 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar65 = SUB321(auVar148 >> 0x7f,0) == '\0';
      bVar64 = (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar63 = SUB321(auVar148 >> 0xbf,0) == '\0';
      bVar86 = (auVar148 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar61 = -1 < auVar148[0x1f];
      if (((((((!bVar67 || !bVar68) || !bVar66) || !bVar65) || !bVar64) || !bVar63) || !bVar86) ||
          !bVar61) {
        auVar183._8_4_ = 0x7f800000;
        auVar183._0_8_ = 0x7f8000007f800000;
        auVar183._12_4_ = 0x7f800000;
        auVar183._16_4_ = 0x7f800000;
        auVar183._20_4_ = 0x7f800000;
        auVar183._24_4_ = 0x7f800000;
        auVar183._28_4_ = 0x7f800000;
        auVar104 = vblendvps_avx(auVar183,auVar104,auVar105);
        auVar15 = vshufps_avx(auVar104,auVar104,0xb1);
        auVar15 = vminps_avx(auVar104,auVar15);
        auVar148 = vshufpd_avx(auVar15,auVar15,5);
        auVar148 = vminps_avx(auVar15,auVar148);
        auVar15 = vperm2f128_avx(auVar148,auVar148,1);
        auVar148 = vminps_avx(auVar148,auVar15);
        auVar104 = vcmpps_avx(auVar104,auVar148,0);
        auVar148 = auVar105 & auVar104;
        if ((((((((auVar148 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar148 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar148 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar148 >> 0x7f,0) != '\0') ||
              (auVar148 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar148 >> 0xbf,0) != '\0') ||
            (auVar148 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar148[0x1f] < '\0') {
          auVar105 = vandps_avx(auVar104,auVar105);
        }
        fVar190 = afStack_140[uVar81 * 0x18 + 1];
        uVar85 = (ulong)auStack_138[uVar81 * 0x18];
        uVar84 = vmovmskps_avx(auVar105);
        uVar4 = 0;
        if (uVar84 != 0) {
          for (; (uVar84 >> uVar4 & 1) == 0; uVar4 = uVar4 + 1) {
          }
        }
        fVar263 = afStack_140[uVar81 * 0x18];
        *(undefined4 *)(local_700 + (ulong)uVar4 * 4) = 0;
        if ((((((((_local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (_local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (_local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(_local_700 >> 0x7f,0) != '\0') ||
              (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(_local_700 >> 0xbf,0) != '\0') ||
            (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_700[0x1f] < '\0') {
          uVar81 = uVar80;
        }
        *(undefined1 (*) [32])(auStack_180 + lVar82) = _local_700;
        auVar134 = vshufps_avx(ZEXT416((uint)(fVar190 - fVar263)),ZEXT416((uint)(fVar190 - fVar263))
                               ,0);
        local_480._4_4_ = fVar263 + auVar134._4_4_ * 0.14285715;
        local_480._0_4_ = fVar263 + auVar134._0_4_ * 0.0;
        fStack_478 = fVar263 + auVar134._8_4_ * 0.2857143;
        fStack_474 = fVar263 + auVar134._12_4_ * 0.42857146;
        fStack_470 = fVar263 + auVar134._0_4_ * 0.5714286;
        fStack_46c = fVar263 + auVar134._4_4_ * 0.71428573;
        fStack_468 = fVar263 + auVar134._8_4_ * 0.8571429;
        fStack_464 = fVar263 + auVar134._12_4_;
        auVar310 = ZEXT864(*(ulong *)(local_480 + (ulong)uVar4 * 4));
      }
      uVar80 = uVar81;
      auVar208 = ZEXT3264(auVar15);
    } while (((((((bVar67 && bVar68) && bVar66) && bVar65) && bVar64) && bVar63) && bVar86) &&
             bVar61);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }